

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx::CurveNiMBIntersectorK<8,8>::
     intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  float *pfVar2;
  undefined1 (*pauVar3) [16];
  undefined4 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Primitive PVar18;
  uint uVar19;
  Geometry *pGVar20;
  __int_type_conflict _Var21;
  long lVar22;
  long lVar23;
  long lVar24;
  RTCFilterFunctionN p_Var25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  uint uVar81;
  uint uVar82;
  uint uVar83;
  ulong uVar84;
  ulong uVar85;
  byte bVar86;
  uint uVar87;
  uint uVar88;
  long lVar89;
  long lVar90;
  long lVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar132;
  float fVar133;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar105 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar134;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float fVar173;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar148 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar210;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar174;
  undefined1 auVar204 [32];
  float fVar211;
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float t1;
  float fVar212;
  float fVar232;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar230;
  float fVar231;
  float fVar233;
  float fVar234;
  float fVar235;
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  float fVar236;
  undefined1 auVar229 [32];
  float fVar237;
  float fVar261;
  vfloat4 a0_1;
  float fVar262;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar263;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  float fVar264;
  float fVar265;
  float fVar266;
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  float fVar267;
  float fVar281;
  float fVar282;
  undefined1 auVar268 [16];
  float fVar283;
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  float fVar284;
  float fVar285;
  float fVar286;
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  float fVar287;
  undefined1 auVar280 [32];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [32];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  float fVar312;
  float fVar313;
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  float fVar330;
  float fVar332;
  float fVar334;
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  float fVar331;
  float fVar333;
  undefined1 auVar329 [32];
  undefined1 auVar336 [16];
  float fVar335;
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  float fVar346;
  float fVar347;
  float fVar349;
  float fVar350;
  float fVar351;
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  float fVar348;
  undefined1 auVar345 [32];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [64];
  float fVar375;
  float fVar386;
  float fVar387;
  vfloat4 a0;
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  float fVar388;
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  float fVar389;
  float fVar390;
  float fVar391;
  float in_register_0000151c;
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  float fVar392;
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  float fVar399;
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  float in_register_0000159c;
  undefined1 auVar405 [32];
  float fVar412;
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  float in_register_000015dc;
  undefined1 auVar411 [64];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  vfloat_impl<4> p02;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  undefined1 local_6f0 [8];
  float fStack_6e8;
  float fStack_6e4;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_610 [8];
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float local_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  RTCFilterFunctionNArguments local_4f0;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined1 local_4b0 [8];
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  uint auStack_480 [4];
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined1 local_430 [8];
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float afStack_320 [8];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 auStack_170 [16];
  undefined1 local_160 [16];
  undefined1 auStack_150 [16];
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  undefined1 local_120 [16];
  undefined1 auStack_110 [16];
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar297 [32];
  undefined1 auVar406 [32];
  
  PVar18 = prim[1];
  uVar84 = (ulong)(byte)PVar18;
  lVar90 = uVar84 * 0x25;
  auVar109 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar109 = vinsertps_avx(auVar109,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar241 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar241 = vinsertps_avx(auVar241,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar109 = vsubps_avx(auVar109,*(undefined1 (*) [16])(prim + lVar90 + 6));
  fVar212 = *(float *)(prim + lVar90 + 0x12);
  auVar138._0_4_ = fVar212 * auVar109._0_4_;
  auVar138._4_4_ = fVar212 * auVar109._4_4_;
  auVar138._8_4_ = fVar212 * auVar109._8_4_;
  auVar138._12_4_ = fVar212 * auVar109._12_4_;
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 4 + 6)));
  auVar268._0_4_ = fVar212 * auVar241._0_4_;
  auVar268._4_4_ = fVar212 * auVar241._4_4_;
  auVar268._8_4_ = fVar212 * auVar241._8_4_;
  auVar268._12_4_ = fVar212 * auVar241._12_4_;
  auVar241 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 4 + 10)));
  auVar120._16_16_ = auVar241;
  auVar120._0_16_ = auVar109;
  auVar120 = vcvtdq2ps_avx(auVar120);
  lVar1 = uVar84 * 5;
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar1 + 6)));
  auVar241 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar1 + 10)));
  auVar204._16_16_ = auVar241;
  auVar204._0_16_ = auVar109;
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 6 + 6)));
  auVar241 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 6 + 10)));
  auVar26 = vcvtdq2ps_avx(auVar204);
  auVar225._16_16_ = auVar241;
  auVar225._0_16_ = auVar109;
  auVar27 = vcvtdq2ps_avx(auVar225);
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0xf + 6)));
  auVar241 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0xf + 10)));
  auVar226._16_16_ = auVar241;
  auVar226._0_16_ = auVar109;
  auVar28 = vcvtdq2ps_avx(auVar226);
  lVar91 = (ulong)(byte)PVar18 * 0x10;
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar91 + 6)));
  auVar241 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar91 + 10)));
  auVar296._16_16_ = auVar241;
  auVar296._0_16_ = auVar109;
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar91 + uVar84 + 6)));
  auVar29 = vcvtdq2ps_avx(auVar296);
  auVar241 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar91 + uVar84 + 10)));
  auVar306._16_16_ = auVar241;
  auVar306._0_16_ = auVar109;
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0x1a + 6)));
  auVar30 = vcvtdq2ps_avx(auVar306);
  auVar241 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0x1a + 10)));
  auVar307._16_16_ = auVar241;
  auVar307._0_16_ = auVar109;
  auVar31 = vcvtdq2ps_avx(auVar307);
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0x1b + 6)));
  auVar241 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0x1b + 10)));
  auVar340._16_16_ = auVar241;
  auVar340._0_16_ = auVar109;
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0x1c + 6)));
  auVar241 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0x1c + 10)));
  auVar32 = vcvtdq2ps_avx(auVar340);
  auVar357._16_16_ = auVar241;
  auVar357._0_16_ = auVar109;
  auVar33 = vcvtdq2ps_avx(auVar357);
  auVar109 = vshufps_avx(auVar268,auVar268,0);
  auVar241 = vshufps_avx(auVar268,auVar268,0x55);
  auVar203 = vshufps_avx(auVar268,auVar268,0xaa);
  fVar212 = auVar203._0_4_;
  fVar237 = auVar203._4_4_;
  fVar173 = auVar203._8_4_;
  fVar230 = auVar203._12_4_;
  fVar211 = auVar241._0_4_;
  fVar174 = auVar241._4_4_;
  fVar231 = auVar241._8_4_;
  fVar261 = auVar241._12_4_;
  fVar210 = auVar109._0_4_;
  fVar232 = auVar109._4_4_;
  fVar262 = auVar109._8_4_;
  fVar132 = auVar109._12_4_;
  auVar382._0_4_ = fVar210 * auVar120._0_4_ + fVar211 * auVar26._0_4_ + fVar212 * auVar27._0_4_;
  auVar382._4_4_ = fVar232 * auVar120._4_4_ + fVar174 * auVar26._4_4_ + fVar237 * auVar27._4_4_;
  auVar382._8_4_ = fVar262 * auVar120._8_4_ + fVar231 * auVar26._8_4_ + fVar173 * auVar27._8_4_;
  auVar382._12_4_ = fVar132 * auVar120._12_4_ + fVar261 * auVar26._12_4_ + fVar230 * auVar27._12_4_;
  auVar382._16_4_ = fVar210 * auVar120._16_4_ + fVar211 * auVar26._16_4_ + fVar212 * auVar27._16_4_;
  auVar382._20_4_ = fVar232 * auVar120._20_4_ + fVar174 * auVar26._20_4_ + fVar237 * auVar27._20_4_;
  auVar382._24_4_ = fVar262 * auVar120._24_4_ + fVar231 * auVar26._24_4_ + fVar173 * auVar27._24_4_;
  auVar382._28_4_ = fVar261 + in_register_000015dc + in_register_0000151c;
  auVar368._0_4_ = fVar210 * auVar28._0_4_ + fVar211 * auVar29._0_4_ + auVar30._0_4_ * fVar212;
  auVar368._4_4_ = fVar232 * auVar28._4_4_ + fVar174 * auVar29._4_4_ + auVar30._4_4_ * fVar237;
  auVar368._8_4_ = fVar262 * auVar28._8_4_ + fVar231 * auVar29._8_4_ + auVar30._8_4_ * fVar173;
  auVar368._12_4_ = fVar132 * auVar28._12_4_ + fVar261 * auVar29._12_4_ + auVar30._12_4_ * fVar230;
  auVar368._16_4_ = fVar210 * auVar28._16_4_ + fVar211 * auVar29._16_4_ + auVar30._16_4_ * fVar212;
  auVar368._20_4_ = fVar232 * auVar28._20_4_ + fVar174 * auVar29._20_4_ + auVar30._20_4_ * fVar237;
  auVar368._24_4_ = fVar262 * auVar28._24_4_ + fVar231 * auVar29._24_4_ + auVar30._24_4_ * fVar173;
  auVar368._28_4_ = fVar261 + in_register_000015dc + in_register_0000159c;
  auVar278._0_4_ = fVar210 * auVar31._0_4_ + fVar211 * auVar32._0_4_ + auVar33._0_4_ * fVar212;
  auVar278._4_4_ = fVar232 * auVar31._4_4_ + fVar174 * auVar32._4_4_ + auVar33._4_4_ * fVar237;
  auVar278._8_4_ = fVar262 * auVar31._8_4_ + fVar231 * auVar32._8_4_ + auVar33._8_4_ * fVar173;
  auVar278._12_4_ = fVar132 * auVar31._12_4_ + fVar261 * auVar32._12_4_ + auVar33._12_4_ * fVar230;
  auVar278._16_4_ = fVar210 * auVar31._16_4_ + fVar211 * auVar32._16_4_ + auVar33._16_4_ * fVar212;
  auVar278._20_4_ = fVar232 * auVar31._20_4_ + fVar174 * auVar32._20_4_ + auVar33._20_4_ * fVar237;
  auVar278._24_4_ = fVar262 * auVar31._24_4_ + fVar231 * auVar32._24_4_ + auVar33._24_4_ * fVar173;
  auVar278._28_4_ = fVar132 + fVar261 + fVar230;
  auVar109 = vshufps_avx(auVar138,auVar138,0);
  auVar241 = vshufps_avx(auVar138,auVar138,0x55);
  auVar203 = vshufps_avx(auVar138,auVar138,0xaa);
  fVar212 = auVar203._0_4_;
  fVar237 = auVar203._4_4_;
  fVar173 = auVar203._8_4_;
  fVar230 = auVar203._12_4_;
  fVar232 = auVar241._0_4_;
  fVar262 = auVar241._4_4_;
  fVar132 = auVar241._8_4_;
  fVar233 = auVar241._12_4_;
  fVar211 = auVar26._28_4_ + auVar27._28_4_;
  fVar174 = auVar109._0_4_;
  fVar231 = auVar109._4_4_;
  fVar261 = auVar109._8_4_;
  fVar210 = auVar109._12_4_;
  auVar166._0_4_ = fVar174 * auVar120._0_4_ + fVar232 * auVar26._0_4_ + fVar212 * auVar27._0_4_;
  auVar166._4_4_ = fVar231 * auVar120._4_4_ + fVar262 * auVar26._4_4_ + fVar237 * auVar27._4_4_;
  auVar166._8_4_ = fVar261 * auVar120._8_4_ + fVar132 * auVar26._8_4_ + fVar173 * auVar27._8_4_;
  auVar166._12_4_ = fVar210 * auVar120._12_4_ + fVar233 * auVar26._12_4_ + fVar230 * auVar27._12_4_;
  auVar166._16_4_ = fVar174 * auVar120._16_4_ + fVar232 * auVar26._16_4_ + fVar212 * auVar27._16_4_;
  auVar166._20_4_ = fVar231 * auVar120._20_4_ + fVar262 * auVar26._20_4_ + fVar237 * auVar27._20_4_;
  auVar166._24_4_ = fVar261 * auVar120._24_4_ + fVar132 * auVar26._24_4_ + fVar173 * auVar27._24_4_;
  auVar166._28_4_ = auVar120._28_4_ + fVar211;
  auVar121._0_4_ = fVar174 * auVar28._0_4_ + auVar30._0_4_ * fVar212 + fVar232 * auVar29._0_4_;
  auVar121._4_4_ = fVar231 * auVar28._4_4_ + auVar30._4_4_ * fVar237 + fVar262 * auVar29._4_4_;
  auVar121._8_4_ = fVar261 * auVar28._8_4_ + auVar30._8_4_ * fVar173 + fVar132 * auVar29._8_4_;
  auVar121._12_4_ = fVar210 * auVar28._12_4_ + auVar30._12_4_ * fVar230 + fVar233 * auVar29._12_4_;
  auVar121._16_4_ = fVar174 * auVar28._16_4_ + auVar30._16_4_ * fVar212 + fVar232 * auVar29._16_4_;
  auVar121._20_4_ = fVar231 * auVar28._20_4_ + auVar30._20_4_ * fVar237 + fVar262 * auVar29._20_4_;
  auVar121._24_4_ = fVar261 * auVar28._24_4_ + auVar30._24_4_ * fVar173 + fVar132 * auVar29._24_4_;
  auVar121._28_4_ = auVar120._28_4_ + auVar30._28_4_ + auVar27._28_4_;
  auVar227._8_4_ = 0x7fffffff;
  auVar227._0_8_ = 0x7fffffff7fffffff;
  auVar227._12_4_ = 0x7fffffff;
  auVar227._16_4_ = 0x7fffffff;
  auVar227._20_4_ = 0x7fffffff;
  auVar227._24_4_ = 0x7fffffff;
  auVar227._28_4_ = 0x7fffffff;
  auVar258._8_4_ = 0x219392ef;
  auVar258._0_8_ = 0x219392ef219392ef;
  auVar258._12_4_ = 0x219392ef;
  auVar258._16_4_ = 0x219392ef;
  auVar258._20_4_ = 0x219392ef;
  auVar258._24_4_ = 0x219392ef;
  auVar258._28_4_ = 0x219392ef;
  auVar120 = vandps_avx(auVar382,auVar227);
  auVar120 = vcmpps_avx(auVar120,auVar258,1);
  auVar26 = vblendvps_avx(auVar382,auVar258,auVar120);
  auVar120 = vandps_avx(auVar368,auVar227);
  auVar120 = vcmpps_avx(auVar120,auVar258,1);
  auVar27 = vblendvps_avx(auVar368,auVar258,auVar120);
  auVar120 = vandps_avx(auVar278,auVar227);
  auVar120 = vcmpps_avx(auVar120,auVar258,1);
  auVar120 = vblendvps_avx(auVar278,auVar258,auVar120);
  auVar205._0_4_ = fVar174 * auVar31._0_4_ + fVar232 * auVar32._0_4_ + auVar33._0_4_ * fVar212;
  auVar205._4_4_ = fVar231 * auVar31._4_4_ + fVar262 * auVar32._4_4_ + auVar33._4_4_ * fVar237;
  auVar205._8_4_ = fVar261 * auVar31._8_4_ + fVar132 * auVar32._8_4_ + auVar33._8_4_ * fVar173;
  auVar205._12_4_ = fVar210 * auVar31._12_4_ + fVar233 * auVar32._12_4_ + auVar33._12_4_ * fVar230;
  auVar205._16_4_ = fVar174 * auVar31._16_4_ + fVar232 * auVar32._16_4_ + auVar33._16_4_ * fVar212;
  auVar205._20_4_ = fVar231 * auVar31._20_4_ + fVar262 * auVar32._20_4_ + auVar33._20_4_ * fVar237;
  auVar205._24_4_ = fVar261 * auVar31._24_4_ + fVar132 * auVar32._24_4_ + auVar33._24_4_ * fVar173;
  auVar205._28_4_ = fVar211 + auVar29._28_4_ + fVar230;
  auVar28 = vrcpps_avx(auVar26);
  fVar212 = auVar28._0_4_;
  fVar230 = auVar28._4_4_;
  auVar29._4_4_ = auVar26._4_4_ * fVar230;
  auVar29._0_4_ = auVar26._0_4_ * fVar212;
  fVar231 = auVar28._8_4_;
  auVar29._8_4_ = auVar26._8_4_ * fVar231;
  fVar232 = auVar28._12_4_;
  auVar29._12_4_ = auVar26._12_4_ * fVar232;
  fVar233 = auVar28._16_4_;
  auVar29._16_4_ = auVar26._16_4_ * fVar233;
  fVar234 = auVar28._20_4_;
  auVar29._20_4_ = auVar26._20_4_ * fVar234;
  fVar235 = auVar28._24_4_;
  auVar29._24_4_ = auVar26._24_4_ * fVar235;
  auVar29._28_4_ = 0x219392ef;
  auVar308._8_4_ = 0x3f800000;
  auVar308._0_8_ = 0x3f8000003f800000;
  auVar308._12_4_ = 0x3f800000;
  auVar308._16_4_ = 0x3f800000;
  auVar308._20_4_ = 0x3f800000;
  auVar308._24_4_ = 0x3f800000;
  auVar308._28_4_ = 0x3f800000;
  auVar30 = vsubps_avx(auVar308,auVar29);
  auVar29 = vrcpps_avx(auVar27);
  fVar212 = fVar212 + fVar212 * auVar30._0_4_;
  fVar230 = fVar230 + fVar230 * auVar30._4_4_;
  fVar231 = fVar231 + fVar231 * auVar30._8_4_;
  fVar232 = fVar232 + fVar232 * auVar30._12_4_;
  fVar233 = fVar233 + fVar233 * auVar30._16_4_;
  fVar234 = fVar234 + fVar234 * auVar30._20_4_;
  fVar235 = fVar235 + fVar235 * auVar30._24_4_;
  fVar237 = auVar29._0_4_;
  fVar211 = auVar29._4_4_;
  auVar26._4_4_ = auVar27._4_4_ * fVar211;
  auVar26._0_4_ = auVar27._0_4_ * fVar237;
  fVar261 = auVar29._8_4_;
  auVar26._8_4_ = auVar27._8_4_ * fVar261;
  fVar262 = auVar29._12_4_;
  auVar26._12_4_ = auVar27._12_4_ * fVar262;
  fVar264 = auVar29._16_4_;
  auVar26._16_4_ = auVar27._16_4_ * fVar264;
  fVar265 = auVar29._20_4_;
  auVar26._20_4_ = auVar27._20_4_ * fVar265;
  fVar266 = auVar29._24_4_;
  auVar26._24_4_ = auVar27._24_4_ * fVar266;
  auVar26._28_4_ = auVar30._28_4_;
  auVar27 = vsubps_avx(auVar308,auVar26);
  fVar237 = fVar237 + fVar237 * auVar27._0_4_;
  fVar211 = fVar211 + fVar211 * auVar27._4_4_;
  fVar261 = fVar261 + fVar261 * auVar27._8_4_;
  fVar262 = fVar262 + fVar262 * auVar27._12_4_;
  fVar264 = fVar264 + fVar264 * auVar27._16_4_;
  fVar265 = fVar265 + fVar265 * auVar27._20_4_;
  fVar266 = fVar266 + fVar266 * auVar27._24_4_;
  auVar26 = vrcpps_avx(auVar120);
  fVar267 = auVar26._0_4_;
  fVar281 = auVar26._4_4_;
  auVar31._4_4_ = fVar281 * auVar120._4_4_;
  auVar31._0_4_ = fVar267 * auVar120._0_4_;
  fVar282 = auVar26._8_4_;
  auVar31._8_4_ = fVar282 * auVar120._8_4_;
  fVar283 = auVar26._12_4_;
  auVar31._12_4_ = fVar283 * auVar120._12_4_;
  fVar284 = auVar26._16_4_;
  auVar31._16_4_ = fVar284 * auVar120._16_4_;
  fVar285 = auVar26._20_4_;
  auVar31._20_4_ = fVar285 * auVar120._20_4_;
  fVar286 = auVar26._24_4_;
  auVar31._24_4_ = fVar286 * auVar120._24_4_;
  auVar31._28_4_ = auVar120._28_4_;
  auVar120 = vsubps_avx(auVar308,auVar31);
  fVar267 = fVar267 + fVar267 * auVar120._0_4_;
  fVar281 = fVar281 + fVar281 * auVar120._4_4_;
  fVar282 = fVar282 + fVar282 * auVar120._8_4_;
  fVar283 = fVar283 + fVar283 * auVar120._12_4_;
  fVar284 = fVar284 + fVar284 * auVar120._16_4_;
  fVar285 = fVar285 + fVar285 * auVar120._20_4_;
  fVar286 = fVar286 + fVar286 * auVar120._24_4_;
  auVar109 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar90 + 0x16)) *
                           *(float *)(prim + lVar90 + 0x1a)));
  auVar34 = vshufps_avx(auVar109,auVar109,0);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *(ulong *)(prim + uVar84 * 7 + 6);
  auVar109 = vpmovsxwd_avx(auVar109);
  auVar241._8_8_ = 0;
  auVar241._0_8_ = *(ulong *)(prim + uVar84 * 7 + 0xe);
  auVar241 = vpmovsxwd_avx(auVar241);
  auVar309._16_16_ = auVar241;
  auVar309._0_16_ = auVar109;
  auVar120 = vcvtdq2ps_avx(auVar309);
  auVar203._8_8_ = 0;
  auVar203._0_8_ = *(ulong *)(prim + uVar84 * 0xb + 6);
  auVar109 = vpmovsxwd_avx(auVar203);
  auVar316._8_8_ = 0;
  auVar316._0_8_ = *(ulong *)(prim + uVar84 * 0xb + 0xe);
  auVar241 = vpmovsxwd_avx(auVar316);
  auVar325._16_16_ = auVar241;
  auVar325._0_16_ = auVar109;
  auVar26 = vcvtdq2ps_avx(auVar325);
  auVar26 = vsubps_avx(auVar26,auVar120);
  fVar173 = auVar34._0_4_;
  fVar174 = auVar34._4_4_;
  fVar210 = auVar34._8_4_;
  fVar132 = auVar34._12_4_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar84 * 9 + 6);
  auVar109 = vpmovsxwd_avx(auVar34);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar84 * 9 + 0xe);
  auVar241 = vpmovsxwd_avx(auVar6);
  auVar310._0_4_ = auVar26._0_4_ * fVar173 + auVar120._0_4_;
  auVar310._4_4_ = auVar26._4_4_ * fVar174 + auVar120._4_4_;
  auVar310._8_4_ = auVar26._8_4_ * fVar210 + auVar120._8_4_;
  auVar310._12_4_ = auVar26._12_4_ * fVar132 + auVar120._12_4_;
  auVar310._16_4_ = auVar26._16_4_ * fVar173 + auVar120._16_4_;
  auVar310._20_4_ = auVar26._20_4_ * fVar174 + auVar120._20_4_;
  auVar310._24_4_ = auVar26._24_4_ * fVar210 + auVar120._24_4_;
  auVar310._28_4_ = auVar26._28_4_ + auVar120._28_4_;
  auVar326._16_16_ = auVar241;
  auVar326._0_16_ = auVar109;
  auVar120 = vcvtdq2ps_avx(auVar326);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar84 * 0xd + 6);
  auVar109 = vpmovsxwd_avx(auVar7);
  auVar162._8_8_ = 0;
  auVar162._0_8_ = *(ulong *)(prim + uVar84 * 0xd + 0xe);
  auVar241 = vpmovsxwd_avx(auVar162);
  auVar341._16_16_ = auVar241;
  auVar341._0_16_ = auVar109;
  auVar26 = vcvtdq2ps_avx(auVar341);
  auVar26 = vsubps_avx(auVar26,auVar120);
  auVar150._8_8_ = 0;
  auVar150._0_8_ = *(ulong *)(prim + uVar84 * 0x12 + 6);
  auVar109 = vpmovsxwd_avx(auVar150);
  auVar189._8_8_ = 0;
  auVar189._0_8_ = *(ulong *)(prim + uVar84 * 0x12 + 0xe);
  auVar241 = vpmovsxwd_avx(auVar189);
  auVar327._0_4_ = auVar120._0_4_ + auVar26._0_4_ * fVar173;
  auVar327._4_4_ = auVar120._4_4_ + auVar26._4_4_ * fVar174;
  auVar327._8_4_ = auVar120._8_4_ + auVar26._8_4_ * fVar210;
  auVar327._12_4_ = auVar120._12_4_ + auVar26._12_4_ * fVar132;
  auVar327._16_4_ = auVar120._16_4_ + auVar26._16_4_ * fVar173;
  auVar327._20_4_ = auVar120._20_4_ + auVar26._20_4_ * fVar174;
  auVar327._24_4_ = auVar120._24_4_ + auVar26._24_4_ * fVar210;
  auVar327._28_4_ = auVar120._28_4_ + auVar26._28_4_;
  auVar342._16_16_ = auVar241;
  auVar342._0_16_ = auVar109;
  auVar120 = vcvtdq2ps_avx(auVar342);
  uVar85 = (ulong)(uint)((int)lVar1 << 2);
  lVar90 = uVar84 * 2 + uVar85;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = *(ulong *)(prim + lVar90 + 6);
  auVar109 = vpmovsxwd_avx(auVar151);
  auVar298._8_8_ = 0;
  auVar298._0_8_ = *(ulong *)(prim + lVar90 + 0xe);
  auVar241 = vpmovsxwd_avx(auVar298);
  auVar358._16_16_ = auVar241;
  auVar358._0_16_ = auVar109;
  auVar26 = vcvtdq2ps_avx(auVar358);
  auVar26 = vsubps_avx(auVar26,auVar120);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar85 + 6);
  auVar109 = vpmovsxwd_avx(auVar8);
  auVar343._0_4_ = auVar120._0_4_ + auVar26._0_4_ * fVar173;
  auVar343._4_4_ = auVar120._4_4_ + auVar26._4_4_ * fVar174;
  auVar343._8_4_ = auVar120._8_4_ + auVar26._8_4_ * fVar210;
  auVar343._12_4_ = auVar120._12_4_ + auVar26._12_4_ * fVar132;
  auVar343._16_4_ = auVar120._16_4_ + auVar26._16_4_ * fVar173;
  auVar343._20_4_ = auVar120._20_4_ + auVar26._20_4_ * fVar174;
  auVar343._24_4_ = auVar120._24_4_ + auVar26._24_4_ * fVar210;
  auVar343._28_4_ = auVar120._28_4_ + auVar26._28_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar85 + 0xe);
  auVar241 = vpmovsxwd_avx(auVar9);
  auVar359._16_16_ = auVar241;
  auVar359._0_16_ = auVar109;
  auVar245._8_8_ = 0;
  auVar245._0_8_ = *(ulong *)(prim + uVar84 * 0x18 + 6);
  auVar109 = vpmovsxwd_avx(auVar245);
  auVar408._8_8_ = 0;
  auVar408._0_8_ = *(ulong *)(prim + uVar84 * 0x18 + 0xe);
  auVar241 = vpmovsxwd_avx(auVar408);
  auVar120 = vcvtdq2ps_avx(auVar359);
  auVar369._16_16_ = auVar241;
  auVar369._0_16_ = auVar109;
  auVar26 = vcvtdq2ps_avx(auVar369);
  auVar26 = vsubps_avx(auVar26,auVar120);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar84 * 0x1d + 6);
  auVar109 = vpmovsxwd_avx(auVar10);
  auVar360._0_4_ = auVar120._0_4_ + auVar26._0_4_ * fVar173;
  auVar360._4_4_ = auVar120._4_4_ + auVar26._4_4_ * fVar174;
  auVar360._8_4_ = auVar120._8_4_ + auVar26._8_4_ * fVar210;
  auVar360._12_4_ = auVar120._12_4_ + auVar26._12_4_ * fVar132;
  auVar360._16_4_ = auVar120._16_4_ + auVar26._16_4_ * fVar173;
  auVar360._20_4_ = auVar120._20_4_ + auVar26._20_4_ * fVar174;
  auVar360._24_4_ = auVar120._24_4_ + auVar26._24_4_ * fVar210;
  auVar360._28_4_ = auVar120._28_4_ + auVar26._28_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar84 * 0x1d + 0xe);
  auVar241 = vpmovsxwd_avx(auVar11);
  auVar370._16_16_ = auVar241;
  auVar370._0_16_ = auVar109;
  auVar120 = vcvtdq2ps_avx(auVar370);
  lVar90 = uVar84 + (ulong)(byte)PVar18 * 0x20;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + lVar90 + 6);
  auVar109 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + lVar90 + 0xe);
  auVar241 = vpmovsxwd_avx(auVar13);
  auVar383._16_16_ = auVar241;
  auVar383._0_16_ = auVar109;
  auVar26 = vcvtdq2ps_avx(auVar383);
  auVar26 = vsubps_avx(auVar26,auVar120);
  auVar371._0_4_ = auVar120._0_4_ + auVar26._0_4_ * fVar173;
  auVar371._4_4_ = auVar120._4_4_ + auVar26._4_4_ * fVar174;
  auVar371._8_4_ = auVar120._8_4_ + auVar26._8_4_ * fVar210;
  auVar371._12_4_ = auVar120._12_4_ + auVar26._12_4_ * fVar132;
  auVar371._16_4_ = auVar120._16_4_ + auVar26._16_4_ * fVar173;
  auVar371._20_4_ = auVar120._20_4_ + auVar26._20_4_ * fVar174;
  auVar371._24_4_ = auVar120._24_4_ + auVar26._24_4_ * fVar210;
  auVar371._28_4_ = auVar120._28_4_ + auVar26._28_4_;
  lVar90 = (ulong)(byte)PVar18 * 0x20 - uVar84;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + lVar90 + 6);
  auVar109 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + lVar90 + 0xe);
  auVar241 = vpmovsxwd_avx(auVar15);
  auVar384._16_16_ = auVar241;
  auVar384._0_16_ = auVar109;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar84 * 0x23 + 6);
  auVar109 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar84 * 0x23 + 0xe);
  auVar241 = vpmovsxwd_avx(auVar17);
  auVar120 = vcvtdq2ps_avx(auVar384);
  auVar397._16_16_ = auVar241;
  auVar397._0_16_ = auVar109;
  auVar26 = vcvtdq2ps_avx(auVar397);
  auVar26 = vsubps_avx(auVar26,auVar120);
  auVar385._0_4_ = auVar120._0_4_ + auVar26._0_4_ * fVar173;
  auVar385._4_4_ = auVar120._4_4_ + auVar26._4_4_ * fVar174;
  auVar385._8_4_ = auVar120._8_4_ + auVar26._8_4_ * fVar210;
  auVar385._12_4_ = auVar120._12_4_ + auVar26._12_4_ * fVar132;
  auVar385._16_4_ = auVar120._16_4_ + auVar26._16_4_ * fVar173;
  auVar385._20_4_ = auVar120._20_4_ + auVar26._20_4_ * fVar174;
  auVar385._24_4_ = auVar120._24_4_ + auVar26._24_4_ * fVar210;
  auVar385._28_4_ = auVar120._28_4_ + fVar132;
  auVar120 = vsubps_avx(auVar310,auVar166);
  auVar288._0_4_ = fVar212 * auVar120._0_4_;
  auVar288._4_4_ = fVar230 * auVar120._4_4_;
  auVar288._8_4_ = fVar231 * auVar120._8_4_;
  auVar288._12_4_ = fVar232 * auVar120._12_4_;
  auVar32._16_4_ = fVar233 * auVar120._16_4_;
  auVar32._0_16_ = auVar288;
  auVar32._20_4_ = fVar234 * auVar120._20_4_;
  auVar32._24_4_ = fVar235 * auVar120._24_4_;
  auVar32._28_4_ = auVar120._28_4_;
  auVar120 = vsubps_avx(auVar327,auVar166);
  auVar213._0_4_ = fVar212 * auVar120._0_4_;
  auVar213._4_4_ = fVar230 * auVar120._4_4_;
  auVar213._8_4_ = fVar231 * auVar120._8_4_;
  auVar213._12_4_ = fVar232 * auVar120._12_4_;
  auVar33._16_4_ = fVar233 * auVar120._16_4_;
  auVar33._0_16_ = auVar213;
  auVar33._20_4_ = fVar234 * auVar120._20_4_;
  auVar33._24_4_ = fVar235 * auVar120._24_4_;
  auVar33._28_4_ = auVar28._28_4_ + auVar30._28_4_;
  auVar120 = vsubps_avx(auVar343,auVar121);
  auVar139._0_4_ = fVar237 * auVar120._0_4_;
  auVar139._4_4_ = fVar211 * auVar120._4_4_;
  auVar139._8_4_ = fVar261 * auVar120._8_4_;
  auVar139._12_4_ = fVar262 * auVar120._12_4_;
  auVar28._16_4_ = fVar264 * auVar120._16_4_;
  auVar28._0_16_ = auVar139;
  auVar28._20_4_ = fVar265 * auVar120._20_4_;
  auVar28._24_4_ = fVar266 * auVar120._24_4_;
  auVar28._28_4_ = auVar120._28_4_;
  auVar120 = vsubps_avx(auVar360,auVar121);
  auVar238._0_4_ = fVar237 * auVar120._0_4_;
  auVar238._4_4_ = fVar211 * auVar120._4_4_;
  auVar238._8_4_ = fVar261 * auVar120._8_4_;
  auVar238._12_4_ = fVar262 * auVar120._12_4_;
  auVar30._16_4_ = fVar264 * auVar120._16_4_;
  auVar30._0_16_ = auVar238;
  auVar30._20_4_ = fVar265 * auVar120._20_4_;
  auVar30._24_4_ = fVar266 * auVar120._24_4_;
  auVar30._28_4_ = auVar29._28_4_ + auVar27._28_4_;
  auVar120 = vsubps_avx(auVar371,auVar205);
  auVar92._0_4_ = fVar267 * auVar120._0_4_;
  auVar92._4_4_ = fVar281 * auVar120._4_4_;
  auVar92._8_4_ = fVar282 * auVar120._8_4_;
  auVar92._12_4_ = fVar283 * auVar120._12_4_;
  auVar27._16_4_ = fVar284 * auVar120._16_4_;
  auVar27._0_16_ = auVar92;
  auVar27._20_4_ = fVar285 * auVar120._20_4_;
  auVar27._24_4_ = fVar286 * auVar120._24_4_;
  auVar27._28_4_ = auVar120._28_4_;
  auVar120 = vsubps_avx(auVar385,auVar205);
  auVar175._0_4_ = fVar267 * auVar120._0_4_;
  auVar175._4_4_ = fVar281 * auVar120._4_4_;
  auVar175._8_4_ = fVar282 * auVar120._8_4_;
  auVar175._12_4_ = fVar283 * auVar120._12_4_;
  auVar35._16_4_ = fVar284 * auVar120._16_4_;
  auVar35._0_16_ = auVar175;
  auVar35._20_4_ = fVar285 * auVar120._20_4_;
  auVar35._24_4_ = fVar286 * auVar120._24_4_;
  auVar35._28_4_ = auVar120._28_4_;
  auVar109 = vpminsd_avx(auVar32._16_16_,auVar33._16_16_);
  auVar241 = vpminsd_avx(auVar288,auVar213);
  auVar328._16_16_ = auVar109;
  auVar328._0_16_ = auVar241;
  auVar109 = vpminsd_avx(auVar28._16_16_,auVar30._16_16_);
  auVar241 = vpminsd_avx(auVar139,auVar238);
  auVar372._16_16_ = auVar109;
  auVar372._0_16_ = auVar241;
  auVar120 = vmaxps_avx(auVar328,auVar372);
  auVar109 = vpminsd_avx(auVar27._16_16_,auVar35._16_16_);
  auVar241 = vpminsd_avx(auVar92,auVar175);
  auVar398._16_16_ = auVar109;
  auVar398._0_16_ = auVar241;
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar405._4_4_ = uVar4;
  auVar405._0_4_ = uVar4;
  auVar405._8_4_ = uVar4;
  auVar405._12_4_ = uVar4;
  auVar405._16_4_ = uVar4;
  auVar405._20_4_ = uVar4;
  auVar405._24_4_ = uVar4;
  auVar405._28_4_ = uVar4;
  auVar26 = vmaxps_avx(auVar398,auVar405);
  auVar120 = vmaxps_avx(auVar120,auVar26);
  local_2c0._4_4_ = auVar120._4_4_ * 0.99999964;
  local_2c0._0_4_ = auVar120._0_4_ * 0.99999964;
  local_2c0._8_4_ = auVar120._8_4_ * 0.99999964;
  local_2c0._12_4_ = auVar120._12_4_ * 0.99999964;
  local_2c0._16_4_ = auVar120._16_4_ * 0.99999964;
  local_2c0._20_4_ = auVar120._20_4_ * 0.99999964;
  local_2c0._24_4_ = auVar120._24_4_ * 0.99999964;
  local_2c0._28_4_ = auVar120._28_4_;
  auVar109 = vpmaxsd_avx(auVar32._16_16_,auVar33._16_16_);
  auVar241 = vpmaxsd_avx(auVar288,auVar213);
  auVar228._16_16_ = auVar109;
  auVar228._0_16_ = auVar241;
  auVar109 = vpmaxsd_avx(auVar28._16_16_,auVar30._16_16_);
  auVar241 = vpmaxsd_avx(auVar139,auVar238);
  auVar167._16_16_ = auVar109;
  auVar167._0_16_ = auVar241;
  auVar120 = vminps_avx(auVar228,auVar167);
  auVar109 = vpmaxsd_avx(auVar27._16_16_,auVar35._16_16_);
  auVar241 = vpmaxsd_avx(auVar92,auVar175);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar206._4_4_ = uVar4;
  auVar206._0_4_ = uVar4;
  auVar206._8_4_ = uVar4;
  auVar206._12_4_ = uVar4;
  auVar206._16_4_ = uVar4;
  auVar206._20_4_ = uVar4;
  auVar206._24_4_ = uVar4;
  auVar206._28_4_ = uVar4;
  auVar122._16_16_ = auVar109;
  auVar122._0_16_ = auVar241;
  auVar26 = vminps_avx(auVar122,auVar206);
  auVar120 = vminps_avx(auVar120,auVar26);
  auVar36._4_4_ = auVar120._4_4_ * 1.0000004;
  auVar36._0_4_ = auVar120._0_4_ * 1.0000004;
  auVar36._8_4_ = auVar120._8_4_ * 1.0000004;
  auVar36._12_4_ = auVar120._12_4_ * 1.0000004;
  auVar36._16_4_ = auVar120._16_4_ * 1.0000004;
  auVar36._20_4_ = auVar120._20_4_ * 1.0000004;
  auVar36._24_4_ = auVar120._24_4_ * 1.0000004;
  auVar36._28_4_ = auVar120._28_4_;
  auVar120 = vcmpps_avx(local_2c0,auVar36,2);
  auVar109 = vpshufd_avx(ZEXT116((byte)PVar18),0);
  auVar168._16_16_ = auVar109;
  auVar168._0_16_ = auVar109;
  auVar26 = vcvtdq2ps_avx(auVar168);
  auVar26 = vcmpps_avx(_DAT_01faff40,auVar26,1);
  auVar120 = vandps_avx(auVar120,auVar26);
  uVar81 = vmovmskps_avx(auVar120);
  if (uVar81 == 0) {
    return;
  }
  uVar81 = uVar81 & 0xff;
  auVar123._16_16_ = mm_lookupmask_ps._240_16_;
  auVar123._0_16_ = mm_lookupmask_ps._240_16_;
  local_2a0 = vblendps_avx(auVar123,ZEXT832(0) << 0x20,0x80);
  uVar82 = 1 << ((byte)k & 0x1f);
  auVar109 = ZEXT416(0) << 0x20;
  do {
    lVar90 = 0;
    if (uVar81 != 0) {
      for (; (uVar81 >> lVar90 & 1) == 0; lVar90 = lVar90 + 1) {
      }
    }
    uVar83 = *(uint *)(prim + 2);
    pGVar20 = (context->scene->geometries).items[uVar83].ptr;
    fVar212 = (pGVar20->time_range).lower;
    fVar212 = pGVar20->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0xe0) - fVar212) / ((pGVar20->time_range).upper - fVar212))
    ;
    auVar241 = vroundss_avx(ZEXT416((uint)fVar212),ZEXT416((uint)fVar212),9);
    auVar241 = vminss_avx(auVar241,ZEXT416((uint)(pGVar20->fnumTimeSegments + -1.0)));
    auVar109 = vmaxss_avx(auVar109,auVar241);
    uVar19 = *(uint *)(prim + lVar90 * 4 + 6);
    uVar84 = (ulong)*(uint *)(*(long *)&pGVar20->field_0x58 +
                             (ulong)uVar19 *
                             pGVar20[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i);
    _Var21 = pGVar20[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar89 = (long)(int)auVar109._0_4_ * 0x38;
    lVar22 = *(long *)(_Var21 + lVar89);
    lVar23 = *(long *)(_Var21 + 0x10 + lVar89);
    pfVar2 = (float *)(lVar22 + lVar23 * uVar84);
    fVar237 = *pfVar2;
    fVar173 = pfVar2[1];
    fVar230 = pfVar2[2];
    fVar211 = pfVar2[3];
    lVar90 = uVar84 + 1;
    pfVar2 = (float *)(lVar22 + lVar23 * lVar90);
    fVar174 = *pfVar2;
    fVar231 = pfVar2[1];
    fVar261 = pfVar2[2];
    fVar210 = pfVar2[3];
    lVar1 = uVar84 + 2;
    pfVar2 = (float *)(lVar22 + lVar23 * lVar1);
    fVar232 = *pfVar2;
    fVar262 = pfVar2[1];
    fVar132 = pfVar2[2];
    fVar233 = pfVar2[3];
    lVar91 = uVar84 + 3;
    pfVar2 = (float *)(lVar22 + lVar23 * lVar91);
    fVar264 = *pfVar2;
    fVar234 = pfVar2[1];
    fVar265 = pfVar2[2];
    fVar235 = pfVar2[3];
    lVar22 = *(long *)&pGVar20[4].fnumTimeSegments;
    lVar23 = *(long *)(lVar22 + lVar89);
    lVar24 = *(long *)(lVar22 + 0x10 + lVar89);
    pfVar2 = (float *)(lVar23 + lVar24 * uVar84);
    fVar266 = *pfVar2;
    fVar267 = pfVar2[1];
    fVar281 = pfVar2[2];
    fVar282 = pfVar2[3];
    pfVar2 = (float *)(lVar23 + lVar24 * lVar90);
    fVar283 = *pfVar2;
    fVar284 = pfVar2[1];
    fVar285 = pfVar2[2];
    fVar286 = pfVar2[3];
    pfVar2 = (float *)(lVar23 + lVar24 * lVar1);
    fVar133 = *pfVar2;
    fVar134 = pfVar2[1];
    fVar135 = pfVar2[2];
    fVar136 = pfVar2[3];
    fVar212 = fVar212 - auVar109._0_4_;
    pfVar2 = (float *)(lVar23 + lVar24 * lVar91);
    fVar263 = *pfVar2;
    fVar137 = pfVar2[1];
    fVar236 = pfVar2[2];
    fVar287 = pfVar2[3];
    local_700._0_4_ =
         fVar237 * 0.16666667 + fVar174 * 0.6666667 + fVar232 * 0.16666667 + fVar264 * 0.0;
    local_700._4_4_ =
         fVar173 * 0.16666667 + fVar231 * 0.6666667 + fVar262 * 0.16666667 + fVar234 * 0.0;
    fStack_6f8 = fVar230 * 0.16666667 + fVar261 * 0.6666667 + fVar132 * 0.16666667 + fVar265 * 0.0;
    fStack_6f4 = fVar211 * 0.16666667 + fVar210 * 0.6666667 + fVar233 * 0.16666667 + fVar235 * 0.0;
    auVar93._0_4_ = fVar232 * 0.5 + fVar264 * 0.0;
    auVar93._4_4_ = fVar262 * 0.5 + fVar234 * 0.0;
    auVar93._8_4_ = fVar132 * 0.5 + fVar265 * 0.0;
    auVar93._12_4_ = fVar233 * 0.5 + fVar235 * 0.0;
    auVar176._0_4_ = fVar174 * 0.0;
    auVar176._4_4_ = fVar231 * 0.0;
    auVar176._8_4_ = fVar261 * 0.0;
    auVar176._12_4_ = fVar210 * 0.0;
    auVar109 = vsubps_avx(auVar93,auVar176);
    auVar177._0_4_ = fVar237 * 0.5;
    auVar177._4_4_ = fVar173 * 0.5;
    auVar177._8_4_ = fVar230 * 0.5;
    auVar177._12_4_ = fVar211 * 0.5;
    auVar162 = vsubps_avx(auVar109,auVar177);
    auVar94._0_4_ =
         fVar266 * 0.16666667 + fVar283 * 0.6666667 + fVar133 * 0.16666667 + fVar263 * 0.0;
    auVar94._4_4_ =
         fVar267 * 0.16666667 + fVar284 * 0.6666667 + fVar134 * 0.16666667 + fVar137 * 0.0;
    auVar94._8_4_ =
         fVar281 * 0.16666667 + fVar285 * 0.6666667 + fVar135 * 0.16666667 + fVar236 * 0.0;
    auVar94._12_4_ =
         fVar282 * 0.16666667 + fVar286 * 0.6666667 + fVar136 * 0.16666667 + fVar287 * 0.0;
    auVar289._0_4_ = fVar133 * 0.5 + fVar263 * 0.0;
    auVar289._4_4_ = fVar134 * 0.5 + fVar137 * 0.0;
    auVar289._8_4_ = fVar135 * 0.5 + fVar236 * 0.0;
    auVar289._12_4_ = fVar136 * 0.5 + fVar287 * 0.0;
    auVar376._0_4_ = fVar283 * 0.0;
    auVar376._4_4_ = fVar284 * 0.0;
    auVar376._8_4_ = fVar285 * 0.0;
    auVar376._12_4_ = fVar286 * 0.0;
    auVar109 = vsubps_avx(auVar289,auVar376);
    auVar377._0_4_ = fVar266 * 0.5;
    auVar377._4_4_ = fVar267 * 0.5;
    auVar377._8_4_ = fVar281 * 0.5;
    auVar377._12_4_ = fVar282 * 0.5;
    auVar316 = vsubps_avx(auVar109,auVar377);
    auVar239._0_4_ = fVar237 * 0.0;
    auVar239._4_4_ = fVar173 * 0.0;
    auVar239._8_4_ = fVar230 * 0.0;
    auVar239._12_4_ = fVar211 * 0.0;
    auVar290._0_4_ =
         auVar239._0_4_ + fVar174 * 0.16666667 + fVar232 * 0.6666667 + fVar264 * 0.16666667;
    auVar290._4_4_ =
         auVar239._4_4_ + fVar231 * 0.16666667 + fVar262 * 0.6666667 + fVar234 * 0.16666667;
    auVar290._8_4_ =
         auVar239._8_4_ + fVar261 * 0.16666667 + fVar132 * 0.6666667 + fVar265 * 0.16666667;
    auVar290._12_4_ =
         auVar239._12_4_ + fVar210 * 0.16666667 + fVar233 * 0.6666667 + fVar235 * 0.16666667;
    auVar299._0_4_ = fVar264 * 0.5 + fVar232 * 0.0;
    auVar299._4_4_ = fVar234 * 0.5 + fVar262 * 0.0;
    auVar299._8_4_ = fVar265 * 0.5 + fVar132 * 0.0;
    auVar299._12_4_ = fVar235 * 0.5 + fVar233 * 0.0;
    auVar214._0_4_ = fVar174 * 0.5;
    auVar214._4_4_ = fVar231 * 0.5;
    auVar214._8_4_ = fVar261 * 0.5;
    auVar214._12_4_ = fVar210 * 0.5;
    auVar109 = vsubps_avx(auVar299,auVar214);
    auVar150 = vsubps_avx(auVar109,auVar239);
    auVar240._0_4_ = fVar266 * 0.0;
    auVar240._4_4_ = fVar267 * 0.0;
    auVar240._8_4_ = fVar281 * 0.0;
    auVar240._12_4_ = fVar282 * 0.0;
    auVar215._0_4_ =
         auVar240._0_4_ + fVar283 * 0.16666667 + fVar133 * 0.6666667 + fVar263 * 0.16666667;
    auVar215._4_4_ =
         auVar240._4_4_ + fVar284 * 0.16666667 + fVar134 * 0.6666667 + fVar137 * 0.16666667;
    auVar215._8_4_ =
         auVar240._8_4_ + fVar285 * 0.16666667 + fVar135 * 0.6666667 + fVar236 * 0.16666667;
    auVar215._12_4_ =
         auVar240._12_4_ + fVar286 * 0.16666667 + fVar136 * 0.6666667 + fVar287 * 0.16666667;
    auVar300._0_4_ = fVar133 * 0.0 + fVar263 * 0.5;
    auVar300._4_4_ = fVar134 * 0.0 + fVar137 * 0.5;
    auVar300._8_4_ = fVar135 * 0.0 + fVar236 * 0.5;
    auVar300._12_4_ = fVar136 * 0.0 + fVar287 * 0.5;
    auVar269._0_4_ = fVar283 * 0.5;
    auVar269._4_4_ = fVar284 * 0.5;
    auVar269._8_4_ = fVar285 * 0.5;
    auVar269._12_4_ = fVar286 * 0.5;
    auVar109 = vsubps_avx(auVar300,auVar269);
    auVar6 = vsubps_avx(auVar109,auVar240);
    auVar109 = vshufps_avx(auVar162,auVar162,0xc9);
    auVar241 = vshufps_avx(auVar94,auVar94,0xc9);
    fVar133 = auVar162._0_4_;
    auVar270._0_4_ = fVar133 * auVar241._0_4_;
    fVar134 = auVar162._4_4_;
    auVar270._4_4_ = fVar134 * auVar241._4_4_;
    fVar135 = auVar162._8_4_;
    auVar270._8_4_ = fVar135 * auVar241._8_4_;
    fVar136 = auVar162._12_4_;
    auVar270._12_4_ = fVar136 * auVar241._12_4_;
    auVar95._0_4_ = auVar109._0_4_ * auVar94._0_4_;
    auVar95._4_4_ = auVar109._4_4_ * auVar94._4_4_;
    auVar95._8_4_ = auVar109._8_4_ * auVar94._8_4_;
    auVar95._12_4_ = auVar109._12_4_ * auVar94._12_4_;
    auVar241 = vsubps_avx(auVar95,auVar270);
    auVar203 = vshufps_avx(auVar241,auVar241,0xc9);
    auVar241 = vshufps_avx(auVar316,auVar316,0xc9);
    auVar96._0_4_ = fVar133 * auVar241._0_4_;
    auVar96._4_4_ = fVar134 * auVar241._4_4_;
    auVar96._8_4_ = fVar135 * auVar241._8_4_;
    auVar96._12_4_ = fVar136 * auVar241._12_4_;
    auVar301._0_4_ = auVar316._0_4_ * auVar109._0_4_;
    auVar301._4_4_ = auVar316._4_4_ * auVar109._4_4_;
    auVar301._8_4_ = auVar316._8_4_ * auVar109._8_4_;
    auVar301._12_4_ = auVar316._12_4_ * auVar109._12_4_;
    auVar109 = vsubps_avx(auVar301,auVar96);
    auVar316 = vshufps_avx(auVar109,auVar109,0xc9);
    auVar109 = vshufps_avx(auVar150,auVar150,0xc9);
    auVar241 = vshufps_avx(auVar215,auVar215,0xc9);
    fVar137 = auVar150._0_4_;
    auVar314._0_4_ = fVar137 * auVar241._0_4_;
    fVar236 = auVar150._4_4_;
    auVar314._4_4_ = fVar236 * auVar241._4_4_;
    fVar287 = auVar150._8_4_;
    auVar314._8_4_ = fVar287 * auVar241._8_4_;
    fVar312 = auVar150._12_4_;
    auVar314._12_4_ = fVar312 * auVar241._12_4_;
    auVar216._0_4_ = auVar109._0_4_ * auVar215._0_4_;
    auVar216._4_4_ = auVar109._4_4_ * auVar215._4_4_;
    auVar216._8_4_ = auVar109._8_4_ * auVar215._8_4_;
    auVar216._12_4_ = auVar109._12_4_ * auVar215._12_4_;
    auVar241 = vsubps_avx(auVar216,auVar314);
    auVar34 = vshufps_avx(auVar241,auVar241,0xc9);
    auVar241 = vshufps_avx(auVar6,auVar6,0xc9);
    auVar315._0_4_ = fVar137 * auVar241._0_4_;
    auVar315._4_4_ = fVar236 * auVar241._4_4_;
    auVar315._8_4_ = fVar287 * auVar241._8_4_;
    auVar315._12_4_ = fVar312 * auVar241._12_4_;
    auVar97._0_4_ = auVar109._0_4_ * auVar6._0_4_;
    auVar97._4_4_ = auVar109._4_4_ * auVar6._4_4_;
    auVar97._8_4_ = auVar109._8_4_ * auVar6._8_4_;
    auVar97._12_4_ = auVar109._12_4_ * auVar6._12_4_;
    auVar109 = vdpps_avx(auVar203,auVar203,0x7f);
    auVar241 = vsubps_avx(auVar97,auVar315);
    auVar6 = vshufps_avx(auVar241,auVar241,0xc9);
    fVar173 = auVar109._0_4_;
    auVar151 = ZEXT416((uint)fVar173);
    auVar241 = vrsqrtss_avx(auVar151,auVar151);
    fVar237 = auVar241._0_4_;
    auVar241 = ZEXT416((uint)(fVar237 * 1.5 - fVar173 * 0.5 * fVar237 * fVar237 * fVar237));
    auVar7 = vshufps_avx(auVar241,auVar241,0);
    fVar266 = auVar7._0_4_ * auVar203._0_4_;
    fVar267 = auVar7._4_4_ * auVar203._4_4_;
    fVar281 = auVar7._8_4_ * auVar203._8_4_;
    fVar282 = auVar7._12_4_ * auVar203._12_4_;
    auVar241 = vdpps_avx(auVar203,auVar316,0x7f);
    auVar109 = vshufps_avx(auVar109,auVar109,0);
    auVar302._0_4_ = auVar109._0_4_ * auVar316._0_4_;
    auVar302._4_4_ = auVar109._4_4_ * auVar316._4_4_;
    auVar302._8_4_ = auVar109._8_4_ * auVar316._8_4_;
    auVar302._12_4_ = auVar109._12_4_ * auVar316._12_4_;
    auVar109 = vshufps_avx(auVar241,auVar241,0);
    auVar271._0_4_ = auVar109._0_4_ * auVar203._0_4_;
    auVar271._4_4_ = auVar109._4_4_ * auVar203._4_4_;
    auVar271._8_4_ = auVar109._8_4_ * auVar203._8_4_;
    auVar271._12_4_ = auVar109._12_4_ * auVar203._12_4_;
    auVar189 = vsubps_avx(auVar302,auVar271);
    auVar109 = vrcpss_avx(auVar151,auVar151);
    auVar109 = ZEXT416((uint)((2.0 - fVar173 * auVar109._0_4_) * auVar109._0_4_));
    auVar203 = vshufps_avx(auVar109,auVar109,0);
    auVar109 = vdpps_avx(auVar34,auVar34,0x7f);
    fVar283 = auVar109._0_4_;
    auVar316 = ZEXT416((uint)fVar283);
    auVar241 = vrsqrtss_avx(auVar316,auVar316);
    fVar264 = auVar241._0_4_;
    auVar241 = vdpps_avx(auVar34,auVar6,0x7f);
    auVar109 = vshufps_avx(auVar109,auVar109,0);
    auVar407._0_4_ = auVar109._0_4_ * auVar6._0_4_;
    auVar407._4_4_ = auVar109._4_4_ * auVar6._4_4_;
    auVar407._8_4_ = auVar109._8_4_ * auVar6._8_4_;
    auVar407._12_4_ = auVar109._12_4_ * auVar6._12_4_;
    lVar23 = *(long *)(_Var21 + 0x38 + lVar89);
    lVar24 = *(long *)(_Var21 + 0x48 + lVar89);
    pauVar3 = (undefined1 (*) [16])(lVar23 + lVar24 * uVar84);
    auVar298 = *pauVar3;
    pfVar2 = (float *)(lVar23 + lVar24 * lVar90);
    fVar237 = *pfVar2;
    fVar173 = pfVar2[1];
    fVar230 = pfVar2[2];
    fVar211 = pfVar2[3];
    pfVar2 = (float *)(lVar23 + lVar24 * lVar1);
    fVar174 = *pfVar2;
    fVar231 = pfVar2[1];
    fVar261 = pfVar2[2];
    fVar210 = pfVar2[3];
    auVar109 = vshufps_avx(auVar241,auVar241,0);
    auVar98._0_4_ = auVar109._0_4_ * auVar34._0_4_;
    auVar98._4_4_ = auVar109._4_4_ * auVar34._4_4_;
    auVar98._8_4_ = auVar109._8_4_ * auVar34._8_4_;
    auVar98._12_4_ = auVar109._12_4_ * auVar34._12_4_;
    auVar6 = vsubps_avx(auVar407,auVar98);
    pfVar2 = (float *)(lVar23 + lVar24 * lVar91);
    fVar232 = *pfVar2;
    fVar262 = pfVar2[1];
    fVar132 = pfVar2[2];
    fVar233 = pfVar2[3];
    lVar23 = *(long *)(lVar22 + 0x38 + lVar89);
    lVar22 = *(long *)(lVar22 + 0x48 + lVar89);
    auVar109 = ZEXT416((uint)(fVar264 * 1.5 - fVar283 * 0.5 * fVar264 * fVar264 * fVar264));
    auVar241 = vshufps_avx(auVar109,auVar109,0);
    fVar264 = auVar241._0_4_ * auVar34._0_4_;
    fVar234 = auVar241._4_4_ * auVar34._4_4_;
    fVar265 = auVar241._8_4_ * auVar34._8_4_;
    fVar235 = auVar241._12_4_ * auVar34._12_4_;
    auVar109 = vrcpss_avx(auVar316,auVar316);
    auVar109 = ZEXT416((uint)(auVar109._0_4_ * (2.0 - auVar109._0_4_ * fVar283)));
    auVar109 = vshufps_avx(auVar109,auVar109,0);
    auVar316 = vshufps_avx(_local_700,_local_700,0xff);
    auVar352._0_4_ = auVar316._0_4_ * fVar266;
    auVar352._4_4_ = auVar316._4_4_ * fVar267;
    auVar352._8_4_ = auVar316._8_4_ * fVar281;
    auVar352._12_4_ = auVar316._12_4_ * fVar282;
    auVar34 = vshufps_avx(auVar162,auVar162,0xff);
    auVar151 = vsubps_avx(_local_700,auVar352);
    auVar242._0_4_ =
         auVar34._0_4_ * fVar266 + auVar316._0_4_ * auVar7._0_4_ * auVar189._0_4_ * auVar203._0_4_;
    auVar242._4_4_ =
         auVar34._4_4_ * fVar267 + auVar316._4_4_ * auVar7._4_4_ * auVar189._4_4_ * auVar203._4_4_;
    auVar242._8_4_ =
         auVar34._8_4_ * fVar281 + auVar316._8_4_ * auVar7._8_4_ * auVar189._8_4_ * auVar203._8_4_;
    auVar242._12_4_ =
         auVar34._12_4_ * fVar282 +
         auVar316._12_4_ * auVar7._12_4_ * auVar189._12_4_ * auVar203._12_4_;
    auVar7 = vsubps_avx(auVar162,auVar242);
    local_700._0_4_ = (float)local_700._0_4_ + auVar352._0_4_;
    local_700._4_4_ = (float)local_700._4_4_ + auVar352._4_4_;
    fStack_6f8 = fStack_6f8 + auVar352._8_4_;
    fStack_6f4 = fStack_6f4 + auVar352._12_4_;
    auVar203 = vshufps_avx(auVar290,auVar290,0xff);
    auVar178._0_4_ = auVar203._0_4_ * fVar264;
    auVar178._4_4_ = auVar203._4_4_ * fVar234;
    auVar178._8_4_ = auVar203._8_4_ * fVar265;
    auVar178._12_4_ = auVar203._12_4_ * fVar235;
    auVar316 = vshufps_avx(auVar150,auVar150,0xff);
    auVar162 = vsubps_avx(auVar290,auVar178);
    auVar99._0_4_ =
         auVar316._0_4_ * fVar264 + auVar203._0_4_ * auVar241._0_4_ * auVar6._0_4_ * auVar109._0_4_;
    auVar99._4_4_ =
         auVar316._4_4_ * fVar234 + auVar203._4_4_ * auVar241._4_4_ * auVar6._4_4_ * auVar109._4_4_;
    auVar99._8_4_ =
         auVar316._8_4_ * fVar265 + auVar203._8_4_ * auVar241._8_4_ * auVar6._8_4_ * auVar109._8_4_;
    auVar99._12_4_ =
         auVar316._12_4_ * fVar235 +
         auVar203._12_4_ * auVar241._12_4_ * auVar6._12_4_ * auVar109._12_4_;
    auVar150 = vsubps_avx(auVar150,auVar99);
    local_610._4_4_ = auVar290._4_4_ + auVar178._4_4_;
    local_610._0_4_ = auVar290._0_4_ + auVar178._0_4_;
    fStack_608 = auVar290._8_4_ + auVar178._8_4_;
    fStack_604 = auVar290._12_4_ + auVar178._12_4_;
    local_600._0_4_ =
         *(float *)*pauVar3 * 0.16666667 +
         fVar237 * 0.6666667 + fVar174 * 0.16666667 + fVar232 * 0.0;
    local_600._4_4_ =
         *(float *)(*pauVar3 + 4) * 0.16666667 +
         fVar173 * 0.6666667 + fVar231 * 0.16666667 + fVar262 * 0.0;
    fStack_5f8 = *(float *)(*pauVar3 + 8) * 0.16666667 +
                 fVar230 * 0.6666667 + fVar261 * 0.16666667 + fVar132 * 0.0;
    fStack_5f4 = *(float *)(*pauVar3 + 0xc) * 0.16666667 +
                 fVar211 * 0.6666667 + fVar210 * 0.16666667 + fVar233 * 0.0;
    auVar100._0_4_ = fVar174 * 0.5 + fVar232 * 0.0;
    auVar100._4_4_ = fVar231 * 0.5 + fVar262 * 0.0;
    auVar100._8_4_ = fVar261 * 0.5 + fVar132 * 0.0;
    auVar100._12_4_ = fVar210 * 0.5 + fVar233 * 0.0;
    auVar140._0_4_ = fVar237 * 0.0;
    auVar140._4_4_ = fVar173 * 0.0;
    auVar140._8_4_ = fVar230 * 0.0;
    auVar140._12_4_ = fVar211 * 0.0;
    auVar109 = vsubps_avx(auVar100,auVar140);
    auVar141._0_4_ = *(float *)*pauVar3 * 0.5;
    auVar141._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
    auVar141._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
    auVar141._12_4_ = *(float *)(*pauVar3 + 0xc) * 0.5;
    auVar189 = vsubps_avx(auVar109,auVar141);
    auVar109 = *(undefined1 (*) [16])(lVar23 + lVar1 * lVar22);
    pfVar2 = (float *)(lVar23 + lVar22 * lVar91);
    fVar264 = *pfVar2;
    fVar234 = pfVar2[1];
    fVar265 = pfVar2[2];
    fVar235 = pfVar2[3];
    fVar263 = auVar109._0_4_;
    fVar313 = auVar109._4_4_;
    fVar330 = auVar109._8_4_;
    fVar331 = auVar109._12_4_;
    pfVar2 = (float *)(lVar23 + lVar90 * lVar22);
    fVar266 = *pfVar2;
    fVar267 = pfVar2[1];
    fVar281 = pfVar2[2];
    fVar282 = pfVar2[3];
    pfVar2 = (float *)(lVar23 + uVar84 * lVar22);
    fVar283 = *pfVar2;
    fVar284 = pfVar2[1];
    fVar285 = pfVar2[2];
    fVar286 = pfVar2[3];
    auVar243._0_4_ =
         fVar283 * 0.16666667 + fVar266 * 0.6666667 + fVar263 * 0.16666667 + fVar264 * 0.0;
    auVar243._4_4_ =
         fVar284 * 0.16666667 + fVar267 * 0.6666667 + fVar313 * 0.16666667 + fVar234 * 0.0;
    auVar243._8_4_ =
         fVar285 * 0.16666667 + fVar281 * 0.6666667 + fVar330 * 0.16666667 + fVar265 * 0.0;
    auVar243._12_4_ =
         fVar286 * 0.16666667 + fVar282 * 0.6666667 + fVar331 * 0.16666667 + fVar235 * 0.0;
    auVar217._0_4_ = fVar263 * 0.5 + fVar264 * 0.0;
    auVar217._4_4_ = fVar313 * 0.5 + fVar234 * 0.0;
    auVar217._8_4_ = fVar330 * 0.5 + fVar265 * 0.0;
    auVar217._12_4_ = fVar331 * 0.5 + fVar235 * 0.0;
    auVar317._0_4_ = fVar266 * 0.0;
    auVar317._4_4_ = fVar267 * 0.0;
    auVar317._8_4_ = fVar281 * 0.0;
    auVar317._12_4_ = fVar282 * 0.0;
    auVar109 = vsubps_avx(auVar217,auVar317);
    auVar318._0_4_ = fVar283 * 0.5;
    auVar318._4_4_ = fVar284 * 0.5;
    auVar318._8_4_ = fVar285 * 0.5;
    auVar318._12_4_ = fVar286 * 0.5;
    auVar241 = vsubps_avx(auVar109,auVar318);
    auVar319._0_4_ = fVar174 * 0.0 + fVar232 * 0.5;
    auVar319._4_4_ = fVar231 * 0.0 + fVar262 * 0.5;
    auVar319._8_4_ = fVar261 * 0.0 + fVar132 * 0.5;
    auVar319._12_4_ = fVar210 * 0.0 + fVar233 * 0.5;
    auVar378._0_4_ = fVar237 * 0.5;
    auVar378._4_4_ = fVar173 * 0.5;
    auVar378._8_4_ = fVar230 * 0.5;
    auVar378._12_4_ = fVar211 * 0.5;
    auVar109 = vsubps_avx(auVar319,auVar378);
    local_6c0 = auVar298._0_4_;
    fStack_6bc = auVar298._4_4_;
    fStack_6b8 = auVar298._8_4_;
    fStack_6b4 = auVar298._12_4_;
    auVar362._0_4_ = local_6c0 * 0.0;
    auVar362._4_4_ = fStack_6bc * 0.0;
    auVar362._8_4_ = fStack_6b8 * 0.0;
    auVar362._12_4_ = fStack_6b4 * 0.0;
    auVar379._0_4_ =
         auVar362._0_4_ + fVar237 * 0.16666667 + fVar232 * 0.16666667 + fVar174 * 0.6666667;
    auVar379._4_4_ =
         auVar362._4_4_ + fVar173 * 0.16666667 + fVar262 * 0.16666667 + fVar231 * 0.6666667;
    auVar379._8_4_ =
         auVar362._8_4_ + fVar230 * 0.16666667 + fVar132 * 0.16666667 + fVar261 * 0.6666667;
    auVar379._12_4_ =
         auVar362._12_4_ + fVar211 * 0.16666667 + fVar233 * 0.16666667 + fVar210 * 0.6666667;
    auVar298 = vsubps_avx(auVar109,auVar362);
    auVar179._0_4_ = fVar263 * 0.0 + fVar264 * 0.5;
    auVar179._4_4_ = fVar313 * 0.0 + fVar234 * 0.5;
    auVar179._8_4_ = fVar330 * 0.0 + fVar265 * 0.5;
    auVar179._12_4_ = fVar331 * 0.0 + fVar235 * 0.5;
    auVar101._0_4_ = fVar266 * 0.5;
    auVar101._4_4_ = fVar267 * 0.5;
    auVar101._8_4_ = fVar281 * 0.5;
    auVar101._12_4_ = fVar282 * 0.5;
    auVar109 = vsubps_avx(auVar179,auVar101);
    auVar142._0_4_ = fVar283 * 0.0;
    auVar142._4_4_ = fVar284 * 0.0;
    auVar142._8_4_ = fVar285 * 0.0;
    auVar142._12_4_ = fVar286 * 0.0;
    auVar180._0_4_ =
         auVar142._0_4_ + fVar266 * 0.16666667 + fVar263 * 0.6666667 + fVar264 * 0.16666667;
    auVar180._4_4_ =
         auVar142._4_4_ + fVar267 * 0.16666667 + fVar313 * 0.6666667 + fVar234 * 0.16666667;
    auVar180._8_4_ =
         auVar142._8_4_ + fVar281 * 0.16666667 + fVar330 * 0.6666667 + fVar265 * 0.16666667;
    auVar180._12_4_ =
         auVar142._12_4_ + fVar282 * 0.16666667 + fVar331 * 0.6666667 + fVar235 * 0.16666667;
    auVar203 = vsubps_avx(auVar109,auVar142);
    auVar109 = vshufps_avx(auVar243,auVar243,0xc9);
    fVar232 = auVar189._0_4_;
    auVar143._0_4_ = fVar232 * auVar109._0_4_;
    fVar262 = auVar189._4_4_;
    auVar143._4_4_ = fVar262 * auVar109._4_4_;
    fVar132 = auVar189._8_4_;
    auVar143._8_4_ = fVar132 * auVar109._8_4_;
    fVar264 = auVar189._12_4_;
    auVar143._12_4_ = fVar264 * auVar109._12_4_;
    auVar109 = vshufps_avx(auVar189,auVar189,0xc9);
    auVar244._0_4_ = auVar109._0_4_ * auVar243._0_4_;
    auVar244._4_4_ = auVar109._4_4_ * auVar243._4_4_;
    auVar244._8_4_ = auVar109._8_4_ * auVar243._8_4_;
    auVar244._12_4_ = auVar109._12_4_ * auVar243._12_4_;
    auVar316 = vsubps_avx(auVar244,auVar143);
    auVar144._0_4_ = auVar109._0_4_ * auVar241._0_4_;
    auVar144._4_4_ = auVar109._4_4_ * auVar241._4_4_;
    auVar144._8_4_ = auVar109._8_4_ * auVar241._8_4_;
    auVar144._12_4_ = auVar109._12_4_ * auVar241._12_4_;
    auVar109 = vshufps_avx(auVar241,auVar241,0xc9);
    auVar218._0_4_ = fVar232 * auVar109._0_4_;
    auVar218._4_4_ = fVar262 * auVar109._4_4_;
    auVar218._8_4_ = fVar132 * auVar109._8_4_;
    auVar218._12_4_ = fVar264 * auVar109._12_4_;
    auVar34 = vsubps_avx(auVar144,auVar218);
    auVar109 = vshufps_avx(auVar180,auVar180,0xc9);
    fVar233 = auVar298._0_4_;
    auVar145._0_4_ = fVar233 * auVar109._0_4_;
    fVar234 = auVar298._4_4_;
    auVar145._4_4_ = fVar234 * auVar109._4_4_;
    fVar265 = auVar298._8_4_;
    auVar145._8_4_ = fVar265 * auVar109._8_4_;
    fVar235 = auVar298._12_4_;
    auVar145._12_4_ = fVar235 * auVar109._12_4_;
    auVar109 = vshufps_avx(auVar298,auVar298,0xc9);
    auVar181._0_4_ = auVar109._0_4_ * auVar180._0_4_;
    auVar181._4_4_ = auVar109._4_4_ * auVar180._4_4_;
    auVar181._8_4_ = auVar109._8_4_ * auVar180._8_4_;
    auVar181._12_4_ = auVar109._12_4_ * auVar180._12_4_;
    auVar6 = vsubps_avx(auVar181,auVar145);
    auVar182._0_4_ = auVar109._0_4_ * auVar203._0_4_;
    auVar182._4_4_ = auVar109._4_4_ * auVar203._4_4_;
    auVar182._8_4_ = auVar109._8_4_ * auVar203._8_4_;
    auVar182._12_4_ = auVar109._12_4_ * auVar203._12_4_;
    auVar109 = vshufps_avx(auVar203,auVar203,0xc9);
    auVar102._0_4_ = fVar233 * auVar109._0_4_;
    auVar102._4_4_ = fVar234 * auVar109._4_4_;
    auVar102._8_4_ = fVar265 * auVar109._8_4_;
    auVar102._12_4_ = fVar235 * auVar109._12_4_;
    auVar8 = vsubps_avx(auVar182,auVar102);
    auVar203 = vshufps_avx(auVar316,auVar316,0xc9);
    auVar109 = vdpps_avx(auVar203,auVar203,0x7f);
    fVar237 = auVar109._0_4_;
    auVar245 = ZEXT416((uint)fVar237);
    auVar241 = vrsqrtss_avx(auVar245,auVar245);
    fVar173 = auVar241._0_4_;
    auVar316 = vshufps_avx(auVar34,auVar34,0xc9);
    auVar241 = vdpps_avx(auVar203,auVar316,0x7f);
    auVar109 = vshufps_avx(auVar109,auVar109,0);
    auVar219._0_4_ = auVar109._0_4_ * auVar316._0_4_;
    auVar219._4_4_ = auVar109._4_4_ * auVar316._4_4_;
    auVar219._8_4_ = auVar109._8_4_ * auVar316._8_4_;
    auVar219._12_4_ = auVar109._12_4_ * auVar316._12_4_;
    auVar109 = vshufps_avx(auVar241,auVar241,0);
    auVar393._0_4_ = auVar109._0_4_ * auVar203._0_4_;
    auVar393._4_4_ = auVar109._4_4_ * auVar203._4_4_;
    auVar393._8_4_ = auVar109._8_4_ * auVar203._8_4_;
    auVar393._12_4_ = auVar109._12_4_ * auVar203._12_4_;
    auVar9 = vsubps_avx(auVar219,auVar393);
    auVar109 = vrcpss_avx(auVar245,auVar245);
    auVar109 = ZEXT416((uint)(auVar109._0_4_ * (2.0 - fVar237 * auVar109._0_4_)));
    auVar316 = vshufps_avx(auVar109,auVar109,0);
    auVar109 = ZEXT416((uint)(fVar173 * 1.5 - fVar237 * 0.5 * fVar173 * fVar173 * fVar173));
    auVar34 = vshufps_avx(auVar109,auVar109,0);
    fVar174 = auVar203._0_4_ * auVar34._0_4_;
    fVar231 = auVar203._4_4_ * auVar34._4_4_;
    fVar261 = auVar203._8_4_ * auVar34._8_4_;
    fVar210 = auVar203._12_4_ * auVar34._12_4_;
    auVar203 = vshufps_avx(auVar6,auVar6,0xc9);
    auVar109 = vdpps_avx(auVar203,auVar203,0x7f);
    fVar237 = auVar109._0_4_;
    auVar245 = ZEXT416((uint)fVar237);
    auVar241 = vrsqrtss_avx(auVar245,auVar245);
    fVar173 = auVar241._0_4_;
    auVar6 = vshufps_avx(auVar8,auVar8,0xc9);
    auVar241 = vdpps_avx(auVar203,auVar6,0x7f);
    auVar109 = vshufps_avx(auVar109,auVar109,0);
    auVar103._0_4_ = auVar109._0_4_ * auVar6._0_4_;
    auVar103._4_4_ = auVar109._4_4_ * auVar6._4_4_;
    auVar103._8_4_ = auVar109._8_4_ * auVar6._8_4_;
    auVar103._12_4_ = auVar109._12_4_ * auVar6._12_4_;
    auVar109 = vshufps_avx(auVar241,auVar241,0);
    auVar320._0_4_ = auVar109._0_4_ * auVar203._0_4_;
    auVar320._4_4_ = auVar109._4_4_ * auVar203._4_4_;
    auVar320._8_4_ = auVar109._8_4_ * auVar203._8_4_;
    auVar320._12_4_ = auVar109._12_4_ * auVar203._12_4_;
    auVar8 = vsubps_avx(auVar103,auVar320);
    auVar109 = vrcpss_avx(auVar245,auVar245);
    auVar109 = ZEXT416((uint)(auVar109._0_4_ * (2.0 - fVar237 * auVar109._0_4_)));
    auVar109 = vshufps_avx(auVar109,auVar109,0);
    auVar241 = ZEXT416((uint)(fVar173 * 1.5 - fVar237 * 0.5 * fVar173 * fVar173 * fVar173));
    auVar241 = vshufps_avx(auVar241,auVar241,0);
    fVar237 = auVar203._0_4_ * auVar241._0_4_;
    fVar173 = auVar203._4_4_ * auVar241._4_4_;
    fVar230 = auVar203._8_4_ * auVar241._8_4_;
    fVar211 = auVar203._12_4_ * auVar241._12_4_;
    auVar203 = vshufps_avx(auVar189,auVar189,0xff);
    auVar6 = vshufps_avx(_local_600,_local_600,0xff);
    auVar183._0_4_ = auVar6._0_4_ * fVar174;
    auVar183._4_4_ = auVar6._4_4_ * fVar231;
    auVar183._8_4_ = auVar6._8_4_ * fVar261;
    auVar183._12_4_ = auVar6._12_4_ * fVar210;
    auVar220._0_4_ =
         auVar203._0_4_ * fVar174 + auVar34._0_4_ * auVar9._0_4_ * auVar316._0_4_ * auVar6._0_4_;
    auVar220._4_4_ =
         auVar203._4_4_ * fVar231 + auVar34._4_4_ * auVar9._4_4_ * auVar316._4_4_ * auVar6._4_4_;
    auVar220._8_4_ =
         auVar203._8_4_ * fVar261 + auVar34._8_4_ * auVar9._8_4_ * auVar316._8_4_ * auVar6._8_4_;
    auVar220._12_4_ =
         auVar203._12_4_ * fVar210 +
         auVar34._12_4_ * auVar9._12_4_ * auVar316._12_4_ * auVar6._12_4_;
    auVar34 = vsubps_avx(_local_600,auVar183);
    local_600._0_4_ = (float)local_600._0_4_ + auVar183._0_4_;
    local_600._4_4_ = (float)local_600._4_4_ + auVar183._4_4_;
    fStack_5f8 = fStack_5f8 + auVar183._8_4_;
    fStack_5f4 = fStack_5f4 + auVar183._12_4_;
    auVar6 = vsubps_avx(auVar189,auVar220);
    auVar203 = vshufps_avx(auVar298,auVar298,0xff);
    auVar316 = vshufps_avx(auVar379,auVar379,0xff);
    auVar146._0_4_ = auVar316._0_4_ * fVar237;
    auVar146._4_4_ = auVar316._4_4_ * fVar173;
    auVar146._8_4_ = auVar316._8_4_ * fVar230;
    auVar146._12_4_ = auVar316._12_4_ * fVar211;
    auVar184._0_4_ =
         auVar203._0_4_ * fVar237 + auVar316._0_4_ * auVar241._0_4_ * auVar8._0_4_ * auVar109._0_4_;
    auVar184._4_4_ =
         auVar203._4_4_ * fVar173 + auVar316._4_4_ * auVar241._4_4_ * auVar8._4_4_ * auVar109._4_4_;
    auVar184._8_4_ =
         auVar203._8_4_ * fVar230 + auVar316._8_4_ * auVar241._8_4_ * auVar8._8_4_ * auVar109._8_4_;
    auVar184._12_4_ =
         auVar203._12_4_ * fVar211 +
         auVar316._12_4_ * auVar241._12_4_ * auVar8._12_4_ * auVar109._12_4_;
    auVar203 = vsubps_avx(auVar379,auVar146);
    auVar394._0_4_ = auVar379._0_4_ + auVar146._0_4_;
    auVar394._4_4_ = auVar379._4_4_ + auVar146._4_4_;
    auVar394._8_4_ = auVar379._8_4_ + auVar146._8_4_;
    auVar394._12_4_ = auVar379._12_4_ + auVar146._12_4_;
    auVar316 = vsubps_avx(auVar298,auVar184);
    local_6a0 = auVar7._0_4_;
    fStack_69c = auVar7._4_4_;
    fStack_698 = auVar7._8_4_;
    fStack_694 = auVar7._12_4_;
    local_680 = auVar151._0_4_;
    fStack_67c = auVar151._4_4_;
    fStack_678 = auVar151._8_4_;
    fStack_674 = auVar151._12_4_;
    auVar109 = vshufps_avx(ZEXT416((uint)fVar212),ZEXT416((uint)fVar212),0);
    auVar241 = vshufps_avx(ZEXT416((uint)(1.0 - fVar212)),ZEXT416((uint)(1.0 - fVar212)),0);
    fVar211 = auVar109._0_4_;
    fVar174 = auVar109._4_4_;
    fVar231 = auVar109._8_4_;
    fVar261 = auVar109._12_4_;
    fVar212 = auVar241._0_4_;
    fVar237 = auVar241._4_4_;
    fVar173 = auVar241._8_4_;
    fVar230 = auVar241._12_4_;
    local_490._0_4_ = fVar212 * local_680 + fVar211 * auVar34._0_4_;
    local_490._4_4_ = fVar237 * fStack_67c + fVar174 * auVar34._4_4_;
    fStack_488 = fVar173 * fStack_678 + fVar231 * auVar34._8_4_;
    fStack_484 = fVar230 * fStack_674 + fVar261 * auVar34._12_4_;
    fVar284 = (local_680 + local_6a0 * 0.33333334) * fVar212 +
              fVar211 * (auVar34._0_4_ + auVar6._0_4_ * 0.33333334);
    fVar285 = (fStack_67c + fStack_69c * 0.33333334) * fVar237 +
              fVar174 * (auVar34._4_4_ + auVar6._4_4_ * 0.33333334);
    fVar286 = (fStack_678 + fStack_698 * 0.33333334) * fVar173 +
              fVar231 * (auVar34._8_4_ + auVar6._8_4_ * 0.33333334);
    fVar263 = (fStack_674 + fStack_694 * 0.33333334) * fVar230 +
              fVar261 * (auVar34._12_4_ + auVar6._12_4_ * 0.33333334);
    local_6e0 = auVar150._0_4_;
    fStack_6dc = auVar150._4_4_;
    fStack_6d8 = auVar150._8_4_;
    fStack_6d4 = auVar150._12_4_;
    auVar246._0_4_ = local_6e0 * 0.33333334;
    auVar246._4_4_ = fStack_6dc * 0.33333334;
    auVar246._8_4_ = fStack_6d8 * 0.33333334;
    auVar246._12_4_ = fStack_6d4 * 0.33333334;
    auVar109 = vsubps_avx(auVar162,auVar246);
    auVar291._0_4_ = (fVar137 + auVar99._0_4_) * 0.33333334;
    auVar291._4_4_ = (fVar236 + auVar99._4_4_) * 0.33333334;
    auVar291._8_4_ = (fVar287 + auVar99._8_4_) * 0.33333334;
    auVar291._12_4_ = (fVar312 + auVar99._12_4_) * 0.33333334;
    auVar241 = vsubps_avx(_local_610,auVar291);
    auVar321._0_4_ = auVar316._0_4_ * 0.33333334;
    auVar321._4_4_ = auVar316._4_4_ * 0.33333334;
    auVar321._8_4_ = auVar316._8_4_ * 0.33333334;
    auVar321._12_4_ = auVar316._12_4_ * 0.33333334;
    auVar316 = vsubps_avx(auVar203,auVar321);
    auVar185._0_4_ = (fVar233 + auVar184._0_4_) * 0.33333334;
    auVar185._4_4_ = (fVar234 + auVar184._4_4_) * 0.33333334;
    auVar185._8_4_ = (fVar265 + auVar184._8_4_) * 0.33333334;
    auVar185._12_4_ = (fVar235 + auVar184._12_4_) * 0.33333334;
    auVar34 = vsubps_avx(auVar394,auVar185);
    local_4a0._0_4_ = auVar316._0_4_ * fVar211 + fVar212 * auVar109._0_4_;
    local_4a0._4_4_ = auVar316._4_4_ * fVar174 + fVar237 * auVar109._4_4_;
    fStack_498 = auVar316._8_4_ * fVar231 + fVar173 * auVar109._8_4_;
    fStack_494 = auVar316._12_4_ * fVar261 + fVar230 * auVar109._12_4_;
    fVar233 = fVar212 * auVar162._0_4_ + fVar211 * auVar203._0_4_;
    fVar265 = fVar237 * auVar162._4_4_ + fVar174 * auVar203._4_4_;
    fVar267 = fVar173 * auVar162._8_4_ + fVar231 * auVar203._8_4_;
    fVar282 = fVar230 * auVar162._12_4_ + fVar261 * auVar203._12_4_;
    local_4b0._0_4_ = (float)local_700._0_4_ * fVar212 + fVar211 * (float)local_600._0_4_;
    local_4b0._4_4_ = (float)local_700._4_4_ * fVar237 + fVar174 * (float)local_600._4_4_;
    fStack_4a8 = fStack_6f8 * fVar173 + fVar231 * fStack_5f8;
    fStack_4a4 = fStack_6f4 * fVar230 + fVar261 * fStack_5f4;
    local_4c0._0_4_ =
         ((float)local_700._0_4_ + (fVar133 + auVar242._0_4_) * 0.33333334) * fVar212 +
         ((fVar232 + auVar220._0_4_) * 0.33333334 + (float)local_600._0_4_) * fVar211;
    local_4c0._4_4_ =
         ((float)local_700._4_4_ + (fVar134 + auVar242._4_4_) * 0.33333334) * fVar237 +
         ((fVar262 + auVar220._4_4_) * 0.33333334 + (float)local_600._4_4_) * fVar174;
    fStack_4b8 = (fStack_6f8 + (fVar135 + auVar242._8_4_) * 0.33333334) * fVar173 +
                 ((fVar132 + auVar220._8_4_) * 0.33333334 + fStack_5f8) * fVar231;
    fStack_4b4 = (fStack_6f4 + (fVar136 + auVar242._12_4_) * 0.33333334) * fVar230 +
                 ((fVar264 + auVar220._12_4_) * 0.33333334 + fStack_5f4) * fVar261;
    fVar264 = fVar212 * auVar241._0_4_ + fVar211 * auVar34._0_4_;
    fVar235 = fVar237 * auVar241._4_4_ + fVar174 * auVar34._4_4_;
    fVar281 = fVar173 * auVar241._8_4_ + fVar231 * auVar34._8_4_;
    fVar283 = fVar230 * auVar241._12_4_ + fVar261 * auVar34._12_4_;
    auVar109 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                             0x1c);
    local_430._0_4_ = (auVar290._0_4_ + auVar178._0_4_) * fVar212 + auVar394._0_4_ * fVar211;
    local_430._4_4_ = (auVar290._4_4_ + auVar178._4_4_) * fVar237 + auVar394._4_4_ * fVar174;
    fStack_428 = (auVar290._8_4_ + auVar178._8_4_) * fVar173 + auVar394._8_4_ * fVar231;
    fStack_424 = (auVar290._12_4_ + auVar178._12_4_) * fVar230 + auVar394._12_4_ * fVar261;
    auVar109 = vinsertps_avx(auVar109,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    local_3a0 = vsubps_avx(_local_490,auVar109);
    auVar203 = vmovsldup_avx(local_3a0);
    auVar241 = vmovshdup_avx(local_3a0);
    auVar316 = vshufps_avx(local_3a0,local_3a0,0xaa);
    fVar212 = pre->ray_space[k].vx.field_0.m128[0];
    fVar237 = pre->ray_space[k].vx.field_0.m128[1];
    fVar173 = pre->ray_space[k].vx.field_0.m128[2];
    fVar230 = pre->ray_space[k].vx.field_0.m128[3];
    fVar211 = pre->ray_space[k].vy.field_0.m128[0];
    fVar174 = pre->ray_space[k].vy.field_0.m128[1];
    fVar231 = pre->ray_space[k].vy.field_0.m128[2];
    fVar261 = pre->ray_space[k].vy.field_0.m128[3];
    fVar210 = pre->ray_space[k].vz.field_0.m128[0];
    fVar232 = pre->ray_space[k].vz.field_0.m128[1];
    fVar262 = pre->ray_space[k].vz.field_0.m128[2];
    fVar132 = pre->ray_space[k].vz.field_0.m128[3];
    auVar400._0_4_ = fVar212 * auVar203._0_4_ + fVar211 * auVar241._0_4_ + fVar210 * auVar316._0_4_;
    auVar400._4_4_ = fVar237 * auVar203._4_4_ + fVar174 * auVar241._4_4_ + fVar232 * auVar316._4_4_;
    auVar400._8_4_ = fVar173 * auVar203._8_4_ + fVar231 * auVar241._8_4_ + fVar262 * auVar316._8_4_;
    auVar400._12_4_ =
         fVar230 * auVar203._12_4_ + fVar261 * auVar241._12_4_ + fVar132 * auVar316._12_4_;
    auVar79._4_4_ = fVar285;
    auVar79._0_4_ = fVar284;
    auVar79._8_4_ = fVar286;
    auVar79._12_4_ = fVar263;
    local_3b0 = vsubps_avx(auVar79,auVar109);
    auVar316 = vshufps_avx(local_3b0,local_3b0,0xaa);
    auVar241 = vmovshdup_avx(local_3b0);
    auVar203 = vmovsldup_avx(local_3b0);
    fVar234 = fVar212 * auVar203._0_4_ + fVar211 * auVar241._0_4_ + fVar210 * auVar316._0_4_;
    fVar266 = fVar237 * auVar203._4_4_ + fVar174 * auVar241._4_4_ + fVar232 * auVar316._4_4_;
    local_6f0._4_4_ = fVar266;
    local_6f0._0_4_ = fVar234;
    fStack_6e8 = fVar173 * auVar203._8_4_ + fVar231 * auVar241._8_4_ + fVar262 * auVar316._8_4_;
    fStack_6e4 = fVar230 * auVar203._12_4_ + fVar261 * auVar241._12_4_ + fVar132 * auVar316._12_4_;
    local_3c0 = vsubps_avx(_local_4a0,auVar109);
    auVar316 = vshufps_avx(local_3c0,local_3c0,0xaa);
    auVar241 = vmovshdup_avx(local_3c0);
    auVar203 = vmovsldup_avx(local_3c0);
    auVar395._0_4_ = fVar212 * auVar203._0_4_ + fVar211 * auVar241._0_4_ + fVar210 * auVar316._0_4_;
    auVar395._4_4_ = fVar237 * auVar203._4_4_ + fVar174 * auVar241._4_4_ + fVar232 * auVar316._4_4_;
    auVar395._8_4_ = fVar173 * auVar203._8_4_ + fVar231 * auVar241._8_4_ + fVar262 * auVar316._8_4_;
    auVar395._12_4_ =
         fVar230 * auVar203._12_4_ + fVar261 * auVar241._12_4_ + fVar132 * auVar316._12_4_;
    auVar77._4_4_ = fVar265;
    auVar77._0_4_ = fVar233;
    auVar77._8_4_ = fVar267;
    auVar77._12_4_ = fVar282;
    local_3d0 = vsubps_avx(auVar77,auVar109);
    auVar316 = vshufps_avx(local_3d0,local_3d0,0xaa);
    auVar241 = vmovshdup_avx(local_3d0);
    auVar203 = vmovsldup_avx(local_3d0);
    auVar147._0_4_ = auVar203._0_4_ * fVar212 + auVar241._0_4_ * fVar211 + fVar210 * auVar316._0_4_;
    auVar147._4_4_ = auVar203._4_4_ * fVar237 + auVar241._4_4_ * fVar174 + fVar232 * auVar316._4_4_;
    auVar147._8_4_ = auVar203._8_4_ * fVar173 + auVar241._8_4_ * fVar231 + fVar262 * auVar316._8_4_;
    auVar147._12_4_ =
         auVar203._12_4_ * fVar230 + auVar241._12_4_ * fVar261 + fVar132 * auVar316._12_4_;
    local_3e0 = vsubps_avx(_local_4b0,auVar109);
    auVar316 = vshufps_avx(local_3e0,local_3e0,0xaa);
    auVar241 = vmovshdup_avx(local_3e0);
    auVar203 = vmovsldup_avx(local_3e0);
    auVar322._0_4_ = auVar203._0_4_ * fVar212 + auVar241._0_4_ * fVar211 + auVar316._0_4_ * fVar210;
    auVar322._4_4_ = auVar203._4_4_ * fVar237 + auVar241._4_4_ * fVar174 + auVar316._4_4_ * fVar232;
    auVar322._8_4_ = auVar203._8_4_ * fVar173 + auVar241._8_4_ * fVar231 + auVar316._8_4_ * fVar262;
    auVar322._12_4_ =
         auVar203._12_4_ * fVar230 + auVar241._12_4_ * fVar261 + auVar316._12_4_ * fVar132;
    local_3f0 = vsubps_avx(_local_4c0,auVar109);
    auVar316 = vshufps_avx(local_3f0,local_3f0,0xaa);
    auVar241 = vmovshdup_avx(local_3f0);
    auVar203 = vmovsldup_avx(local_3f0);
    auVar336._0_4_ = auVar203._0_4_ * fVar212 + auVar241._0_4_ * fVar211 + auVar316._0_4_ * fVar210;
    auVar336._4_4_ = auVar203._4_4_ * fVar237 + auVar241._4_4_ * fVar174 + auVar316._4_4_ * fVar232;
    auVar336._8_4_ = auVar203._8_4_ * fVar173 + auVar241._8_4_ * fVar231 + auVar316._8_4_ * fVar262;
    auVar336._12_4_ =
         auVar203._12_4_ * fVar230 + auVar241._12_4_ * fVar261 + auVar316._12_4_ * fVar132;
    auVar75._4_4_ = fVar235;
    auVar75._0_4_ = fVar264;
    auVar75._8_4_ = fVar281;
    auVar75._12_4_ = fVar283;
    local_400 = vsubps_avx(auVar75,auVar109);
    auVar316 = vshufps_avx(local_400,local_400,0xaa);
    auVar241 = vmovshdup_avx(local_400);
    auVar203 = vmovsldup_avx(local_400);
    auVar353._0_4_ = auVar203._0_4_ * fVar212 + auVar241._0_4_ * fVar211 + auVar316._0_4_ * fVar210;
    auVar353._4_4_ = auVar203._4_4_ * fVar237 + auVar241._4_4_ * fVar174 + auVar316._4_4_ * fVar232;
    auVar353._8_4_ = auVar203._8_4_ * fVar173 + auVar241._8_4_ * fVar231 + auVar316._8_4_ * fVar262;
    auVar353._12_4_ =
         auVar203._12_4_ * fVar230 + auVar241._12_4_ * fVar261 + auVar316._12_4_ * fVar132;
    local_410 = vsubps_avx(_local_430,auVar109);
    auVar203 = vshufps_avx(local_410,local_410,0xaa);
    auVar109 = vmovshdup_avx(local_410);
    auVar241 = vmovsldup_avx(local_410);
    auVar104._0_4_ = fVar212 * auVar241._0_4_ + fVar211 * auVar109._0_4_ + fVar210 * auVar203._0_4_;
    auVar104._4_4_ = fVar237 * auVar241._4_4_ + fVar174 * auVar109._4_4_ + fVar232 * auVar203._4_4_;
    auVar104._8_4_ = fVar173 * auVar241._8_4_ + fVar231 * auVar109._8_4_ + fVar262 * auVar203._8_4_;
    auVar104._12_4_ =
         fVar230 * auVar241._12_4_ + fVar261 * auVar109._12_4_ + fVar132 * auVar203._12_4_;
    auVar316 = vmovlhps_avx(auVar400,auVar322);
    auVar34 = vmovlhps_avx(_local_6f0,auVar336);
    auVar6 = vmovlhps_avx(auVar395,auVar353);
    auVar7 = vmovlhps_avx(auVar147,auVar104);
    auVar109 = vminps_avx(auVar316,auVar34);
    auVar241 = vminps_avx(auVar6,auVar7);
    auVar203 = vminps_avx(auVar109,auVar241);
    auVar109 = vmaxps_avx(auVar316,auVar34);
    auVar241 = vmaxps_avx(auVar6,auVar7);
    auVar109 = vmaxps_avx(auVar109,auVar241);
    auVar241 = vshufpd_avx(auVar203,auVar203,3);
    auVar203 = vminps_avx(auVar203,auVar241);
    auVar241 = vshufpd_avx(auVar109,auVar109,3);
    auVar241 = vmaxps_avx(auVar109,auVar241);
    auVar292._8_4_ = 0x7fffffff;
    auVar292._0_8_ = 0x7fffffff7fffffff;
    auVar292._12_4_ = 0x7fffffff;
    auVar109 = vandps_avx(auVar203,auVar292);
    auVar241 = vandps_avx(auVar241,auVar292);
    auVar109 = vmaxps_avx(auVar109,auVar241);
    auVar241 = vmovshdup_avx(auVar109);
    auVar109 = vmaxss_avx(auVar241,auVar109);
    fVar237 = auVar109._0_4_ * 9.536743e-07;
    auVar109 = vshufps_avx(ZEXT416((uint)fVar237),ZEXT416((uint)fVar237),0);
    local_340._16_16_ = auVar109;
    local_340._0_16_ = auVar109;
    auVar105._0_8_ = auVar109._0_8_ ^ 0x8000000080000000;
    auVar105._8_4_ = auVar109._8_4_ ^ 0x80000000;
    auVar105._12_4_ = auVar109._12_4_ ^ 0x80000000;
    local_360._16_16_ = auVar105;
    local_360._0_16_ = auVar105;
    auVar109 = vpshufd_avx(ZEXT416(uVar83),0);
    local_2e0._16_16_ = auVar109;
    local_2e0._0_16_ = auVar109;
    auVar109 = vpshufd_avx(ZEXT416(uVar19),0);
    local_300._16_16_ = auVar109;
    local_300._0_16_ = auVar109;
    uVar87 = 0;
    fVar212 = *(float *)(ray + k * 4 + 0x60);
    _local_370 = vsubps_avx(auVar34,auVar316);
    _local_380 = vsubps_avx(auVar6,auVar34);
    _local_390 = vsubps_avx(auVar7,auVar6);
    _local_440 = vsubps_avx(_local_4b0,_local_490);
    auVar80._4_4_ = fVar285;
    auVar80._0_4_ = fVar284;
    auVar80._8_4_ = fVar286;
    auVar80._12_4_ = fVar263;
    _local_450 = vsubps_avx(_local_4c0,auVar80);
    auVar76._4_4_ = fVar235;
    auVar76._0_4_ = fVar264;
    auVar76._8_4_ = fVar281;
    auVar76._12_4_ = fVar283;
    _local_460 = vsubps_avx(auVar76,_local_4a0);
    auVar78._4_4_ = fVar265;
    auVar78._0_4_ = fVar233;
    auVar78._8_4_ = fVar267;
    auVar78._12_4_ = fVar282;
    _local_470 = vsubps_avx(_local_430,auVar78);
    auVar374 = ZEXT1664(ZEXT816(0x3f80000000000000));
    auVar411 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_01167e96:
    auVar408 = auVar411._0_16_;
    local_420 = auVar408;
    auVar245 = auVar374._0_16_;
    auVar109 = vshufps_avx(auVar245,auVar245,0x50);
    auVar401._8_4_ = 0x3f800000;
    auVar401._0_8_ = 0x3f8000003f800000;
    auVar401._12_4_ = 0x3f800000;
    auVar406._16_4_ = 0x3f800000;
    auVar406._0_16_ = auVar401;
    auVar406._20_4_ = 0x3f800000;
    auVar406._24_4_ = 0x3f800000;
    auVar406._28_4_ = 0x3f800000;
    auVar241 = vsubps_avx(auVar401,auVar109);
    fVar173 = auVar109._0_4_;
    fVar230 = auVar109._4_4_;
    fVar211 = auVar109._8_4_;
    fVar174 = auVar109._12_4_;
    fVar231 = auVar241._0_4_;
    fVar261 = auVar241._4_4_;
    fVar210 = auVar241._8_4_;
    fVar232 = auVar241._12_4_;
    auVar221._0_4_ = auVar322._0_4_ * fVar173 + fVar231 * auVar400._0_4_;
    auVar221._4_4_ = auVar322._4_4_ * fVar230 + fVar261 * auVar400._4_4_;
    auVar221._8_4_ = auVar322._0_4_ * fVar211 + fVar210 * auVar400._0_4_;
    auVar221._12_4_ = auVar322._4_4_ * fVar174 + fVar232 * auVar400._4_4_;
    auVar186._0_4_ = auVar336._0_4_ * fVar173 + fVar231 * fVar234;
    auVar186._4_4_ = auVar336._4_4_ * fVar230 + fVar261 * fVar266;
    auVar186._8_4_ = auVar336._0_4_ * fVar211 + fVar210 * fVar234;
    auVar186._12_4_ = auVar336._4_4_ * fVar174 + fVar232 * fVar266;
    auVar303._0_4_ = auVar353._0_4_ * fVar173 + auVar395._0_4_ * fVar231;
    auVar303._4_4_ = auVar353._4_4_ * fVar230 + auVar395._4_4_ * fVar261;
    auVar303._8_4_ = auVar353._0_4_ * fVar211 + auVar395._0_4_ * fVar210;
    auVar303._12_4_ = auVar353._4_4_ * fVar174 + auVar395._4_4_ * fVar232;
    auVar247._0_4_ = auVar104._0_4_ * fVar173 + auVar147._0_4_ * fVar231;
    auVar247._4_4_ = auVar104._4_4_ * fVar230 + auVar147._4_4_ * fVar261;
    auVar247._8_4_ = auVar104._0_4_ * fVar211 + auVar147._0_4_ * fVar210;
    auVar247._12_4_ = auVar104._4_4_ * fVar174 + auVar147._4_4_ * fVar232;
    auVar109 = vmovshdup_avx(auVar408);
    auVar241 = vshufps_avx(auVar408,auVar408,0);
    auVar344._16_16_ = auVar241;
    auVar344._0_16_ = auVar241;
    auVar203 = vshufps_avx(auVar408,auVar408,0x55);
    auVar124._16_16_ = auVar203;
    auVar124._0_16_ = auVar203;
    auVar120 = vsubps_avx(auVar124,auVar344);
    auVar203 = vshufps_avx(auVar221,auVar221,0);
    auVar162 = vshufps_avx(auVar221,auVar221,0x55);
    auVar150 = vshufps_avx(auVar186,auVar186,0);
    auVar189 = vshufps_avx(auVar186,auVar186,0x55);
    auVar151 = vshufps_avx(auVar303,auVar303,0);
    auVar298 = vshufps_avx(auVar303,auVar303,0x55);
    auVar8 = vshufps_avx(auVar247,auVar247,0);
    auVar9 = vshufps_avx(auVar247,auVar247,0x55);
    auVar109 = ZEXT416((uint)((auVar109._0_4_ - auVar411._0_4_) * 0.04761905));
    auVar109 = vshufps_avx(auVar109,auVar109,0);
    auVar361._0_4_ = auVar241._0_4_ + auVar120._0_4_ * 0.0;
    auVar361._4_4_ = auVar241._4_4_ + auVar120._4_4_ * 0.14285715;
    auVar361._8_4_ = auVar241._8_4_ + auVar120._8_4_ * 0.2857143;
    auVar361._12_4_ = auVar241._12_4_ + auVar120._12_4_ * 0.42857146;
    auVar361._16_4_ = auVar241._0_4_ + auVar120._16_4_ * 0.5714286;
    auVar361._20_4_ = auVar241._4_4_ + auVar120._20_4_ * 0.71428573;
    auVar361._24_4_ = auVar241._8_4_ + auVar120._24_4_ * 0.8571429;
    auVar361._28_4_ = auVar241._12_4_ + auVar120._28_4_;
    auVar28 = vsubps_avx(auVar406,auVar361);
    fVar173 = auVar150._0_4_;
    fVar211 = auVar150._4_4_;
    fVar231 = auVar150._8_4_;
    fVar210 = auVar150._12_4_;
    fVar335 = auVar28._0_4_;
    fVar346 = auVar28._4_4_;
    fVar347 = auVar28._8_4_;
    fVar348 = auVar28._12_4_;
    fVar349 = auVar28._16_4_;
    fVar350 = auVar28._20_4_;
    fVar351 = auVar28._24_4_;
    fVar331 = auVar189._0_4_;
    fVar332 = auVar189._4_4_;
    fVar333 = auVar189._8_4_;
    fVar334 = auVar189._12_4_;
    fVar399 = auVar162._12_4_ + 1.0;
    fVar287 = auVar151._0_4_;
    fVar312 = auVar151._4_4_;
    fVar313 = auVar151._8_4_;
    fVar330 = auVar151._12_4_;
    fVar262 = fVar287 * auVar361._0_4_ + fVar335 * fVar173;
    fVar132 = fVar312 * auVar361._4_4_ + fVar346 * fVar211;
    fVar133 = fVar313 * auVar361._8_4_ + fVar347 * fVar231;
    fVar134 = fVar330 * auVar361._12_4_ + fVar348 * fVar210;
    fVar135 = fVar287 * auVar361._16_4_ + fVar349 * fVar173;
    fVar136 = fVar312 * auVar361._20_4_ + fVar350 * fVar211;
    fVar137 = fVar313 * auVar361._24_4_ + fVar351 * fVar231;
    fVar230 = auVar298._0_4_;
    fVar174 = auVar298._4_4_;
    fVar261 = auVar298._8_4_;
    fVar232 = auVar298._12_4_;
    fVar375 = fVar331 * fVar335 + auVar361._0_4_ * fVar230;
    fVar386 = fVar332 * fVar346 + auVar361._4_4_ * fVar174;
    fVar387 = fVar333 * fVar347 + auVar361._8_4_ * fVar261;
    fVar388 = fVar334 * fVar348 + auVar361._12_4_ * fVar232;
    fVar389 = fVar331 * fVar349 + auVar361._16_4_ * fVar230;
    fVar390 = fVar332 * fVar350 + auVar361._20_4_ * fVar174;
    fVar391 = fVar333 * fVar351 + auVar361._24_4_ * fVar261;
    fVar392 = fVar334 + fVar210;
    auVar241 = vshufps_avx(auVar221,auVar221,0xaa);
    auVar150 = vshufps_avx(auVar221,auVar221,0xff);
    fVar236 = fVar330 + 0.0;
    auVar189 = vshufps_avx(auVar186,auVar186,0xaa);
    auVar151 = vshufps_avx(auVar186,auVar186,0xff);
    auVar259._0_4_ =
         fVar335 * (auVar361._0_4_ * fVar173 + fVar335 * auVar203._0_4_) + auVar361._0_4_ * fVar262;
    auVar259._4_4_ =
         fVar346 * (auVar361._4_4_ * fVar211 + fVar346 * auVar203._4_4_) + auVar361._4_4_ * fVar132;
    auVar259._8_4_ =
         fVar347 * (auVar361._8_4_ * fVar231 + fVar347 * auVar203._8_4_) + auVar361._8_4_ * fVar133;
    auVar259._12_4_ =
         fVar348 * (auVar361._12_4_ * fVar210 + fVar348 * auVar203._12_4_) +
         auVar361._12_4_ * fVar134;
    auVar259._16_4_ =
         fVar349 * (auVar361._16_4_ * fVar173 + fVar349 * auVar203._0_4_) +
         auVar361._16_4_ * fVar135;
    auVar259._20_4_ =
         fVar350 * (auVar361._20_4_ * fVar211 + fVar350 * auVar203._4_4_) +
         auVar361._20_4_ * fVar136;
    auVar259._24_4_ =
         fVar351 * (auVar361._24_4_ * fVar231 + fVar351 * auVar203._8_4_) +
         auVar361._24_4_ * fVar137;
    auVar259._28_4_ = auVar203._12_4_ + 1.0 + fVar232;
    auVar279._0_4_ =
         fVar335 * (fVar331 * auVar361._0_4_ + auVar162._0_4_ * fVar335) + auVar361._0_4_ * fVar375;
    auVar279._4_4_ =
         fVar346 * (fVar332 * auVar361._4_4_ + auVar162._4_4_ * fVar346) + auVar361._4_4_ * fVar386;
    auVar279._8_4_ =
         fVar347 * (fVar333 * auVar361._8_4_ + auVar162._8_4_ * fVar347) + auVar361._8_4_ * fVar387;
    auVar279._12_4_ =
         fVar348 * (fVar334 * auVar361._12_4_ + auVar162._12_4_ * fVar348) +
         auVar361._12_4_ * fVar388;
    auVar279._16_4_ =
         fVar349 * (fVar331 * auVar361._16_4_ + auVar162._0_4_ * fVar349) +
         auVar361._16_4_ * fVar389;
    auVar279._20_4_ =
         fVar350 * (fVar332 * auVar361._20_4_ + auVar162._4_4_ * fVar350) +
         auVar361._20_4_ * fVar390;
    auVar279._24_4_ =
         fVar351 * (fVar333 * auVar361._24_4_ + auVar162._8_4_ * fVar351) +
         auVar361._24_4_ * fVar391;
    auVar279._28_4_ = auVar9._12_4_ + fVar232;
    auVar125._0_4_ =
         fVar335 * fVar262 + auVar361._0_4_ * (fVar287 * fVar335 + auVar8._0_4_ * auVar361._0_4_);
    auVar125._4_4_ =
         fVar346 * fVar132 + auVar361._4_4_ * (fVar312 * fVar346 + auVar8._4_4_ * auVar361._4_4_);
    auVar125._8_4_ =
         fVar347 * fVar133 + auVar361._8_4_ * (fVar313 * fVar347 + auVar8._8_4_ * auVar361._8_4_);
    auVar125._12_4_ =
         fVar348 * fVar134 + auVar361._12_4_ * (fVar330 * fVar348 + auVar8._12_4_ * auVar361._12_4_)
    ;
    auVar125._16_4_ =
         fVar349 * fVar135 + auVar361._16_4_ * (fVar287 * fVar349 + auVar8._0_4_ * auVar361._16_4_);
    auVar125._20_4_ =
         fVar350 * fVar136 + auVar361._20_4_ * (fVar312 * fVar350 + auVar8._4_4_ * auVar361._20_4_);
    auVar125._24_4_ =
         fVar351 * fVar137 + auVar361._24_4_ * (fVar313 * fVar351 + auVar8._8_4_ * auVar361._24_4_);
    auVar125._28_4_ = fVar210 + 1.0 + fVar236;
    auVar373._0_4_ =
         fVar335 * fVar375 + auVar361._0_4_ * (auVar9._0_4_ * auVar361._0_4_ + fVar335 * fVar230);
    auVar373._4_4_ =
         fVar346 * fVar386 + auVar361._4_4_ * (auVar9._4_4_ * auVar361._4_4_ + fVar346 * fVar174);
    auVar373._8_4_ =
         fVar347 * fVar387 + auVar361._8_4_ * (auVar9._8_4_ * auVar361._8_4_ + fVar347 * fVar261);
    auVar373._12_4_ =
         fVar348 * fVar388 + auVar361._12_4_ * (auVar9._12_4_ * auVar361._12_4_ + fVar348 * fVar232)
    ;
    auVar373._16_4_ =
         fVar349 * fVar389 + auVar361._16_4_ * (auVar9._0_4_ * auVar361._16_4_ + fVar349 * fVar230);
    auVar373._20_4_ =
         fVar350 * fVar390 + auVar361._20_4_ * (auVar9._4_4_ * auVar361._20_4_ + fVar350 * fVar174);
    auVar373._24_4_ =
         fVar351 * fVar391 + auVar361._24_4_ * (auVar9._8_4_ * auVar361._24_4_ + fVar351 * fVar261);
    auVar373._28_4_ = fVar236 + fVar232 + 0.0;
    local_1e0._0_4_ = fVar335 * auVar259._0_4_ + auVar361._0_4_ * auVar125._0_4_;
    local_1e0._4_4_ = fVar346 * auVar259._4_4_ + auVar361._4_4_ * auVar125._4_4_;
    local_1e0._8_4_ = fVar347 * auVar259._8_4_ + auVar361._8_4_ * auVar125._8_4_;
    local_1e0._12_4_ = fVar348 * auVar259._12_4_ + auVar361._12_4_ * auVar125._12_4_;
    local_1e0._16_4_ = fVar349 * auVar259._16_4_ + auVar361._16_4_ * auVar125._16_4_;
    local_1e0._20_4_ = fVar350 * auVar259._20_4_ + auVar361._20_4_ * auVar125._20_4_;
    local_1e0._24_4_ = fVar351 * auVar259._24_4_ + auVar361._24_4_ * auVar125._24_4_;
    local_1e0._28_4_ = fVar392 + fVar232 + 0.0;
    auVar229._0_4_ = fVar335 * auVar279._0_4_ + auVar361._0_4_ * auVar373._0_4_;
    auVar229._4_4_ = fVar346 * auVar279._4_4_ + auVar361._4_4_ * auVar373._4_4_;
    auVar229._8_4_ = fVar347 * auVar279._8_4_ + auVar361._8_4_ * auVar373._8_4_;
    auVar229._12_4_ = fVar348 * auVar279._12_4_ + auVar361._12_4_ * auVar373._12_4_;
    auVar229._16_4_ = fVar349 * auVar279._16_4_ + auVar361._16_4_ * auVar373._16_4_;
    auVar229._20_4_ = fVar350 * auVar279._20_4_ + auVar361._20_4_ * auVar373._20_4_;
    auVar229._24_4_ = fVar351 * auVar279._24_4_ + auVar361._24_4_ * auVar373._24_4_;
    auVar229._28_4_ = fVar392 + fVar236;
    auVar29 = vsubps_avx(auVar125,auVar259);
    auVar120 = vsubps_avx(auVar373,auVar279);
    local_6c0 = auVar109._0_4_;
    fStack_6bc = auVar109._4_4_;
    fStack_6b8 = auVar109._8_4_;
    fStack_6b4 = auVar109._12_4_;
    local_220 = local_6c0 * auVar29._0_4_ * 3.0;
    fStack_21c = fStack_6bc * auVar29._4_4_ * 3.0;
    auVar37._4_4_ = fStack_21c;
    auVar37._0_4_ = local_220;
    fStack_218 = fStack_6b8 * auVar29._8_4_ * 3.0;
    auVar37._8_4_ = fStack_218;
    fStack_214 = fStack_6b4 * auVar29._12_4_ * 3.0;
    auVar37._12_4_ = fStack_214;
    fStack_210 = local_6c0 * auVar29._16_4_ * 3.0;
    auVar37._16_4_ = fStack_210;
    fStack_20c = fStack_6bc * auVar29._20_4_ * 3.0;
    auVar37._20_4_ = fStack_20c;
    fStack_208 = fStack_6b8 * auVar29._24_4_ * 3.0;
    auVar37._24_4_ = fStack_208;
    auVar37._28_4_ = auVar29._28_4_;
    local_240 = local_6c0 * auVar120._0_4_ * 3.0;
    fStack_23c = fStack_6bc * auVar120._4_4_ * 3.0;
    auVar38._4_4_ = fStack_23c;
    auVar38._0_4_ = local_240;
    fStack_238 = fStack_6b8 * auVar120._8_4_ * 3.0;
    auVar38._8_4_ = fStack_238;
    fStack_234 = fStack_6b4 * auVar120._12_4_ * 3.0;
    auVar38._12_4_ = fStack_234;
    fStack_230 = local_6c0 * auVar120._16_4_ * 3.0;
    auVar38._16_4_ = fStack_230;
    fStack_22c = fStack_6bc * auVar120._20_4_ * 3.0;
    auVar38._20_4_ = fStack_22c;
    fStack_228 = fStack_6b8 * auVar120._24_4_ * 3.0;
    auVar38._24_4_ = fStack_228;
    auVar38._28_4_ = fVar392;
    auVar26 = vsubps_avx(local_1e0,auVar37);
    auVar120 = vperm2f128_avx(auVar26,auVar26,1);
    auVar120 = vshufps_avx(auVar120,auVar26,0x30);
    auVar120 = vshufps_avx(auVar26,auVar120,0x29);
    auVar27 = vsubps_avx(auVar229,auVar38);
    auVar26 = vperm2f128_avx(auVar27,auVar27,1);
    auVar26 = vshufps_avx(auVar26,auVar27,0x30);
    auVar27 = vshufps_avx(auVar27,auVar26,0x29);
    fVar390 = auVar189._0_4_;
    fVar391 = auVar189._4_4_;
    fVar412 = auVar189._8_4_;
    fVar210 = auVar241._12_4_;
    fVar312 = auVar151._0_4_;
    fVar330 = auVar151._4_4_;
    fVar375 = auVar151._8_4_;
    fVar386 = auVar151._12_4_;
    auVar109 = vshufps_avx(auVar303,auVar303,0xaa);
    fVar173 = auVar109._0_4_;
    fVar211 = auVar109._4_4_;
    fVar231 = auVar109._8_4_;
    fVar232 = auVar109._12_4_;
    fVar133 = auVar361._0_4_ * fVar173 + fVar390 * fVar335;
    fVar134 = auVar361._4_4_ * fVar211 + fVar391 * fVar346;
    fVar135 = auVar361._8_4_ * fVar231 + fVar412 * fVar347;
    fVar136 = auVar361._12_4_ * fVar232 + auVar189._12_4_ * fVar348;
    fVar137 = auVar361._16_4_ * fVar173 + fVar390 * fVar349;
    fVar236 = auVar361._20_4_ * fVar211 + fVar391 * fVar350;
    fVar287 = auVar361._24_4_ * fVar231 + fVar412 * fVar351;
    auVar109 = vshufps_avx(auVar303,auVar303,0xff);
    fVar230 = auVar109._0_4_;
    fVar174 = auVar109._4_4_;
    fVar261 = auVar109._8_4_;
    fVar262 = auVar109._12_4_;
    fVar313 = auVar361._0_4_ * fVar230 + fVar312 * fVar335;
    fVar331 = auVar361._4_4_ * fVar174 + fVar330 * fVar346;
    fVar332 = auVar361._8_4_ * fVar261 + fVar375 * fVar347;
    fVar333 = auVar361._12_4_ * fVar262 + fVar386 * fVar348;
    fVar387 = auVar361._16_4_ * fVar230 + fVar312 * fVar349;
    fVar334 = auVar361._20_4_ * fVar174 + fVar330 * fVar350;
    fVar388 = auVar361._24_4_ * fVar261 + fVar375 * fVar351;
    auVar109 = vshufps_avx(auVar247,auVar247,0xaa);
    fVar389 = auVar109._12_4_ + fVar232;
    auVar203 = vshufps_avx(auVar247,auVar247,0xff);
    fVar132 = auVar203._12_4_;
    auVar126._0_4_ =
         fVar335 * (fVar390 * auVar361._0_4_ + fVar335 * auVar241._0_4_) + auVar361._0_4_ * fVar133;
    auVar126._4_4_ =
         fVar346 * (fVar391 * auVar361._4_4_ + fVar346 * auVar241._4_4_) + auVar361._4_4_ * fVar134;
    auVar126._8_4_ =
         fVar347 * (fVar412 * auVar361._8_4_ + fVar347 * auVar241._8_4_) + auVar361._8_4_ * fVar135;
    auVar126._12_4_ =
         fVar348 * (auVar189._12_4_ * auVar361._12_4_ + fVar348 * fVar210) +
         auVar361._12_4_ * fVar136;
    auVar126._16_4_ =
         fVar349 * (fVar390 * auVar361._16_4_ + fVar349 * auVar241._0_4_) +
         auVar361._16_4_ * fVar137;
    auVar126._20_4_ =
         fVar350 * (fVar391 * auVar361._20_4_ + fVar350 * auVar241._4_4_) +
         auVar361._20_4_ * fVar236;
    auVar126._24_4_ =
         fVar351 * (fVar412 * auVar361._24_4_ + fVar351 * auVar241._8_4_) +
         auVar361._24_4_ * fVar287;
    auVar126._28_4_ = auVar27._28_4_ + fVar210 + fVar132;
    auVar169._0_4_ =
         fVar335 * (fVar312 * auVar361._0_4_ + auVar150._0_4_ * fVar335) + auVar361._0_4_ * fVar313;
    auVar169._4_4_ =
         fVar346 * (fVar330 * auVar361._4_4_ + auVar150._4_4_ * fVar346) + auVar361._4_4_ * fVar331;
    auVar169._8_4_ =
         fVar347 * (fVar375 * auVar361._8_4_ + auVar150._8_4_ * fVar347) + auVar361._8_4_ * fVar332;
    auVar169._12_4_ =
         fVar348 * (fVar386 * auVar361._12_4_ + auVar150._12_4_ * fVar348) +
         auVar361._12_4_ * fVar333;
    auVar169._16_4_ =
         fVar349 * (fVar312 * auVar361._16_4_ + auVar150._0_4_ * fVar349) +
         auVar361._16_4_ * fVar387;
    auVar169._20_4_ =
         fVar350 * (fVar330 * auVar361._20_4_ + auVar150._4_4_ * fVar350) +
         auVar361._20_4_ * fVar334;
    auVar169._24_4_ =
         fVar351 * (fVar375 * auVar361._24_4_ + auVar150._8_4_ * fVar351) +
         auVar361._24_4_ * fVar388;
    auVar169._28_4_ = fVar210 + auVar26._28_4_ + fVar132;
    auVar26 = vperm2f128_avx(local_1e0,local_1e0,1);
    auVar26 = vshufps_avx(auVar26,local_1e0,0x30);
    auVar30 = vshufps_avx(local_1e0,auVar26,0x29);
    auVar280._0_4_ =
         auVar361._0_4_ * (auVar109._0_4_ * auVar361._0_4_ + fVar335 * fVar173) + fVar335 * fVar133;
    auVar280._4_4_ =
         auVar361._4_4_ * (auVar109._4_4_ * auVar361._4_4_ + fVar346 * fVar211) + fVar346 * fVar134;
    auVar280._8_4_ =
         auVar361._8_4_ * (auVar109._8_4_ * auVar361._8_4_ + fVar347 * fVar231) + fVar347 * fVar135;
    auVar280._12_4_ =
         auVar361._12_4_ * (auVar109._12_4_ * auVar361._12_4_ + fVar348 * fVar232) +
         fVar348 * fVar136;
    auVar280._16_4_ =
         auVar361._16_4_ * (auVar109._0_4_ * auVar361._16_4_ + fVar349 * fVar173) +
         fVar349 * fVar137;
    auVar280._20_4_ =
         auVar361._20_4_ * (auVar109._4_4_ * auVar361._20_4_ + fVar350 * fVar211) +
         fVar350 * fVar236;
    auVar280._24_4_ =
         auVar361._24_4_ * (auVar109._8_4_ * auVar361._24_4_ + fVar351 * fVar231) +
         fVar351 * fVar287;
    auVar280._28_4_ = fVar389 + fVar399 + auVar279._28_4_;
    auVar329._0_4_ =
         fVar335 * fVar313 + auVar361._0_4_ * (auVar361._0_4_ * auVar203._0_4_ + fVar335 * fVar230);
    auVar329._4_4_ =
         fVar346 * fVar331 + auVar361._4_4_ * (auVar361._4_4_ * auVar203._4_4_ + fVar346 * fVar174);
    auVar329._8_4_ =
         fVar347 * fVar332 + auVar361._8_4_ * (auVar361._8_4_ * auVar203._8_4_ + fVar347 * fVar261);
    auVar329._12_4_ =
         fVar348 * fVar333 + auVar361._12_4_ * (auVar361._12_4_ * fVar132 + fVar348 * fVar262);
    auVar329._16_4_ =
         fVar349 * fVar387 +
         auVar361._16_4_ * (auVar361._16_4_ * auVar203._0_4_ + fVar349 * fVar230);
    auVar329._20_4_ =
         fVar350 * fVar334 +
         auVar361._20_4_ * (auVar361._20_4_ * auVar203._4_4_ + fVar350 * fVar174);
    auVar329._24_4_ =
         fVar351 * fVar388 +
         auVar361._24_4_ * (auVar361._24_4_ * auVar203._8_4_ + fVar351 * fVar261);
    auVar329._28_4_ = fVar399 + fVar386 + fVar132 + fVar262;
    auVar311._0_4_ = fVar335 * auVar126._0_4_ + auVar361._0_4_ * auVar280._0_4_;
    auVar311._4_4_ = fVar346 * auVar126._4_4_ + auVar361._4_4_ * auVar280._4_4_;
    auVar311._8_4_ = fVar347 * auVar126._8_4_ + auVar361._8_4_ * auVar280._8_4_;
    auVar311._12_4_ = fVar348 * auVar126._12_4_ + auVar361._12_4_ * auVar280._12_4_;
    auVar311._16_4_ = fVar349 * auVar126._16_4_ + auVar361._16_4_ * auVar280._16_4_;
    auVar311._20_4_ = fVar350 * auVar126._20_4_ + auVar361._20_4_ * auVar280._20_4_;
    auVar311._24_4_ = fVar351 * auVar126._24_4_ + auVar361._24_4_ * auVar280._24_4_;
    auVar311._28_4_ = fVar389 + fVar132 + fVar262;
    auVar345._0_4_ = fVar335 * auVar169._0_4_ + auVar361._0_4_ * auVar329._0_4_;
    auVar345._4_4_ = fVar346 * auVar169._4_4_ + auVar361._4_4_ * auVar329._4_4_;
    auVar345._8_4_ = fVar347 * auVar169._8_4_ + auVar361._8_4_ * auVar329._8_4_;
    auVar345._12_4_ = fVar348 * auVar169._12_4_ + auVar361._12_4_ * auVar329._12_4_;
    auVar345._16_4_ = fVar349 * auVar169._16_4_ + auVar361._16_4_ * auVar329._16_4_;
    auVar345._20_4_ = fVar350 * auVar169._20_4_ + auVar361._20_4_ * auVar329._20_4_;
    auVar345._24_4_ = fVar351 * auVar169._24_4_ + auVar361._24_4_ * auVar329._24_4_;
    auVar345._28_4_ = auVar28._28_4_ + auVar361._28_4_;
    auVar33 = vsubps_avx(auVar280,auVar126);
    auVar26 = vsubps_avx(auVar329,auVar169);
    local_260 = local_6c0 * auVar33._0_4_ * 3.0;
    fStack_25c = fStack_6bc * auVar33._4_4_ * 3.0;
    auVar39._4_4_ = fStack_25c;
    auVar39._0_4_ = local_260;
    fStack_258 = fStack_6b8 * auVar33._8_4_ * 3.0;
    auVar39._8_4_ = fStack_258;
    fStack_254 = fStack_6b4 * auVar33._12_4_ * 3.0;
    auVar39._12_4_ = fStack_254;
    fStack_250 = local_6c0 * auVar33._16_4_ * 3.0;
    auVar39._16_4_ = fStack_250;
    fStack_24c = fStack_6bc * auVar33._20_4_ * 3.0;
    auVar39._20_4_ = fStack_24c;
    fStack_248 = fStack_6b8 * auVar33._24_4_ * 3.0;
    auVar39._24_4_ = fStack_248;
    auVar39._28_4_ = auVar33._28_4_;
    local_280 = local_6c0 * auVar26._0_4_ * 3.0;
    fStack_27c = fStack_6bc * auVar26._4_4_ * 3.0;
    auVar40._4_4_ = fStack_27c;
    auVar40._0_4_ = local_280;
    fStack_278 = fStack_6b8 * auVar26._8_4_ * 3.0;
    auVar40._8_4_ = fStack_278;
    fStack_274 = fStack_6b4 * auVar26._12_4_ * 3.0;
    auVar40._12_4_ = fStack_274;
    fStack_270 = local_6c0 * auVar26._16_4_ * 3.0;
    auVar40._16_4_ = fStack_270;
    fStack_26c = fStack_6bc * auVar26._20_4_ * 3.0;
    auVar40._20_4_ = fStack_26c;
    fStack_268 = fStack_6b8 * auVar26._24_4_ * 3.0;
    auVar40._24_4_ = fStack_268;
    auVar40._28_4_ = auVar280._28_4_;
    auVar26 = vperm2f128_avx(auVar311,auVar311,1);
    auVar26 = vshufps_avx(auVar26,auVar311,0x30);
    auVar31 = vshufps_avx(auVar311,auVar26,0x29);
    auVar28 = vsubps_avx(auVar311,auVar39);
    auVar26 = vperm2f128_avx(auVar28,auVar28,1);
    auVar26 = vshufps_avx(auVar26,auVar28,0x30);
    auVar26 = vshufps_avx(auVar28,auVar26,0x29);
    auVar32 = vsubps_avx(auVar345,auVar40);
    auVar28 = vperm2f128_avx(auVar32,auVar32,1);
    auVar28 = vshufps_avx(auVar28,auVar32,0x30);
    auVar32 = vshufps_avx(auVar32,auVar28,0x29);
    auVar35 = vsubps_avx(auVar311,local_1e0);
    auVar36 = vsubps_avx(auVar31,auVar30);
    fVar173 = auVar36._0_4_ + auVar35._0_4_;
    fVar230 = auVar36._4_4_ + auVar35._4_4_;
    fVar211 = auVar36._8_4_ + auVar35._8_4_;
    fVar174 = auVar36._12_4_ + auVar35._12_4_;
    fVar231 = auVar36._16_4_ + auVar35._16_4_;
    fVar261 = auVar36._20_4_ + auVar35._20_4_;
    fVar210 = auVar36._24_4_ + auVar35._24_4_;
    auVar28 = vperm2f128_avx(auVar229,auVar229,1);
    auVar28 = vshufps_avx(auVar28,auVar229,0x30);
    local_200 = vshufps_avx(auVar229,auVar28,0x29);
    auVar28 = vperm2f128_avx(auVar345,auVar345,1);
    auVar28 = vshufps_avx(auVar28,auVar345,0x30);
    local_1c0 = vshufps_avx(auVar345,auVar28,0x29);
    auVar28 = vsubps_avx(auVar345,auVar229);
    auVar121 = vsubps_avx(local_1c0,local_200);
    fVar232 = auVar121._0_4_ + auVar28._0_4_;
    fVar262 = auVar121._4_4_ + auVar28._4_4_;
    fVar132 = auVar121._8_4_ + auVar28._8_4_;
    fVar133 = auVar121._12_4_ + auVar28._12_4_;
    fVar134 = auVar121._16_4_ + auVar28._16_4_;
    fVar135 = auVar121._20_4_ + auVar28._20_4_;
    fVar136 = auVar121._24_4_ + auVar28._24_4_;
    auVar41._4_4_ = fVar230 * auVar229._4_4_;
    auVar41._0_4_ = fVar173 * auVar229._0_4_;
    auVar41._8_4_ = fVar211 * auVar229._8_4_;
    auVar41._12_4_ = fVar174 * auVar229._12_4_;
    auVar41._16_4_ = fVar231 * auVar229._16_4_;
    auVar41._20_4_ = fVar261 * auVar229._20_4_;
    auVar41._24_4_ = fVar210 * auVar229._24_4_;
    auVar41._28_4_ = auVar28._28_4_;
    auVar42._4_4_ = fVar262 * local_1e0._4_4_;
    auVar42._0_4_ = fVar232 * local_1e0._0_4_;
    auVar42._8_4_ = fVar132 * local_1e0._8_4_;
    auVar42._12_4_ = fVar133 * local_1e0._12_4_;
    auVar42._16_4_ = fVar134 * local_1e0._16_4_;
    auVar42._20_4_ = fVar135 * local_1e0._20_4_;
    auVar42._24_4_ = fVar136 * local_1e0._24_4_;
    auVar42._28_4_ = fVar389;
    auVar122 = vsubps_avx(auVar41,auVar42);
    local_220 = local_1e0._0_4_ + local_220;
    fStack_21c = local_1e0._4_4_ + fStack_21c;
    fStack_218 = local_1e0._8_4_ + fStack_218;
    fStack_214 = local_1e0._12_4_ + fStack_214;
    fStack_210 = local_1e0._16_4_ + fStack_210;
    fStack_20c = local_1e0._20_4_ + fStack_20c;
    fStack_208 = local_1e0._24_4_ + fStack_208;
    fStack_204 = local_1e0._28_4_ + auVar29._28_4_;
    local_240 = local_240 + auVar229._0_4_;
    fStack_23c = fStack_23c + auVar229._4_4_;
    fStack_238 = fStack_238 + auVar229._8_4_;
    fStack_234 = fStack_234 + auVar229._12_4_;
    fStack_230 = fStack_230 + auVar229._16_4_;
    fStack_22c = fStack_22c + auVar229._20_4_;
    fStack_228 = fStack_228 + auVar229._24_4_;
    fStack_224 = fVar392 + auVar229._28_4_;
    auVar43._4_4_ = fVar230 * fStack_23c;
    auVar43._0_4_ = fVar173 * local_240;
    auVar43._8_4_ = fVar211 * fStack_238;
    auVar43._12_4_ = fVar174 * fStack_234;
    auVar43._16_4_ = fVar231 * fStack_230;
    auVar43._20_4_ = fVar261 * fStack_22c;
    auVar43._24_4_ = fVar210 * fStack_228;
    auVar43._28_4_ = fVar392;
    auVar44._4_4_ = fVar262 * fStack_21c;
    auVar44._0_4_ = fVar232 * local_220;
    auVar44._8_4_ = fVar132 * fStack_218;
    auVar44._12_4_ = fVar133 * fStack_214;
    auVar44._16_4_ = fVar134 * fStack_210;
    auVar44._20_4_ = fVar135 * fStack_20c;
    auVar44._24_4_ = fVar136 * fStack_208;
    auVar44._28_4_ = fVar392 + auVar229._28_4_;
    auVar29 = vsubps_avx(auVar43,auVar44);
    local_680 = auVar27._0_4_;
    fStack_67c = auVar27._4_4_;
    fStack_678 = auVar27._8_4_;
    fStack_674 = auVar27._12_4_;
    fStack_670 = auVar27._16_4_;
    fStack_66c = auVar27._20_4_;
    fStack_668 = auVar27._24_4_;
    auVar45._4_4_ = fVar230 * fStack_67c;
    auVar45._0_4_ = fVar173 * local_680;
    auVar45._8_4_ = fVar211 * fStack_678;
    auVar45._12_4_ = fVar174 * fStack_674;
    auVar45._16_4_ = fVar231 * fStack_670;
    auVar45._20_4_ = fVar261 * fStack_66c;
    auVar45._24_4_ = fVar210 * fStack_668;
    auVar45._28_4_ = fVar392;
    local_6e0 = auVar120._0_4_;
    fStack_6dc = auVar120._4_4_;
    fStack_6d8 = auVar120._8_4_;
    fStack_6d4 = auVar120._12_4_;
    fStack_6d0 = auVar120._16_4_;
    fStack_6cc = auVar120._20_4_;
    fStack_6c8 = auVar120._24_4_;
    auVar46._4_4_ = fVar262 * fStack_6dc;
    auVar46._0_4_ = fVar232 * local_6e0;
    auVar46._8_4_ = fVar132 * fStack_6d8;
    auVar46._12_4_ = fVar133 * fStack_6d4;
    auVar46._16_4_ = fVar134 * fStack_6d0;
    auVar46._20_4_ = fVar135 * fStack_6cc;
    auVar46._24_4_ = fVar136 * fStack_6c8;
    auVar46._28_4_ = local_1e0._28_4_;
    auVar166 = vsubps_avx(auVar45,auVar46);
    auVar47._4_4_ = local_200._4_4_ * fVar230;
    auVar47._0_4_ = local_200._0_4_ * fVar173;
    auVar47._8_4_ = local_200._8_4_ * fVar211;
    auVar47._12_4_ = local_200._12_4_ * fVar174;
    auVar47._16_4_ = local_200._16_4_ * fVar231;
    auVar47._20_4_ = local_200._20_4_ * fVar261;
    auVar47._24_4_ = local_200._24_4_ * fVar210;
    auVar47._28_4_ = fVar392;
    auVar48._4_4_ = auVar30._4_4_ * fVar262;
    auVar48._0_4_ = auVar30._0_4_ * fVar232;
    auVar48._8_4_ = auVar30._8_4_ * fVar132;
    auVar48._12_4_ = auVar30._12_4_ * fVar133;
    auVar48._16_4_ = auVar30._16_4_ * fVar134;
    auVar48._20_4_ = auVar30._20_4_ * fVar135;
    auVar48._24_4_ = auVar30._24_4_ * fVar136;
    auVar48._28_4_ = local_200._28_4_;
    local_6c0 = auVar26._0_4_;
    fStack_6bc = auVar26._4_4_;
    fStack_6b8 = auVar26._8_4_;
    fStack_6b4 = auVar26._12_4_;
    fStack_6b0 = auVar26._16_4_;
    fStack_6ac = auVar26._20_4_;
    fStack_6a8 = auVar26._24_4_;
    auVar167 = vsubps_avx(auVar47,auVar48);
    auVar49._4_4_ = auVar345._4_4_ * fVar230;
    auVar49._0_4_ = auVar345._0_4_ * fVar173;
    auVar49._8_4_ = auVar345._8_4_ * fVar211;
    auVar49._12_4_ = auVar345._12_4_ * fVar174;
    auVar49._16_4_ = auVar345._16_4_ * fVar231;
    auVar49._20_4_ = auVar345._20_4_ * fVar261;
    auVar49._24_4_ = auVar345._24_4_ * fVar210;
    auVar49._28_4_ = fVar392;
    auVar50._4_4_ = fVar262 * auVar311._4_4_;
    auVar50._0_4_ = fVar232 * auVar311._0_4_;
    auVar50._8_4_ = fVar132 * auVar311._8_4_;
    auVar50._12_4_ = fVar133 * auVar311._12_4_;
    auVar50._16_4_ = fVar134 * auVar311._16_4_;
    auVar50._20_4_ = fVar135 * auVar311._20_4_;
    auVar50._24_4_ = fVar136 * auVar311._24_4_;
    auVar50._28_4_ = fStack_204;
    auVar168 = vsubps_avx(auVar49,auVar50);
    local_260 = auVar311._0_4_ + local_260;
    fStack_25c = auVar311._4_4_ + fStack_25c;
    fStack_258 = auVar311._8_4_ + fStack_258;
    fStack_254 = auVar311._12_4_ + fStack_254;
    fStack_250 = auVar311._16_4_ + fStack_250;
    fStack_24c = auVar311._20_4_ + fStack_24c;
    fStack_248 = auVar311._24_4_ + fStack_248;
    fStack_244 = auVar311._28_4_ + auVar33._28_4_;
    local_280 = auVar345._0_4_ + local_280;
    fStack_27c = auVar345._4_4_ + fStack_27c;
    fStack_278 = auVar345._8_4_ + fStack_278;
    fStack_274 = auVar345._12_4_ + fStack_274;
    fStack_270 = auVar345._16_4_ + fStack_270;
    fStack_26c = auVar345._20_4_ + fStack_26c;
    fStack_268 = auVar345._24_4_ + fStack_268;
    fStack_264 = auVar345._28_4_ + auVar280._28_4_;
    auVar51._4_4_ = fVar230 * fStack_27c;
    auVar51._0_4_ = fVar173 * local_280;
    auVar51._8_4_ = fVar211 * fStack_278;
    auVar51._12_4_ = fVar174 * fStack_274;
    auVar51._16_4_ = fVar231 * fStack_270;
    auVar51._20_4_ = fVar261 * fStack_26c;
    auVar51._24_4_ = fVar210 * fStack_268;
    auVar51._28_4_ = auVar345._28_4_ + auVar280._28_4_;
    auVar52._4_4_ = fStack_25c * fVar262;
    auVar52._0_4_ = local_260 * fVar232;
    auVar52._8_4_ = fStack_258 * fVar132;
    auVar52._12_4_ = fStack_254 * fVar133;
    auVar52._16_4_ = fStack_250 * fVar134;
    auVar52._20_4_ = fStack_24c * fVar135;
    auVar52._24_4_ = fStack_248 * fVar136;
    auVar52._28_4_ = fStack_244;
    auVar33 = vsubps_avx(auVar51,auVar52);
    auVar53._4_4_ = fVar230 * auVar32._4_4_;
    auVar53._0_4_ = fVar173 * auVar32._0_4_;
    auVar53._8_4_ = fVar211 * auVar32._8_4_;
    auVar53._12_4_ = fVar174 * auVar32._12_4_;
    auVar53._16_4_ = fVar231 * auVar32._16_4_;
    auVar53._20_4_ = fVar261 * auVar32._20_4_;
    auVar53._24_4_ = fVar210 * auVar32._24_4_;
    auVar53._28_4_ = fStack_244;
    auVar54._4_4_ = fVar262 * fStack_6bc;
    auVar54._0_4_ = fVar232 * local_6c0;
    auVar54._8_4_ = fVar132 * fStack_6b8;
    auVar54._12_4_ = fVar133 * fStack_6b4;
    auVar54._16_4_ = fVar134 * fStack_6b0;
    auVar54._20_4_ = fVar135 * fStack_6ac;
    auVar54._24_4_ = fVar136 * fStack_6a8;
    auVar54._28_4_ = auVar32._28_4_;
    auVar204 = vsubps_avx(auVar53,auVar54);
    auVar55._4_4_ = fVar230 * local_1c0._4_4_;
    auVar55._0_4_ = fVar173 * local_1c0._0_4_;
    auVar55._8_4_ = fVar211 * local_1c0._8_4_;
    auVar55._12_4_ = fVar174 * local_1c0._12_4_;
    auVar55._16_4_ = fVar231 * local_1c0._16_4_;
    auVar55._20_4_ = fVar261 * local_1c0._20_4_;
    auVar55._24_4_ = fVar210 * local_1c0._24_4_;
    auVar55._28_4_ = auVar36._28_4_ + auVar35._28_4_;
    auVar56._4_4_ = auVar31._4_4_ * fVar262;
    auVar56._0_4_ = auVar31._0_4_ * fVar232;
    auVar56._8_4_ = auVar31._8_4_ * fVar132;
    auVar56._12_4_ = auVar31._12_4_ * fVar133;
    auVar56._16_4_ = auVar31._16_4_ * fVar134;
    auVar56._20_4_ = auVar31._20_4_ * fVar135;
    auVar56._24_4_ = auVar31._24_4_ * fVar136;
    auVar56._28_4_ = auVar121._28_4_ + auVar28._28_4_;
    auVar35 = vsubps_avx(auVar55,auVar56);
    auVar26 = vminps_avx(auVar122,auVar29);
    auVar120 = vmaxps_avx(auVar122,auVar29);
    auVar27 = vminps_avx(auVar166,auVar167);
    auVar27 = vminps_avx(auVar26,auVar27);
    auVar26 = vmaxps_avx(auVar166,auVar167);
    auVar120 = vmaxps_avx(auVar120,auVar26);
    auVar28 = vminps_avx(auVar168,auVar33);
    auVar26 = vmaxps_avx(auVar168,auVar33);
    auVar29 = vminps_avx(auVar204,auVar35);
    auVar29 = vminps_avx(auVar28,auVar29);
    auVar29 = vminps_avx(auVar27,auVar29);
    auVar27 = vmaxps_avx(auVar204,auVar35);
    auVar26 = vmaxps_avx(auVar26,auVar27);
    auVar26 = vmaxps_avx(auVar120,auVar26);
    auVar120 = vcmpps_avx(auVar29,local_340,2);
    auVar26 = vcmpps_avx(auVar26,local_360,5);
    auVar120 = vandps_avx(auVar26,auVar120);
    auVar26 = local_2a0 & auVar120;
    if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar26 >> 0x7f,0) != '\0') ||
          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar26 >> 0xbf,0) != '\0') ||
        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar26[0x1f] < '\0')
    {
      auVar26 = vsubps_avx(auVar30,local_1e0);
      auVar27 = vsubps_avx(auVar31,auVar311);
      fVar230 = auVar26._0_4_ + auVar27._0_4_;
      fVar211 = auVar26._4_4_ + auVar27._4_4_;
      fVar174 = auVar26._8_4_ + auVar27._8_4_;
      fVar231 = auVar26._12_4_ + auVar27._12_4_;
      fVar261 = auVar26._16_4_ + auVar27._16_4_;
      fVar210 = auVar26._20_4_ + auVar27._20_4_;
      fVar232 = auVar26._24_4_ + auVar27._24_4_;
      auVar29 = vsubps_avx(local_200,auVar229);
      auVar33 = vsubps_avx(local_1c0,auVar345);
      fVar262 = auVar29._0_4_ + auVar33._0_4_;
      fVar132 = auVar29._4_4_ + auVar33._4_4_;
      fVar133 = auVar29._8_4_ + auVar33._8_4_;
      fVar134 = auVar29._12_4_ + auVar33._12_4_;
      fVar135 = auVar29._16_4_ + auVar33._16_4_;
      fVar136 = auVar29._20_4_ + auVar33._20_4_;
      fVar137 = auVar29._24_4_ + auVar33._24_4_;
      fVar173 = auVar33._28_4_;
      auVar57._4_4_ = auVar229._4_4_ * fVar211;
      auVar57._0_4_ = auVar229._0_4_ * fVar230;
      auVar57._8_4_ = auVar229._8_4_ * fVar174;
      auVar57._12_4_ = auVar229._12_4_ * fVar231;
      auVar57._16_4_ = auVar229._16_4_ * fVar261;
      auVar57._20_4_ = auVar229._20_4_ * fVar210;
      auVar57._24_4_ = auVar229._24_4_ * fVar232;
      auVar57._28_4_ = auVar229._28_4_;
      auVar58._4_4_ = local_1e0._4_4_ * fVar132;
      auVar58._0_4_ = local_1e0._0_4_ * fVar262;
      auVar58._8_4_ = local_1e0._8_4_ * fVar133;
      auVar58._12_4_ = local_1e0._12_4_ * fVar134;
      auVar58._16_4_ = local_1e0._16_4_ * fVar135;
      auVar58._20_4_ = local_1e0._20_4_ * fVar136;
      auVar58._24_4_ = local_1e0._24_4_ * fVar137;
      auVar58._28_4_ = local_1e0._28_4_;
      auVar33 = vsubps_avx(auVar57,auVar58);
      auVar59._4_4_ = fVar211 * fStack_23c;
      auVar59._0_4_ = fVar230 * local_240;
      auVar59._8_4_ = fVar174 * fStack_238;
      auVar59._12_4_ = fVar231 * fStack_234;
      auVar59._16_4_ = fVar261 * fStack_230;
      auVar59._20_4_ = fVar210 * fStack_22c;
      auVar59._24_4_ = fVar232 * fStack_228;
      auVar59._28_4_ = auVar229._28_4_;
      auVar60._4_4_ = fVar132 * fStack_21c;
      auVar60._0_4_ = fVar262 * local_220;
      auVar60._8_4_ = fVar133 * fStack_218;
      auVar60._12_4_ = fVar134 * fStack_214;
      auVar60._16_4_ = fVar135 * fStack_210;
      auVar60._20_4_ = fVar136 * fStack_20c;
      auVar60._24_4_ = fVar137 * fStack_208;
      auVar60._28_4_ = fVar173;
      auVar35 = vsubps_avx(auVar59,auVar60);
      auVar61._4_4_ = fVar211 * fStack_67c;
      auVar61._0_4_ = fVar230 * local_680;
      auVar61._8_4_ = fVar174 * fStack_678;
      auVar61._12_4_ = fVar231 * fStack_674;
      auVar61._16_4_ = fVar261 * fStack_670;
      auVar61._20_4_ = fVar210 * fStack_66c;
      auVar61._24_4_ = fVar232 * fStack_668;
      auVar61._28_4_ = fVar173;
      auVar62._4_4_ = fVar132 * fStack_6dc;
      auVar62._0_4_ = fVar262 * local_6e0;
      auVar62._8_4_ = fVar133 * fStack_6d8;
      auVar62._12_4_ = fVar134 * fStack_6d4;
      auVar62._16_4_ = fVar135 * fStack_6d0;
      auVar62._20_4_ = fVar136 * fStack_6cc;
      auVar62._24_4_ = fVar137 * fStack_6c8;
      auVar62._28_4_ = auVar28._28_4_;
      auVar36 = vsubps_avx(auVar61,auVar62);
      auVar63._4_4_ = local_200._4_4_ * fVar211;
      auVar63._0_4_ = local_200._0_4_ * fVar230;
      auVar63._8_4_ = local_200._8_4_ * fVar174;
      auVar63._12_4_ = local_200._12_4_ * fVar231;
      auVar63._16_4_ = local_200._16_4_ * fVar261;
      auVar63._20_4_ = local_200._20_4_ * fVar210;
      auVar63._24_4_ = local_200._24_4_ * fVar232;
      auVar63._28_4_ = auVar28._28_4_;
      auVar64._4_4_ = auVar30._4_4_ * fVar132;
      auVar64._0_4_ = auVar30._0_4_ * fVar262;
      auVar64._8_4_ = auVar30._8_4_ * fVar133;
      auVar64._12_4_ = auVar30._12_4_ * fVar134;
      auVar64._16_4_ = auVar30._16_4_ * fVar135;
      auVar64._20_4_ = auVar30._20_4_ * fVar136;
      uVar4 = auVar30._28_4_;
      auVar64._24_4_ = auVar30._24_4_ * fVar137;
      auVar64._28_4_ = uVar4;
      auVar30 = vsubps_avx(auVar63,auVar64);
      auVar65._4_4_ = auVar345._4_4_ * fVar211;
      auVar65._0_4_ = auVar345._0_4_ * fVar230;
      auVar65._8_4_ = auVar345._8_4_ * fVar174;
      auVar65._12_4_ = auVar345._12_4_ * fVar231;
      auVar65._16_4_ = auVar345._16_4_ * fVar261;
      auVar65._20_4_ = auVar345._20_4_ * fVar210;
      auVar65._24_4_ = auVar345._24_4_ * fVar232;
      auVar65._28_4_ = uVar4;
      auVar66._4_4_ = auVar311._4_4_ * fVar132;
      auVar66._0_4_ = auVar311._0_4_ * fVar262;
      auVar66._8_4_ = auVar311._8_4_ * fVar133;
      auVar66._12_4_ = auVar311._12_4_ * fVar134;
      auVar66._16_4_ = auVar311._16_4_ * fVar135;
      auVar66._20_4_ = auVar311._20_4_ * fVar136;
      auVar66._24_4_ = auVar311._24_4_ * fVar137;
      auVar66._28_4_ = auVar311._28_4_;
      auVar121 = vsubps_avx(auVar65,auVar66);
      auVar67._4_4_ = fVar211 * fStack_27c;
      auVar67._0_4_ = fVar230 * local_280;
      auVar67._8_4_ = fVar174 * fStack_278;
      auVar67._12_4_ = fVar231 * fStack_274;
      auVar67._16_4_ = fVar261 * fStack_270;
      auVar67._20_4_ = fVar210 * fStack_26c;
      auVar67._24_4_ = fVar232 * fStack_268;
      auVar67._28_4_ = uVar4;
      auVar68._4_4_ = fVar132 * fStack_25c;
      auVar68._0_4_ = fVar262 * local_260;
      auVar68._8_4_ = fVar133 * fStack_258;
      auVar68._12_4_ = fVar134 * fStack_254;
      auVar68._16_4_ = fVar135 * fStack_250;
      auVar68._20_4_ = fVar136 * fStack_24c;
      auVar68._24_4_ = fVar137 * fStack_248;
      auVar68._28_4_ = auVar345._28_4_;
      auVar122 = vsubps_avx(auVar67,auVar68);
      auVar69._4_4_ = fVar211 * auVar32._4_4_;
      auVar69._0_4_ = fVar230 * auVar32._0_4_;
      auVar69._8_4_ = fVar174 * auVar32._8_4_;
      auVar69._12_4_ = fVar231 * auVar32._12_4_;
      auVar69._16_4_ = fVar261 * auVar32._16_4_;
      auVar69._20_4_ = fVar210 * auVar32._20_4_;
      auVar69._24_4_ = fVar232 * auVar32._24_4_;
      auVar69._28_4_ = auVar345._28_4_;
      auVar70._4_4_ = fStack_6bc * fVar132;
      auVar70._0_4_ = local_6c0 * fVar262;
      auVar70._8_4_ = fStack_6b8 * fVar133;
      auVar70._12_4_ = fStack_6b4 * fVar134;
      auVar70._16_4_ = fStack_6b0 * fVar135;
      auVar70._20_4_ = fStack_6ac * fVar136;
      auVar70._24_4_ = fStack_6a8 * fVar137;
      auVar70._28_4_ = local_200._28_4_;
      auVar32 = vsubps_avx(auVar69,auVar70);
      auVar71._4_4_ = local_1c0._4_4_ * fVar211;
      auVar71._0_4_ = local_1c0._0_4_ * fVar230;
      auVar71._8_4_ = local_1c0._8_4_ * fVar174;
      auVar71._12_4_ = local_1c0._12_4_ * fVar231;
      auVar71._16_4_ = local_1c0._16_4_ * fVar261;
      auVar71._20_4_ = local_1c0._20_4_ * fVar210;
      auVar71._24_4_ = local_1c0._24_4_ * fVar232;
      auVar71._28_4_ = auVar26._28_4_ + auVar27._28_4_;
      auVar72._4_4_ = auVar31._4_4_ * fVar132;
      auVar72._0_4_ = auVar31._0_4_ * fVar262;
      auVar72._8_4_ = auVar31._8_4_ * fVar133;
      auVar72._12_4_ = auVar31._12_4_ * fVar134;
      auVar72._16_4_ = auVar31._16_4_ * fVar135;
      auVar72._20_4_ = auVar31._20_4_ * fVar136;
      auVar72._24_4_ = auVar31._24_4_ * fVar137;
      auVar72._28_4_ = auVar29._28_4_ + fVar173;
      auVar31 = vsubps_avx(auVar71,auVar72);
      auVar27 = vminps_avx(auVar33,auVar35);
      auVar26 = vmaxps_avx(auVar33,auVar35);
      auVar28 = vminps_avx(auVar36,auVar30);
      auVar28 = vminps_avx(auVar27,auVar28);
      auVar27 = vmaxps_avx(auVar36,auVar30);
      auVar26 = vmaxps_avx(auVar26,auVar27);
      auVar29 = vminps_avx(auVar121,auVar122);
      auVar27 = vmaxps_avx(auVar121,auVar122);
      auVar30 = vminps_avx(auVar32,auVar31);
      auVar29 = vminps_avx(auVar29,auVar30);
      auVar29 = vminps_avx(auVar28,auVar29);
      auVar28 = vmaxps_avx(auVar32,auVar31);
      auVar27 = vmaxps_avx(auVar27,auVar28);
      auVar27 = vmaxps_avx(auVar26,auVar27);
      auVar26 = vcmpps_avx(auVar29,local_340,2);
      auVar27 = vcmpps_avx(auVar27,local_360,5);
      auVar26 = vandps_avx(auVar27,auVar26);
      auVar120 = vandps_avx(local_2a0,auVar120);
      auVar27 = auVar120 & auVar26;
      if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar27 >> 0x7f,0) != '\0') ||
            (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar27 >> 0xbf,0) != '\0') ||
          (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar27[0x1f] < '\0') {
        auVar120 = vandps_avx(auVar26,auVar120);
        uVar88 = vmovmskps_avx(auVar120);
        if (uVar88 != 0) {
          uVar85 = (ulong)uVar87;
          auStack_480[uVar85] = uVar88 & 0xff;
          uVar5 = vmovlps_avx(auVar408);
          *(undefined8 *)(afStack_320 + uVar85 * 2) = uVar5;
          uVar84 = vmovlps_avx(auVar245);
          auStack_1a0[uVar85] = uVar84;
          uVar87 = uVar87 + 1;
        }
      }
    }
    if (uVar87 != 0) {
      do {
        uVar85 = (ulong)(uVar87 - 1);
        uVar88 = auStack_480[uVar85];
        fVar173 = afStack_320[uVar85 * 2];
        fVar230 = afStack_320[uVar85 * 2 + 1];
        auVar363._8_8_ = 0;
        auVar363._0_8_ = auStack_1a0[uVar85];
        auVar374 = ZEXT1664(auVar363);
        uVar84 = 0;
        if (uVar88 != 0) {
          for (; (uVar88 >> uVar84 & 1) == 0; uVar84 = uVar84 + 1) {
          }
        }
        uVar88 = uVar88 - 1 & uVar88;
        auStack_480[uVar85] = uVar88;
        if (uVar88 == 0) {
          uVar87 = uVar87 - 1;
        }
        fVar174 = (float)(uVar84 + 1) * 0.14285715;
        fVar211 = (1.0 - (float)uVar84 * 0.14285715) * fVar173 +
                  fVar230 * (float)uVar84 * 0.14285715;
        fVar173 = (1.0 - fVar174) * fVar173 + fVar230 * fVar174;
        fVar230 = fVar173 - fVar211;
        if (0.16666667 <= fVar230) {
          auVar109 = vinsertps_avx(ZEXT416((uint)fVar211),ZEXT416((uint)fVar173),0x10);
          auVar411 = ZEXT1664(auVar109);
          goto LAB_01167e96;
        }
        auVar109 = vshufps_avx(auVar363,auVar363,0x50);
        auVar148._8_4_ = 0x3f800000;
        auVar148._0_8_ = 0x3f8000003f800000;
        auVar148._12_4_ = 0x3f800000;
        auVar241 = vsubps_avx(auVar148,auVar109);
        fVar174 = auVar109._0_4_;
        fVar231 = auVar109._4_4_;
        fVar261 = auVar109._8_4_;
        fVar210 = auVar109._12_4_;
        fVar232 = auVar241._0_4_;
        fVar262 = auVar241._4_4_;
        fVar132 = auVar241._8_4_;
        fVar133 = auVar241._12_4_;
        auVar187._0_4_ = fVar174 * auVar322._0_4_ + fVar232 * auVar400._0_4_;
        auVar187._4_4_ = fVar231 * auVar322._4_4_ + fVar262 * auVar400._4_4_;
        auVar187._8_4_ = fVar261 * auVar322._0_4_ + fVar132 * auVar400._0_4_;
        auVar187._12_4_ = fVar210 * auVar322._4_4_ + fVar133 * auVar400._4_4_;
        auVar248._0_4_ = fVar174 * auVar336._0_4_ + fVar232 * fVar234;
        auVar248._4_4_ = fVar231 * auVar336._4_4_ + fVar262 * fVar266;
        auVar248._8_4_ = fVar261 * auVar336._0_4_ + fVar132 * fVar234;
        auVar248._12_4_ = fVar210 * auVar336._4_4_ + fVar133 * fVar266;
        auVar272._0_4_ = fVar174 * auVar353._0_4_ + auVar395._0_4_ * fVar232;
        auVar272._4_4_ = fVar231 * auVar353._4_4_ + auVar395._4_4_ * fVar262;
        auVar272._8_4_ = fVar261 * auVar353._0_4_ + auVar395._0_4_ * fVar132;
        auVar272._12_4_ = fVar210 * auVar353._4_4_ + auVar395._4_4_ * fVar133;
        auVar106._0_4_ = auVar104._0_4_ * fVar174 + auVar147._0_4_ * fVar232;
        auVar106._4_4_ = auVar104._4_4_ * fVar231 + auVar147._4_4_ * fVar262;
        auVar106._8_4_ = auVar104._0_4_ * fVar261 + auVar147._0_4_ * fVar132;
        auVar106._12_4_ = auVar104._4_4_ * fVar210 + auVar147._4_4_ * fVar133;
        auVar170._16_16_ = auVar187;
        auVar170._0_16_ = auVar187;
        auVar207._16_16_ = auVar248;
        auVar207._0_16_ = auVar248;
        auVar260._16_16_ = auVar272;
        auVar260._0_16_ = auVar272;
        auVar120 = ZEXT2032(CONCAT416(fVar173,ZEXT416((uint)fVar211)));
        auVar120 = vshufps_avx(auVar120,auVar120,0);
        auVar26 = vsubps_avx(auVar207,auVar170);
        fVar174 = auVar120._0_4_;
        fVar231 = auVar120._4_4_;
        fVar261 = auVar120._8_4_;
        fVar210 = auVar120._12_4_;
        fVar232 = auVar120._16_4_;
        fVar262 = auVar120._20_4_;
        fVar132 = auVar120._24_4_;
        auVar171._0_4_ = auVar187._0_4_ + auVar26._0_4_ * fVar174;
        auVar171._4_4_ = auVar187._4_4_ + auVar26._4_4_ * fVar231;
        auVar171._8_4_ = auVar187._8_4_ + auVar26._8_4_ * fVar261;
        auVar171._12_4_ = auVar187._12_4_ + auVar26._12_4_ * fVar210;
        auVar171._16_4_ = auVar187._0_4_ + auVar26._16_4_ * fVar232;
        auVar171._20_4_ = auVar187._4_4_ + auVar26._20_4_ * fVar262;
        auVar171._24_4_ = auVar187._8_4_ + auVar26._24_4_ * fVar132;
        auVar171._28_4_ = auVar187._12_4_ + auVar26._28_4_;
        auVar120 = vsubps_avx(auVar260,auVar207);
        auVar208._0_4_ = auVar248._0_4_ + auVar120._0_4_ * fVar174;
        auVar208._4_4_ = auVar248._4_4_ + auVar120._4_4_ * fVar231;
        auVar208._8_4_ = auVar248._8_4_ + auVar120._8_4_ * fVar261;
        auVar208._12_4_ = auVar248._12_4_ + auVar120._12_4_ * fVar210;
        auVar208._16_4_ = auVar248._0_4_ + auVar120._16_4_ * fVar232;
        auVar208._20_4_ = auVar248._4_4_ + auVar120._20_4_ * fVar262;
        auVar208._24_4_ = auVar248._8_4_ + auVar120._24_4_ * fVar132;
        auVar208._28_4_ = auVar248._12_4_ + auVar120._28_4_;
        auVar109 = vsubps_avx(auVar106,auVar272);
        auVar127._0_4_ = auVar272._0_4_ + auVar109._0_4_ * fVar174;
        auVar127._4_4_ = auVar272._4_4_ + auVar109._4_4_ * fVar231;
        auVar127._8_4_ = auVar272._8_4_ + auVar109._8_4_ * fVar261;
        auVar127._12_4_ = auVar272._12_4_ + auVar109._12_4_ * fVar210;
        auVar127._16_4_ = auVar272._0_4_ + auVar109._0_4_ * fVar232;
        auVar127._20_4_ = auVar272._4_4_ + auVar109._4_4_ * fVar262;
        auVar127._24_4_ = auVar272._8_4_ + auVar109._8_4_ * fVar132;
        auVar127._28_4_ = auVar272._12_4_ + auVar109._12_4_;
        auVar120 = vsubps_avx(auVar208,auVar171);
        auVar172._0_4_ = auVar171._0_4_ + fVar174 * auVar120._0_4_;
        auVar172._4_4_ = auVar171._4_4_ + fVar231 * auVar120._4_4_;
        auVar172._8_4_ = auVar171._8_4_ + fVar261 * auVar120._8_4_;
        auVar172._12_4_ = auVar171._12_4_ + fVar210 * auVar120._12_4_;
        auVar172._16_4_ = auVar171._16_4_ + fVar232 * auVar120._16_4_;
        auVar172._20_4_ = auVar171._20_4_ + fVar262 * auVar120._20_4_;
        auVar172._24_4_ = auVar171._24_4_ + fVar132 * auVar120._24_4_;
        auVar172._28_4_ = auVar171._28_4_ + auVar120._28_4_;
        auVar120 = vsubps_avx(auVar127,auVar208);
        auVar128._0_4_ = auVar208._0_4_ + fVar174 * auVar120._0_4_;
        auVar128._4_4_ = auVar208._4_4_ + fVar231 * auVar120._4_4_;
        auVar128._8_4_ = auVar208._8_4_ + fVar261 * auVar120._8_4_;
        auVar128._12_4_ = auVar208._12_4_ + fVar210 * auVar120._12_4_;
        auVar128._16_4_ = auVar208._16_4_ + fVar232 * auVar120._16_4_;
        auVar128._20_4_ = auVar208._20_4_ + fVar262 * auVar120._20_4_;
        auVar128._24_4_ = auVar208._24_4_ + fVar132 * auVar120._24_4_;
        auVar128._28_4_ = auVar208._28_4_ + auVar120._28_4_;
        auVar120 = vsubps_avx(auVar128,auVar172);
        auVar293._0_4_ = auVar172._0_4_ + fVar174 * auVar120._0_4_;
        auVar293._4_4_ = auVar172._4_4_ + fVar231 * auVar120._4_4_;
        auVar293._8_4_ = auVar172._8_4_ + fVar261 * auVar120._8_4_;
        auVar293._12_4_ = auVar172._12_4_ + fVar210 * auVar120._12_4_;
        auVar297._16_4_ = auVar172._16_4_ + fVar232 * auVar120._16_4_;
        auVar297._0_16_ = auVar293;
        auVar297._20_4_ = auVar172._20_4_ + fVar262 * auVar120._20_4_;
        auVar297._24_4_ = auVar172._24_4_ + fVar132 * auVar120._24_4_;
        auVar297._28_4_ = auVar172._28_4_ + auVar208._28_4_;
        auVar298 = auVar297._16_16_;
        auVar150 = vshufps_avx(ZEXT416((uint)(fVar230 * 0.33333334)),
                               ZEXT416((uint)(fVar230 * 0.33333334)),0);
        auVar249._0_4_ = auVar293._0_4_ + auVar150._0_4_ * auVar120._0_4_ * 3.0;
        auVar249._4_4_ = auVar293._4_4_ + auVar150._4_4_ * auVar120._4_4_ * 3.0;
        auVar249._8_4_ = auVar293._8_4_ + auVar150._8_4_ * auVar120._8_4_ * 3.0;
        auVar249._12_4_ = auVar293._12_4_ + auVar150._12_4_ * auVar120._12_4_ * 3.0;
        auVar203 = vshufpd_avx(auVar293,auVar293,3);
        auVar162 = vshufpd_avx(auVar298,auVar298,3);
        auVar109 = vsubps_avx(auVar203,auVar293);
        auVar241 = vsubps_avx(auVar162,auVar298);
        auVar107._0_4_ = auVar109._0_4_ + auVar241._0_4_;
        auVar107._4_4_ = auVar109._4_4_ + auVar241._4_4_;
        auVar107._8_4_ = auVar109._8_4_ + auVar241._8_4_;
        auVar107._12_4_ = auVar109._12_4_ + auVar241._12_4_;
        auVar109 = vmovshdup_avx(auVar293);
        auVar241 = vmovshdup_avx(auVar249);
        auVar189 = vshufps_avx(auVar107,auVar107,0);
        auVar151 = vshufps_avx(auVar107,auVar107,0x55);
        fVar174 = auVar151._0_4_;
        fVar231 = auVar151._4_4_;
        fVar261 = auVar151._8_4_;
        fVar210 = auVar151._12_4_;
        fVar232 = auVar189._0_4_;
        fVar262 = auVar189._4_4_;
        fVar132 = auVar189._8_4_;
        fVar133 = auVar189._12_4_;
        auVar108._0_4_ = fVar232 * auVar293._0_4_ + auVar109._0_4_ * fVar174;
        auVar108._4_4_ = fVar262 * auVar293._4_4_ + auVar109._4_4_ * fVar231;
        auVar108._8_4_ = fVar132 * auVar293._8_4_ + auVar109._8_4_ * fVar261;
        auVar108._12_4_ = fVar133 * auVar293._12_4_ + auVar109._12_4_ * fVar210;
        auVar364._0_4_ = fVar232 * auVar249._0_4_ + auVar241._0_4_ * fVar174;
        auVar364._4_4_ = fVar262 * auVar249._4_4_ + auVar241._4_4_ * fVar231;
        auVar364._8_4_ = fVar132 * auVar249._8_4_ + auVar241._8_4_ * fVar261;
        auVar364._12_4_ = fVar133 * auVar249._12_4_ + auVar241._12_4_ * fVar210;
        auVar241 = vshufps_avx(auVar108,auVar108,0xe8);
        auVar189 = vshufps_avx(auVar364,auVar364,0xe8);
        auVar109 = vcmpps_avx(auVar241,auVar189,1);
        uVar88 = vextractps_avx(auVar109,0);
        auVar151 = auVar364;
        if ((uVar88 & 1) == 0) {
          auVar151 = auVar108;
        }
        auVar149._0_4_ = auVar150._0_4_ * auVar120._16_4_ * 3.0;
        auVar149._4_4_ = auVar150._4_4_ * auVar120._20_4_ * 3.0;
        auVar149._8_4_ = auVar150._8_4_ * auVar120._24_4_ * 3.0;
        auVar149._12_4_ = auVar150._12_4_ * 0.0;
        auVar9 = vsubps_avx(auVar298,auVar149);
        auVar150 = vmovshdup_avx(auVar9);
        auVar298 = vmovshdup_avx(auVar298);
        fVar134 = auVar9._0_4_;
        fVar135 = auVar9._4_4_;
        auVar273._0_4_ = fVar134 * fVar232 + auVar150._0_4_ * fVar174;
        auVar273._4_4_ = fVar135 * fVar262 + auVar150._4_4_ * fVar231;
        auVar273._8_4_ = auVar9._8_4_ * fVar132 + auVar150._8_4_ * fVar261;
        auVar273._12_4_ = auVar9._12_4_ * fVar133 + auVar150._12_4_ * fVar210;
        auVar409._0_4_ = fVar232 * auVar297._16_4_ + auVar298._0_4_ * fVar174;
        auVar409._4_4_ = fVar262 * auVar297._20_4_ + auVar298._4_4_ * fVar231;
        auVar409._8_4_ = fVar132 * auVar297._24_4_ + auVar298._8_4_ * fVar261;
        auVar409._12_4_ = fVar133 * auVar297._28_4_ + auVar298._12_4_ * fVar210;
        auVar298 = vshufps_avx(auVar273,auVar273,0xe8);
        auVar8 = vshufps_avx(auVar409,auVar409,0xe8);
        auVar150 = vcmpps_avx(auVar298,auVar8,1);
        uVar88 = vextractps_avx(auVar150,0);
        auVar245 = auVar409;
        if ((uVar88 & 1) == 0) {
          auVar245 = auVar273;
        }
        auVar151 = vmaxss_avx(auVar245,auVar151);
        auVar241 = vminps_avx(auVar241,auVar189);
        auVar189 = vminps_avx(auVar298,auVar8);
        auVar189 = vminps_avx(auVar241,auVar189);
        auVar109 = vshufps_avx(auVar109,auVar109,0x55);
        auVar109 = vblendps_avx(auVar109,auVar150,2);
        auVar150 = vpslld_avx(auVar109,0x1f);
        auVar109 = vshufpd_avx(auVar364,auVar364,1);
        auVar109 = vinsertps_avx(auVar109,auVar409,0x9c);
        auVar241 = vshufpd_avx(auVar108,auVar108,1);
        auVar241 = vinsertps_avx(auVar241,auVar273,0x9c);
        auVar109 = vblendvps_avx(auVar241,auVar109,auVar150);
        auVar241 = vmovshdup_avx(auVar109);
        auVar109 = vmaxss_avx(auVar241,auVar109);
        fVar261 = auVar189._0_4_;
        auVar241 = vmovshdup_avx(auVar189);
        fVar231 = auVar109._0_4_;
        fVar210 = auVar241._0_4_;
        fVar174 = auVar151._0_4_;
        if ((0.0001 <= fVar261) || (fVar231 <= -0.0001)) {
          if ((fVar210 < 0.0001 && -0.0001 < fVar174) || (fVar261 < 0.0001 && -0.0001 < fVar174))
          goto LAB_01168893;
          auVar150 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar109,1);
          auVar241 = vcmpps_avx(auVar241,SUB6416(ZEXT464(0x38d1b717),0),1);
          auVar241 = vandps_avx(auVar241,auVar150);
          if ((auVar241 & (undefined1  [16])0x1) != (undefined1  [16])0x0) goto LAB_01168893;
        }
        else {
LAB_01168893:
          auVar150 = vcmpps_avx(auVar189,_DAT_01f7aa10,1);
          auVar241 = vcmpss_avx(auVar151,ZEXT416(0) << 0x20,1);
          auVar188._8_4_ = 0x3f800000;
          auVar188._0_8_ = 0x3f8000003f800000;
          auVar188._12_4_ = 0x3f800000;
          auVar250._8_4_ = 0xbf800000;
          auVar250._0_8_ = 0xbf800000bf800000;
          auVar250._12_4_ = 0xbf800000;
          auVar241 = vblendvps_avx(auVar188,auVar250,auVar241);
          auVar150 = vblendvps_avx(auVar188,auVar250,auVar150);
          auVar189 = vcmpss_avx(auVar150,auVar241,4);
          auVar189 = vpshufd_avx(ZEXT416(auVar189._0_4_ & 1),0x50);
          auVar189 = vpslld_avx(auVar189,0x1f);
          auVar189 = vpsrad_avx(auVar189,0x1f);
          auVar189 = vpandn_avx(auVar189,_DAT_01fafeb0);
          auVar151 = vmovshdup_avx(auVar150);
          fVar232 = auVar151._0_4_;
          if ((auVar150._0_4_ != fVar232) || (NAN(auVar150._0_4_) || NAN(fVar232))) {
            if ((fVar210 != fVar261) || (NAN(fVar210) || NAN(fVar261))) {
              fVar261 = -fVar261 / (fVar210 - fVar261);
              auVar150 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar261) * 0.0 + fVar261)));
            }
            else {
              auVar150 = ZEXT816(0x3f80000000000000);
              if ((fVar261 != 0.0) || (NAN(fVar261))) {
                auVar150 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar298 = vcmpps_avx(auVar189,auVar150,1);
            auVar151 = vblendps_avx(auVar189,auVar150,2);
            auVar150 = vblendps_avx(auVar150,auVar189,2);
            auVar189 = vblendvps_avx(auVar150,auVar151,auVar298);
          }
          auVar109 = vcmpss_avx(auVar109,ZEXT416(0) << 0x20,1);
          auVar190._8_4_ = 0x3f800000;
          auVar190._0_8_ = 0x3f8000003f800000;
          auVar190._12_4_ = 0x3f800000;
          auVar251._8_4_ = 0xbf800000;
          auVar251._0_8_ = 0xbf800000bf800000;
          auVar251._12_4_ = 0xbf800000;
          auVar109 = vblendvps_avx(auVar190,auVar251,auVar109);
          fVar261 = auVar109._0_4_;
          if ((auVar241._0_4_ != fVar261) || (NAN(auVar241._0_4_) || NAN(fVar261))) {
            if ((fVar231 != fVar174) || (NAN(fVar231) || NAN(fVar174))) {
              fVar174 = -fVar174 / (fVar231 - fVar174);
              auVar109 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar174) * 0.0 + fVar174)));
            }
            else {
              auVar109 = ZEXT816(0x3f80000000000000);
              if ((fVar174 != 0.0) || (NAN(fVar174))) {
                auVar109 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar150 = vcmpps_avx(auVar189,auVar109,1);
            auVar241 = vblendps_avx(auVar189,auVar109,2);
            auVar109 = vblendps_avx(auVar109,auVar189,2);
            auVar189 = vblendvps_avx(auVar109,auVar241,auVar150);
          }
          if ((fVar232 != fVar261) || (NAN(fVar232) || NAN(fVar261))) {
            auVar110._8_4_ = 0x3f800000;
            auVar110._0_8_ = 0x3f8000003f800000;
            auVar110._12_4_ = 0x3f800000;
            auVar109 = vcmpps_avx(auVar189,auVar110,1);
            auVar241 = vinsertps_avx(auVar189,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar191._4_12_ = auVar189._4_12_;
            auVar191._0_4_ = 0x3f800000;
            auVar189 = vblendvps_avx(auVar191,auVar241,auVar109);
          }
          auVar109 = vcmpps_avx(auVar189,_DAT_01f7b6f0,1);
          auVar74._12_4_ = 0;
          auVar74._0_12_ = auVar189._4_12_;
          auVar241 = vinsertps_avx(auVar189,ZEXT416(0x3f800000),0x10);
          auVar109 = vblendvps_avx(auVar241,auVar74 << 0x20,auVar109);
          auVar241 = vmovshdup_avx(auVar109);
          if (auVar109._0_4_ <= auVar241._0_4_) {
            auVar111._0_4_ = auVar109._0_4_ + -0.1;
            auVar111._4_4_ = auVar109._4_4_ + 0.1;
            auVar111._8_4_ = auVar109._8_4_ + 0.0;
            auVar111._12_4_ = auVar109._12_4_ + 0.0;
            auVar150 = vshufpd_avx(auVar249,auVar249,3);
            auVar294._8_8_ = 0x3f80000000000000;
            auVar294._0_8_ = 0x3f80000000000000;
            auVar109 = vcmpps_avx(auVar111,auVar294,1);
            auVar73._12_4_ = 0;
            auVar73._0_12_ = auVar111._4_12_;
            auVar241 = vinsertps_avx(auVar111,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar109 = vblendvps_avx(auVar241,auVar73 << 0x20,auVar109);
            auVar241 = vshufpd_avx(auVar9,auVar9,3);
            auVar189 = vshufps_avx(auVar109,auVar109,0x50);
            auVar402._8_4_ = 0x3f800000;
            auVar402._0_8_ = 0x3f8000003f800000;
            auVar402._12_4_ = 0x3f800000;
            auVar151 = vsubps_avx(auVar402,auVar189);
            local_600._0_4_ = auVar203._0_4_;
            local_600._4_4_ = auVar203._4_4_;
            fStack_5f8 = auVar203._8_4_;
            fStack_5f4 = auVar203._12_4_;
            fVar174 = auVar189._0_4_;
            fVar231 = auVar189._4_4_;
            fVar261 = auVar189._8_4_;
            fVar210 = auVar189._12_4_;
            local_6a0 = auVar162._0_4_;
            fStack_69c = auVar162._4_4_;
            fStack_698 = auVar162._8_4_;
            fStack_694 = auVar162._12_4_;
            fVar232 = auVar151._0_4_;
            fVar262 = auVar151._4_4_;
            fVar132 = auVar151._8_4_;
            fVar133 = auVar151._12_4_;
            auVar112._0_4_ = fVar174 * (float)local_600._0_4_ + fVar232 * auVar293._0_4_;
            auVar112._4_4_ = fVar231 * (float)local_600._4_4_ + fVar262 * auVar293._4_4_;
            auVar112._8_4_ = fVar261 * fStack_5f8 + fVar132 * auVar293._0_4_;
            auVar112._12_4_ = fVar210 * fStack_5f4 + fVar133 * auVar293._4_4_;
            auVar274._0_4_ = auVar150._0_4_ * fVar174 + fVar232 * auVar249._0_4_;
            auVar274._4_4_ = auVar150._4_4_ * fVar231 + fVar262 * auVar249._4_4_;
            auVar274._8_4_ = auVar150._8_4_ * fVar261 + fVar132 * auVar249._0_4_;
            auVar274._12_4_ = auVar150._12_4_ * fVar210 + fVar133 * auVar249._4_4_;
            auVar304._0_4_ = auVar241._0_4_ * fVar174 + fVar232 * fVar134;
            auVar304._4_4_ = auVar241._4_4_ * fVar231 + fVar262 * fVar135;
            auVar304._8_4_ = auVar241._8_4_ * fVar261 + fVar132 * fVar134;
            auVar304._12_4_ = auVar241._12_4_ * fVar210 + fVar133 * fVar135;
            auVar354._0_4_ = fVar174 * local_6a0 + fVar232 * auVar297._16_4_;
            auVar354._4_4_ = fVar231 * fStack_69c + fVar262 * auVar297._20_4_;
            auVar354._8_4_ = fVar261 * fStack_698 + fVar132 * auVar297._16_4_;
            auVar354._12_4_ = fVar210 * fStack_694 + fVar133 * auVar297._20_4_;
            auVar162 = vsubps_avx(auVar402,auVar109);
            auVar241 = vmovshdup_avx(auVar363);
            auVar203 = vmovsldup_avx(auVar363);
            auVar410._0_4_ = auVar162._0_4_ * auVar203._0_4_ + auVar109._0_4_ * auVar241._0_4_;
            auVar410._4_4_ = auVar162._4_4_ * auVar203._4_4_ + auVar109._4_4_ * auVar241._4_4_;
            auVar410._8_4_ = auVar162._8_4_ * auVar203._8_4_ + auVar109._8_4_ * auVar241._8_4_;
            auVar410._12_4_ = auVar162._12_4_ * auVar203._12_4_ + auVar109._12_4_ * auVar241._12_4_;
            auVar9 = vmovshdup_avx(auVar410);
            auVar109 = vsubps_avx(auVar274,auVar112);
            auVar192._0_4_ = auVar109._0_4_ * 3.0;
            auVar192._4_4_ = auVar109._4_4_ * 3.0;
            auVar192._8_4_ = auVar109._8_4_ * 3.0;
            auVar192._12_4_ = auVar109._12_4_ * 3.0;
            auVar109 = vsubps_avx(auVar304,auVar274);
            auVar222._0_4_ = auVar109._0_4_ * 3.0;
            auVar222._4_4_ = auVar109._4_4_ * 3.0;
            auVar222._8_4_ = auVar109._8_4_ * 3.0;
            auVar222._12_4_ = auVar109._12_4_ * 3.0;
            auVar109 = vsubps_avx(auVar354,auVar304);
            auVar323._0_4_ = auVar109._0_4_ * 3.0;
            auVar323._4_4_ = auVar109._4_4_ * 3.0;
            auVar323._8_4_ = auVar109._8_4_ * 3.0;
            auVar323._12_4_ = auVar109._12_4_ * 3.0;
            auVar241 = vminps_avx(auVar222,auVar323);
            auVar109 = vmaxps_avx(auVar222,auVar323);
            auVar241 = vminps_avx(auVar192,auVar241);
            auVar109 = vmaxps_avx(auVar192,auVar109);
            auVar203 = vshufpd_avx(auVar241,auVar241,3);
            auVar162 = vshufpd_avx(auVar109,auVar109,3);
            auVar241 = vminps_avx(auVar241,auVar203);
            auVar109 = vmaxps_avx(auVar109,auVar162);
            auVar203 = vshufps_avx(ZEXT416((uint)(1.0 / fVar230)),ZEXT416((uint)(1.0 / fVar230)),0);
            auVar324._0_4_ = auVar203._0_4_ * auVar241._0_4_;
            auVar324._4_4_ = auVar203._4_4_ * auVar241._4_4_;
            auVar324._8_4_ = auVar203._8_4_ * auVar241._8_4_;
            auVar324._12_4_ = auVar203._12_4_ * auVar241._12_4_;
            auVar337._0_4_ = auVar203._0_4_ * auVar109._0_4_;
            auVar337._4_4_ = auVar203._4_4_ * auVar109._4_4_;
            auVar337._8_4_ = auVar203._8_4_ * auVar109._8_4_;
            auVar337._12_4_ = auVar203._12_4_ * auVar109._12_4_;
            auVar151 = ZEXT416((uint)(1.0 / (auVar9._0_4_ - auVar410._0_4_)));
            auVar109 = vshufpd_avx(auVar112,auVar112,3);
            auVar241 = vshufpd_avx(auVar274,auVar274,3);
            auVar203 = vshufpd_avx(auVar304,auVar304,3);
            auVar162 = vshufpd_avx(auVar354,auVar354,3);
            auVar109 = vsubps_avx(auVar109,auVar112);
            auVar150 = vsubps_avx(auVar241,auVar274);
            auVar189 = vsubps_avx(auVar203,auVar304);
            auVar162 = vsubps_avx(auVar162,auVar354);
            auVar241 = vminps_avx(auVar109,auVar150);
            auVar109 = vmaxps_avx(auVar109,auVar150);
            auVar203 = vminps_avx(auVar189,auVar162);
            auVar203 = vminps_avx(auVar241,auVar203);
            auVar241 = vmaxps_avx(auVar189,auVar162);
            auVar109 = vmaxps_avx(auVar109,auVar241);
            auVar241 = vshufps_avx(auVar151,auVar151,0);
            auVar396._0_4_ = auVar241._0_4_ * auVar203._0_4_;
            auVar396._4_4_ = auVar241._4_4_ * auVar203._4_4_;
            auVar396._8_4_ = auVar241._8_4_ * auVar203._8_4_;
            auVar396._12_4_ = auVar241._12_4_ * auVar203._12_4_;
            auVar403._0_4_ = auVar241._0_4_ * auVar109._0_4_;
            auVar403._4_4_ = auVar241._4_4_ * auVar109._4_4_;
            auVar403._8_4_ = auVar241._8_4_ * auVar109._8_4_;
            auVar403._12_4_ = auVar241._12_4_ * auVar109._12_4_;
            auVar109 = vmovsldup_avx(auVar410);
            auVar355._4_12_ = auVar109._4_12_;
            auVar355._0_4_ = fVar211;
            auVar365._4_12_ = auVar410._4_12_;
            auVar365._0_4_ = fVar173;
            auVar223._0_4_ = (fVar211 + fVar173) * 0.5;
            auVar223._4_4_ = (auVar109._4_4_ + auVar410._4_4_) * 0.5;
            auVar223._8_4_ = (auVar109._8_4_ + auVar410._8_4_) * 0.5;
            auVar223._12_4_ = (auVar109._12_4_ + auVar410._12_4_) * 0.5;
            auVar109 = vshufps_avx(auVar223,auVar223,0);
            fVar174 = auVar109._0_4_;
            fVar231 = auVar109._4_4_;
            fVar261 = auVar109._8_4_;
            fVar210 = auVar109._12_4_;
            local_6f0._0_4_ = auVar316._0_4_;
            local_6f0._4_4_ = auVar316._4_4_;
            fStack_6e8 = auVar316._8_4_;
            fStack_6e4 = auVar316._12_4_;
            auVar152._0_4_ = fVar174 * (float)local_370._0_4_ + (float)local_6f0._0_4_;
            auVar152._4_4_ = fVar231 * (float)local_370._4_4_ + (float)local_6f0._4_4_;
            auVar152._8_4_ = fVar261 * fStack_368 + fStack_6e8;
            auVar152._12_4_ = fVar210 * fStack_364 + fStack_6e4;
            local_700._0_4_ = auVar34._0_4_;
            local_700._4_4_ = auVar34._4_4_;
            fStack_6f8 = auVar34._8_4_;
            fStack_6f4 = auVar34._12_4_;
            auVar193._0_4_ = fVar174 * (float)local_380._0_4_ + (float)local_700._0_4_;
            auVar193._4_4_ = fVar231 * (float)local_380._4_4_ + (float)local_700._4_4_;
            auVar193._8_4_ = fVar261 * fStack_378 + fStack_6f8;
            auVar193._12_4_ = fVar210 * fStack_374 + fStack_6f4;
            local_5d0 = auVar6._0_4_;
            fStack_5cc = auVar6._4_4_;
            fStack_5c8 = auVar6._8_4_;
            fStack_5c4 = auVar6._12_4_;
            auVar275._0_4_ = fVar174 * (float)local_390._0_4_ + local_5d0;
            auVar275._4_4_ = fVar231 * (float)local_390._4_4_ + fStack_5cc;
            auVar275._8_4_ = fVar261 * fStack_388 + fStack_5c8;
            auVar275._12_4_ = fVar210 * fStack_384 + fStack_5c4;
            auVar109 = vsubps_avx(auVar193,auVar152);
            auVar153._0_4_ = auVar152._0_4_ + fVar174 * auVar109._0_4_;
            auVar153._4_4_ = auVar152._4_4_ + fVar231 * auVar109._4_4_;
            auVar153._8_4_ = auVar152._8_4_ + fVar261 * auVar109._8_4_;
            auVar153._12_4_ = auVar152._12_4_ + fVar210 * auVar109._12_4_;
            auVar109 = vsubps_avx(auVar275,auVar193);
            auVar194._0_4_ = auVar193._0_4_ + fVar174 * auVar109._0_4_;
            auVar194._4_4_ = auVar193._4_4_ + fVar231 * auVar109._4_4_;
            auVar194._8_4_ = auVar193._8_4_ + fVar261 * auVar109._8_4_;
            auVar194._12_4_ = auVar193._12_4_ + fVar210 * auVar109._12_4_;
            auVar109 = vsubps_avx(auVar194,auVar153);
            fVar174 = auVar153._0_4_ + fVar174 * auVar109._0_4_;
            fVar231 = auVar153._4_4_ + fVar231 * auVar109._4_4_;
            auVar113._0_8_ = CONCAT44(fVar231,fVar174);
            auVar113._8_4_ = auVar153._8_4_ + fVar261 * auVar109._8_4_;
            auVar113._12_4_ = auVar153._12_4_ + fVar210 * auVar109._12_4_;
            fVar261 = auVar109._0_4_ * 3.0;
            fVar210 = auVar109._4_4_ * 3.0;
            auVar154._0_8_ = CONCAT44(fVar210,fVar261);
            auVar154._8_4_ = auVar109._8_4_ * 3.0;
            auVar154._12_4_ = auVar109._12_4_ * 3.0;
            auVar195._8_8_ = auVar113._0_8_;
            auVar195._0_8_ = auVar113._0_8_;
            auVar109 = vshufpd_avx(auVar113,auVar113,3);
            auVar241 = vshufps_avx(auVar223,auVar223,0x55);
            auVar189 = vsubps_avx(auVar109,auVar195);
            auVar380._0_4_ = auVar189._0_4_ * auVar241._0_4_ + fVar174;
            auVar380._4_4_ = auVar189._4_4_ * auVar241._4_4_ + fVar231;
            auVar380._8_4_ = auVar189._8_4_ * auVar241._8_4_ + fVar174;
            auVar380._12_4_ = auVar189._12_4_ * auVar241._12_4_ + fVar231;
            auVar196._8_8_ = auVar154._0_8_;
            auVar196._0_8_ = auVar154._0_8_;
            auVar109 = vshufpd_avx(auVar154,auVar154,1);
            auVar109 = vsubps_avx(auVar109,auVar196);
            auVar155._0_4_ = auVar109._0_4_ * auVar241._0_4_ + fVar261;
            auVar155._4_4_ = auVar109._4_4_ * auVar241._4_4_ + fVar210;
            auVar155._8_4_ = auVar109._8_4_ * auVar241._8_4_ + fVar261;
            auVar155._12_4_ = auVar109._12_4_ * auVar241._12_4_ + fVar210;
            auVar241 = vmovshdup_avx(auVar155);
            auVar276._0_8_ = auVar241._0_8_ ^ 0x8000000080000000;
            auVar276._8_4_ = auVar241._8_4_ ^ 0x80000000;
            auVar276._12_4_ = auVar241._12_4_ ^ 0x80000000;
            auVar203 = vmovshdup_avx(auVar189);
            auVar109 = vunpcklps_avx(auVar203,auVar276);
            auVar162 = vshufps_avx(auVar109,auVar276,4);
            auVar114._0_8_ = auVar189._0_8_ ^ 0x8000000080000000;
            auVar114._8_4_ = -auVar189._8_4_;
            auVar114._12_4_ = -auVar189._12_4_;
            auVar109 = vmovlhps_avx(auVar114,auVar155);
            auVar150 = vshufps_avx(auVar109,auVar155,8);
            auVar109 = ZEXT416((uint)(auVar155._0_4_ * auVar203._0_4_ -
                                     auVar189._0_4_ * auVar241._0_4_));
            auVar241 = vshufps_avx(auVar109,auVar109,0);
            auVar109 = vdivps_avx(auVar162,auVar241);
            auVar241 = vdivps_avx(auVar150,auVar241);
            auVar150 = vinsertps_avx(auVar324,auVar396,0x1c);
            auVar189 = vinsertps_avx(auVar337,auVar403,0x1c);
            auVar151 = vinsertps_avx(auVar396,auVar324,0x4c);
            auVar298 = vinsertps_avx(auVar403,auVar337,0x4c);
            auVar203 = vmovsldup_avx(auVar109);
            auVar197._0_4_ = auVar203._0_4_ * auVar150._0_4_;
            auVar197._4_4_ = auVar203._4_4_ * auVar150._4_4_;
            auVar197._8_4_ = auVar203._8_4_ * auVar150._8_4_;
            auVar197._12_4_ = auVar203._12_4_ * auVar150._12_4_;
            auVar156._0_4_ = auVar189._0_4_ * auVar203._0_4_;
            auVar156._4_4_ = auVar189._4_4_ * auVar203._4_4_;
            auVar156._8_4_ = auVar189._8_4_ * auVar203._8_4_;
            auVar156._12_4_ = auVar189._12_4_ * auVar203._12_4_;
            auVar162 = vminps_avx(auVar197,auVar156);
            auVar203 = vmaxps_avx(auVar156,auVar197);
            auVar8 = vmovsldup_avx(auVar241);
            auVar404._0_4_ = auVar151._0_4_ * auVar8._0_4_;
            auVar404._4_4_ = auVar151._4_4_ * auVar8._4_4_;
            auVar404._8_4_ = auVar151._8_4_ * auVar8._8_4_;
            auVar404._12_4_ = auVar151._12_4_ * auVar8._12_4_;
            auVar198._0_4_ = auVar298._0_4_ * auVar8._0_4_;
            auVar198._4_4_ = auVar298._4_4_ * auVar8._4_4_;
            auVar198._8_4_ = auVar298._8_4_ * auVar8._8_4_;
            auVar198._12_4_ = auVar298._12_4_ * auVar8._12_4_;
            auVar8 = vminps_avx(auVar404,auVar198);
            auVar252._0_4_ = auVar162._0_4_ + auVar8._0_4_;
            auVar252._4_4_ = auVar162._4_4_ + auVar8._4_4_;
            auVar252._8_4_ = auVar162._8_4_ + auVar8._8_4_;
            auVar252._12_4_ = auVar162._12_4_ + auVar8._12_4_;
            auVar162 = vmaxps_avx(auVar198,auVar404);
            auVar8 = vsubps_avx(auVar355,auVar223);
            auVar245 = vsubps_avx(auVar365,auVar223);
            auVar157._0_4_ = auVar203._0_4_ + auVar162._0_4_;
            auVar157._4_4_ = auVar203._4_4_ + auVar162._4_4_;
            auVar157._8_4_ = auVar203._8_4_ + auVar162._8_4_;
            auVar157._12_4_ = auVar203._12_4_ + auVar162._12_4_;
            auVar199._8_8_ = 0x3f800000;
            auVar199._0_8_ = 0x3f800000;
            auVar203 = vsubps_avx(auVar199,auVar157);
            auVar162 = vsubps_avx(auVar199,auVar252);
            fVar132 = auVar8._0_4_;
            auVar253._0_4_ = fVar132 * auVar203._0_4_;
            fVar133 = auVar8._4_4_;
            auVar253._4_4_ = fVar133 * auVar203._4_4_;
            fVar134 = auVar8._8_4_;
            auVar253._8_4_ = fVar134 * auVar203._8_4_;
            fVar135 = auVar8._12_4_;
            auVar253._12_4_ = fVar135 * auVar203._12_4_;
            fVar261 = auVar245._0_4_;
            auVar158._0_4_ = fVar261 * auVar203._0_4_;
            fVar210 = auVar245._4_4_;
            auVar158._4_4_ = fVar210 * auVar203._4_4_;
            fVar232 = auVar245._8_4_;
            auVar158._8_4_ = fVar232 * auVar203._8_4_;
            fVar262 = auVar245._12_4_;
            auVar158._12_4_ = fVar262 * auVar203._12_4_;
            auVar366._0_4_ = fVar132 * auVar162._0_4_;
            auVar366._4_4_ = fVar133 * auVar162._4_4_;
            auVar366._8_4_ = fVar134 * auVar162._8_4_;
            auVar366._12_4_ = fVar135 * auVar162._12_4_;
            auVar200._0_4_ = fVar261 * auVar162._0_4_;
            auVar200._4_4_ = fVar210 * auVar162._4_4_;
            auVar200._8_4_ = fVar232 * auVar162._8_4_;
            auVar200._12_4_ = fVar262 * auVar162._12_4_;
            auVar203 = vminps_avx(auVar253,auVar366);
            auVar162 = vminps_avx(auVar158,auVar200);
            auVar8 = vminps_avx(auVar203,auVar162);
            auVar203 = vmaxps_avx(auVar366,auVar253);
            auVar162 = vmaxps_avx(auVar200,auVar158);
            auVar245 = vshufps_avx(auVar223,auVar223,0x54);
            auVar162 = vmaxps_avx(auVar162,auVar203);
            auVar408 = vshufps_avx(auVar380,auVar380,0);
            auVar10 = vshufps_avx(auVar380,auVar380,0x55);
            auVar203 = vhaddps_avx(auVar8,auVar8);
            auVar162 = vhaddps_avx(auVar162,auVar162);
            auVar224._0_4_ = auVar408._0_4_ * auVar109._0_4_ + auVar10._0_4_ * auVar241._0_4_;
            auVar224._4_4_ = auVar408._4_4_ * auVar109._4_4_ + auVar10._4_4_ * auVar241._4_4_;
            auVar224._8_4_ = auVar408._8_4_ * auVar109._8_4_ + auVar10._8_4_ * auVar241._8_4_;
            auVar224._12_4_ = auVar408._12_4_ * auVar109._12_4_ + auVar10._12_4_ * auVar241._12_4_;
            auVar8 = vsubps_avx(auVar245,auVar224);
            fVar174 = auVar8._0_4_ + auVar203._0_4_;
            fVar231 = auVar8._0_4_ + auVar162._0_4_;
            auVar203 = vmaxss_avx(ZEXT416((uint)fVar211),ZEXT416((uint)fVar174));
            auVar162 = vminss_avx(ZEXT416((uint)fVar231),ZEXT416((uint)fVar173));
            if (auVar203._0_4_ <= auVar162._0_4_) {
              auVar203 = vmovshdup_avx(auVar109);
              auVar115._0_4_ = auVar203._0_4_ * auVar150._0_4_;
              auVar115._4_4_ = auVar203._4_4_ * auVar150._4_4_;
              auVar115._8_4_ = auVar203._8_4_ * auVar150._8_4_;
              auVar115._12_4_ = auVar203._12_4_ * auVar150._12_4_;
              auVar159._0_4_ = auVar189._0_4_ * auVar203._0_4_;
              auVar159._4_4_ = auVar189._4_4_ * auVar203._4_4_;
              auVar159._8_4_ = auVar189._8_4_ * auVar203._8_4_;
              auVar159._12_4_ = auVar189._12_4_ * auVar203._12_4_;
              auVar162 = vminps_avx(auVar115,auVar159);
              auVar203 = vmaxps_avx(auVar159,auVar115);
              auVar150 = vmovshdup_avx(auVar241);
              auVar254._0_4_ = auVar151._0_4_ * auVar150._0_4_;
              auVar254._4_4_ = auVar151._4_4_ * auVar150._4_4_;
              auVar254._8_4_ = auVar151._8_4_ * auVar150._8_4_;
              auVar254._12_4_ = auVar151._12_4_ * auVar150._12_4_;
              auVar160._0_4_ = auVar298._0_4_ * auVar150._0_4_;
              auVar160._4_4_ = auVar298._4_4_ * auVar150._4_4_;
              auVar160._8_4_ = auVar298._8_4_ * auVar150._8_4_;
              auVar160._12_4_ = auVar298._12_4_ * auVar150._12_4_;
              auVar150 = vminps_avx(auVar254,auVar160);
              auVar201._0_4_ = auVar162._0_4_ + auVar150._0_4_;
              auVar201._4_4_ = auVar162._4_4_ + auVar150._4_4_;
              auVar201._8_4_ = auVar162._8_4_ + auVar150._8_4_;
              auVar201._12_4_ = auVar162._12_4_ + auVar150._12_4_;
              auVar162 = vmaxps_avx(auVar160,auVar254);
              auVar116._0_4_ = auVar203._0_4_ + auVar162._0_4_;
              auVar116._4_4_ = auVar203._4_4_ + auVar162._4_4_;
              auVar116._8_4_ = auVar203._8_4_ + auVar162._8_4_;
              auVar116._12_4_ = auVar203._12_4_ + auVar162._12_4_;
              auVar203 = vsubps_avx(auVar294,auVar116);
              auVar162 = vsubps_avx(auVar294,auVar201);
              auVar202._0_4_ = fVar132 * auVar203._0_4_;
              auVar202._4_4_ = fVar133 * auVar203._4_4_;
              auVar202._8_4_ = fVar134 * auVar203._8_4_;
              auVar202._12_4_ = fVar135 * auVar203._12_4_;
              auVar255._0_4_ = fVar132 * auVar162._0_4_;
              auVar255._4_4_ = fVar133 * auVar162._4_4_;
              auVar255._8_4_ = fVar134 * auVar162._8_4_;
              auVar255._12_4_ = fVar135 * auVar162._12_4_;
              auVar117._0_4_ = fVar261 * auVar203._0_4_;
              auVar117._4_4_ = fVar210 * auVar203._4_4_;
              auVar117._8_4_ = fVar232 * auVar203._8_4_;
              auVar117._12_4_ = fVar262 * auVar203._12_4_;
              auVar161._0_4_ = fVar261 * auVar162._0_4_;
              auVar161._4_4_ = fVar210 * auVar162._4_4_;
              auVar161._8_4_ = fVar232 * auVar162._8_4_;
              auVar161._12_4_ = fVar262 * auVar162._12_4_;
              auVar203 = vminps_avx(auVar202,auVar255);
              auVar162 = vminps_avx(auVar117,auVar161);
              auVar203 = vminps_avx(auVar203,auVar162);
              auVar162 = vmaxps_avx(auVar255,auVar202);
              auVar150 = vmaxps_avx(auVar161,auVar117);
              auVar203 = vhaddps_avx(auVar203,auVar203);
              auVar162 = vmaxps_avx(auVar150,auVar162);
              auVar162 = vhaddps_avx(auVar162,auVar162);
              auVar150 = vmovshdup_avx(auVar8);
              auVar189 = ZEXT416((uint)(auVar150._0_4_ + auVar203._0_4_));
              auVar203 = vmaxss_avx(auVar410,auVar189);
              auVar150 = ZEXT416((uint)(auVar150._0_4_ + auVar162._0_4_));
              auVar162 = vminss_avx(auVar150,auVar9);
              if (auVar203._0_4_ <= auVar162._0_4_) {
                bVar86 = 0;
                if ((fVar211 < fVar174) && (fVar231 < fVar173)) {
                  auVar203 = vcmpps_avx(auVar150,auVar9,1);
                  auVar162 = vcmpps_avx(auVar410,auVar189,1);
                  auVar203 = vandps_avx(auVar162,auVar203);
                  bVar86 = auVar203[0];
                }
                auVar374 = ZEXT1664(auVar410);
                if ((uVar87 < 4 && 0.001 <= fVar230) && (bVar86 & 1) == 0) goto LAB_0116966d;
                lVar90 = 200;
                do {
                  fVar230 = auVar8._0_4_;
                  fVar173 = 1.0 - fVar230;
                  auVar203 = ZEXT416((uint)(fVar173 * fVar173 * fVar173));
                  auVar203 = vshufps_avx(auVar203,auVar203,0);
                  auVar162 = ZEXT416((uint)(fVar230 * 3.0 * fVar173 * fVar173));
                  auVar162 = vshufps_avx(auVar162,auVar162,0);
                  auVar150 = ZEXT416((uint)(fVar173 * fVar230 * fVar230 * 3.0));
                  auVar150 = vshufps_avx(auVar150,auVar150,0);
                  auVar189 = ZEXT416((uint)(fVar230 * fVar230 * fVar230));
                  auVar189 = vshufps_avx(auVar189,auVar189,0);
                  local_610._0_4_ = auVar7._0_4_;
                  local_610._4_4_ = auVar7._4_4_;
                  fStack_608 = auVar7._8_4_;
                  fStack_604 = auVar7._12_4_;
                  fVar173 = auVar203._0_4_ * (float)local_6f0._0_4_ +
                            auVar162._0_4_ * (float)local_700._0_4_ +
                            auVar189._0_4_ * (float)local_610._0_4_ + auVar150._0_4_ * local_5d0;
                  fVar230 = auVar203._4_4_ * (float)local_6f0._4_4_ +
                            auVar162._4_4_ * (float)local_700._4_4_ +
                            auVar189._4_4_ * (float)local_610._4_4_ + auVar150._4_4_ * fStack_5cc;
                  auVar118._0_8_ = CONCAT44(fVar230,fVar173);
                  auVar118._8_4_ =
                       auVar203._8_4_ * fStack_6e8 +
                       auVar162._8_4_ * fStack_6f8 +
                       auVar189._8_4_ * fStack_608 + auVar150._8_4_ * fStack_5c8;
                  auVar118._12_4_ =
                       auVar203._12_4_ * fStack_6e4 +
                       auVar162._12_4_ * fStack_6f4 +
                       auVar189._12_4_ * fStack_604 + auVar150._12_4_ * fStack_5c4;
                  auVar163._8_8_ = auVar118._0_8_;
                  auVar163._0_8_ = auVar118._0_8_;
                  auVar162 = vshufpd_avx(auVar118,auVar118,1);
                  auVar203 = vmovshdup_avx(auVar8);
                  auVar162 = vsubps_avx(auVar162,auVar163);
                  auVar119._0_4_ = auVar203._0_4_ * auVar162._0_4_ + fVar173;
                  auVar119._4_4_ = auVar203._4_4_ * auVar162._4_4_ + fVar230;
                  auVar119._8_4_ = auVar203._8_4_ * auVar162._8_4_ + fVar173;
                  auVar119._12_4_ = auVar203._12_4_ * auVar162._12_4_ + fVar230;
                  auVar203 = vshufps_avx(auVar119,auVar119,0);
                  auVar162 = vshufps_avx(auVar119,auVar119,0x55);
                  auVar164._0_4_ = auVar109._0_4_ * auVar203._0_4_ + auVar241._0_4_ * auVar162._0_4_
                  ;
                  auVar164._4_4_ = auVar109._4_4_ * auVar203._4_4_ + auVar241._4_4_ * auVar162._4_4_
                  ;
                  auVar164._8_4_ = auVar109._8_4_ * auVar203._8_4_ + auVar241._8_4_ * auVar162._8_4_
                  ;
                  auVar164._12_4_ =
                       auVar109._12_4_ * auVar203._12_4_ + auVar241._12_4_ * auVar162._12_4_;
                  auVar8 = vsubps_avx(auVar8,auVar164);
                  auVar165._8_4_ = 0x7fffffff;
                  auVar165._0_8_ = 0x7fffffff7fffffff;
                  auVar165._12_4_ = 0x7fffffff;
                  auVar203 = vandps_avx(auVar119,auVar165);
                  auVar162 = vshufps_avx(auVar203,auVar203,0xf5);
                  auVar203 = vmaxss_avx(auVar162,auVar203);
                  if (auVar203._0_4_ < fVar237) {
                    fVar173 = auVar8._0_4_;
                    if ((fVar173 < 0.0) || (1.0 < fVar173)) break;
                    auVar109 = vmovshdup_avx(auVar8);
                    fVar230 = auVar109._0_4_;
                    if ((fVar230 < 0.0) || (1.0 < fVar230)) break;
                    auVar109 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                             ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                             0x1c);
                    auVar298 = vinsertps_avx(auVar109,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                    m128[2]),0x28);
                    auVar109 = vdpps_avx(auVar298,local_3a0,0x7f);
                    auVar241 = vdpps_avx(auVar298,local_3b0,0x7f);
                    auVar203 = vdpps_avx(auVar298,local_3c0,0x7f);
                    auVar162 = vdpps_avx(auVar298,local_3d0,0x7f);
                    auVar150 = vdpps_avx(auVar298,local_3e0,0x7f);
                    auVar189 = vdpps_avx(auVar298,local_3f0,0x7f);
                    auVar151 = vdpps_avx(auVar298,local_400,0x7f);
                    auVar298 = vdpps_avx(auVar298,local_410,0x7f);
                    fVar210 = 1.0 - fVar230;
                    fVar232 = 1.0 - fVar173;
                    fVar211 = auVar8._4_4_;
                    fVar174 = auVar8._8_4_;
                    fVar231 = auVar8._12_4_;
                    fVar261 = fVar232 * fVar173 * fVar173 * 3.0;
                    auVar305._0_4_ = fVar173 * fVar173 * fVar173;
                    auVar305._4_4_ = fVar211 * fVar211 * fVar211;
                    auVar305._8_4_ = fVar174 * fVar174 * fVar174;
                    auVar305._12_4_ = fVar231 * fVar231 * fVar231;
                    fVar174 = fVar232 * fVar232 * fVar173 * 3.0;
                    fVar231 = fVar232 * fVar232 * fVar232;
                    fVar211 = fVar231 * (fVar210 * auVar109._0_4_ + fVar230 * auVar150._0_4_) +
                              (fVar210 * auVar241._0_4_ + auVar189._0_4_ * fVar230) * fVar174 +
                              fVar261 * (auVar151._0_4_ * fVar230 + fVar210 * auVar203._0_4_) +
                              auVar305._0_4_ * (fVar210 * auVar162._0_4_ + fVar230 * auVar298._0_4_)
                    ;
                    if (((fVar211 < fVar212) ||
                        (fVar210 = *(float *)(ray + k * 4 + 0x100), fVar210 < fVar211)) ||
                       (pGVar20 = (context->scene->geometries).items[uVar83].ptr,
                       (pGVar20->mask & *(uint *)(ray + k * 4 + 0x120)) == 0)) break;
                    auStack_f0 = vshufps_avx(auVar8,auVar8,0x55);
                    auVar338._8_4_ = 0x3f800000;
                    auVar338._0_8_ = 0x3f8000003f800000;
                    auVar338._12_4_ = 0x3f800000;
                    auVar109 = vsubps_avx(auVar338,auStack_f0);
                    fVar262 = auStack_f0._0_4_;
                    fVar132 = auStack_f0._4_4_;
                    fVar133 = auStack_f0._8_4_;
                    fVar134 = auStack_f0._12_4_;
                    fVar135 = auVar109._0_4_;
                    fVar136 = auVar109._4_4_;
                    fVar137 = auVar109._8_4_;
                    fVar236 = auVar109._12_4_;
                    auVar356._0_4_ =
                         fVar262 * (float)local_4b0._0_4_ + fVar135 * (float)local_490._0_4_;
                    auVar356._4_4_ =
                         fVar132 * (float)local_4b0._4_4_ + fVar136 * (float)local_490._4_4_;
                    auVar356._8_4_ = fVar133 * fStack_4a8 + fVar137 * fStack_488;
                    auVar356._12_4_ = fVar134 * fStack_4a4 + fVar236 * fStack_484;
                    auVar367._0_4_ = fVar262 * (float)local_4c0._0_4_ + fVar135 * fVar284;
                    auVar367._4_4_ = fVar132 * (float)local_4c0._4_4_ + fVar136 * fVar285;
                    auVar367._8_4_ = fVar133 * fStack_4b8 + fVar137 * fVar286;
                    auVar367._12_4_ = fVar134 * fStack_4b4 + fVar236 * fVar263;
                    auVar381._0_4_ = fVar262 * fVar264 + fVar135 * (float)local_4a0._0_4_;
                    auVar381._4_4_ = fVar132 * fVar235 + fVar136 * (float)local_4a0._4_4_;
                    auVar381._8_4_ = fVar133 * fVar281 + fVar137 * fStack_498;
                    auVar381._12_4_ = fVar134 * fVar283 + fVar236 * fStack_494;
                    auVar339._0_4_ = fVar262 * (float)local_430._0_4_ + fVar135 * fVar233;
                    auVar339._4_4_ = fVar132 * (float)local_430._4_4_ + fVar136 * fVar265;
                    auVar339._8_4_ = fVar133 * fStack_428 + fVar137 * fVar267;
                    auVar339._12_4_ = fVar134 * fStack_424 + fVar236 * fVar282;
                    auVar162 = vsubps_avx(auVar367,auVar356);
                    auVar150 = vsubps_avx(auVar381,auVar367);
                    auVar189 = vsubps_avx(auVar339,auVar381);
                    auStack_110 = vshufps_avx(auVar8,auVar8,0);
                    fVar134 = auStack_110._0_4_;
                    fVar135 = auStack_110._4_4_;
                    fVar136 = auStack_110._8_4_;
                    fVar137 = auStack_110._12_4_;
                    auVar109 = vshufps_avx(ZEXT416((uint)fVar232),ZEXT416((uint)fVar232),0);
                    fVar232 = auVar109._0_4_;
                    fVar262 = auVar109._4_4_;
                    fVar132 = auVar109._8_4_;
                    fVar133 = auVar109._12_4_;
                    auVar109 = vshufps_avx(auVar305,auVar305,0);
                    auVar241 = vshufps_avx(ZEXT416((uint)fVar261),ZEXT416((uint)fVar261),0);
                    auVar203 = vshufps_avx(ZEXT416((uint)fVar174),ZEXT416((uint)fVar174),0);
                    auVar295._0_4_ =
                         (fVar232 * (fVar232 * auVar162._0_4_ + fVar134 * auVar150._0_4_) +
                         fVar134 * (fVar232 * auVar150._0_4_ + fVar134 * auVar189._0_4_)) * 3.0;
                    auVar295._4_4_ =
                         (fVar262 * (fVar262 * auVar162._4_4_ + fVar135 * auVar150._4_4_) +
                         fVar135 * (fVar262 * auVar150._4_4_ + fVar135 * auVar189._4_4_)) * 3.0;
                    auVar295._8_4_ =
                         (fVar132 * (fVar132 * auVar162._8_4_ + fVar136 * auVar150._8_4_) +
                         fVar136 * (fVar132 * auVar150._8_4_ + fVar136 * auVar189._8_4_)) * 3.0;
                    auVar295._12_4_ =
                         (fVar133 * (fVar133 * auVar162._12_4_ + fVar137 * auVar150._12_4_) +
                         fVar137 * (fVar133 * auVar150._12_4_ + fVar137 * auVar189._12_4_)) * 3.0;
                    auVar162 = vshufps_avx(ZEXT416((uint)fVar231),ZEXT416((uint)fVar231),0);
                    auVar256._0_4_ =
                         auVar162._0_4_ * (float)local_440._0_4_ +
                         auVar203._0_4_ * (float)local_450._0_4_ +
                         auVar109._0_4_ * (float)local_470._0_4_ +
                         auVar241._0_4_ * (float)local_460._0_4_;
                    auVar256._4_4_ =
                         auVar162._4_4_ * (float)local_440._4_4_ +
                         auVar203._4_4_ * (float)local_450._4_4_ +
                         auVar109._4_4_ * (float)local_470._4_4_ +
                         auVar241._4_4_ * (float)local_460._4_4_;
                    auVar256._8_4_ =
                         auVar162._8_4_ * fStack_438 +
                         auVar203._8_4_ * fStack_448 +
                         auVar109._8_4_ * fStack_468 + auVar241._8_4_ * fStack_458;
                    auVar256._12_4_ =
                         auVar162._12_4_ * fStack_434 +
                         auVar203._12_4_ * fStack_444 +
                         auVar109._12_4_ * fStack_464 + auVar241._12_4_ * fStack_454;
                    auVar109 = vshufps_avx(auVar295,auVar295,0xc9);
                    auVar277._0_4_ = auVar256._0_4_ * auVar109._0_4_;
                    auVar277._4_4_ = auVar256._4_4_ * auVar109._4_4_;
                    auVar277._8_4_ = auVar256._8_4_ * auVar109._8_4_;
                    auVar277._12_4_ = auVar256._12_4_ * auVar109._12_4_;
                    auVar109 = vshufps_avx(auVar256,auVar256,0xc9);
                    auVar257._0_4_ = auVar295._0_4_ * auVar109._0_4_;
                    auVar257._4_4_ = auVar295._4_4_ * auVar109._4_4_;
                    auVar257._8_4_ = auVar295._8_4_ * auVar109._8_4_;
                    auVar257._12_4_ = auVar295._12_4_ * auVar109._12_4_;
                    auVar109 = vsubps_avx(auVar257,auVar277);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar211;
                      uVar4 = vextractps_avx(auVar109,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar4;
                      uVar4 = vextractps_avx(auVar109,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar4;
                      *(int *)(ray + k * 4 + 0x1c0) = auVar109._0_4_;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar173;
                      *(float *)(ray + k * 4 + 0x200) = fVar230;
                      *(uint *)(ray + k * 4 + 0x220) = uVar19;
                      *(uint *)(ray + k * 4 + 0x240) = uVar83;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    auStack_170 = vshufps_avx(auVar109,auVar109,0x55);
                    auStack_150 = vshufps_avx(auVar109,auVar109,0xaa);
                    auStack_130 = vshufps_avx(auVar109,auVar109,0);
                    local_180[0] = (RTCHitN)auStack_170[0];
                    local_180[1] = (RTCHitN)auStack_170[1];
                    local_180[2] = (RTCHitN)auStack_170[2];
                    local_180[3] = (RTCHitN)auStack_170[3];
                    local_180[4] = (RTCHitN)auStack_170[4];
                    local_180[5] = (RTCHitN)auStack_170[5];
                    local_180[6] = (RTCHitN)auStack_170[6];
                    local_180[7] = (RTCHitN)auStack_170[7];
                    local_180[8] = (RTCHitN)auStack_170[8];
                    local_180[9] = (RTCHitN)auStack_170[9];
                    local_180[10] = (RTCHitN)auStack_170[10];
                    local_180[0xb] = (RTCHitN)auStack_170[0xb];
                    local_180[0xc] = (RTCHitN)auStack_170[0xc];
                    local_180[0xd] = (RTCHitN)auStack_170[0xd];
                    local_180[0xe] = (RTCHitN)auStack_170[0xe];
                    local_180[0xf] = (RTCHitN)auStack_170[0xf];
                    local_160 = auStack_150;
                    local_140 = auStack_130;
                    local_120 = auStack_110;
                    local_100 = auStack_f0;
                    local_e0 = local_300._0_8_;
                    uStack_d8 = local_300._8_8_;
                    uStack_d0 = local_300._16_8_;
                    uStack_c8 = local_300._24_8_;
                    local_c0 = local_2e0._0_8_;
                    uStack_b8 = local_2e0._8_8_;
                    uStack_b0 = local_2e0._16_8_;
                    uStack_a8 = local_2e0._24_8_;
                    auVar120 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                    uStack_9c = context->user->instID[0];
                    local_a0 = uStack_9c;
                    uStack_98 = uStack_9c;
                    uStack_94 = uStack_9c;
                    uStack_90 = uStack_9c;
                    uStack_8c = uStack_9c;
                    uStack_84 = auVar120._28_4_;
                    uVar88 = uStack_84;
                    uStack_88 = uStack_9c;
                    uStack_84 = uStack_9c;
                    uStack_7c = context->user->instPrimID[0];
                    local_80 = uStack_7c;
                    uStack_78 = uStack_7c;
                    uStack_74 = uStack_7c;
                    uStack_70 = uStack_7c;
                    uStack_6c = uStack_7c;
                    uStack_68 = uStack_7c;
                    uStack_64 = uStack_7c;
                    *(float *)(ray + k * 4 + 0x100) = fVar211;
                    local_520 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar82 & 0xf) << 4));
                    local_510 = *(undefined1 (*) [16])
                                 (mm_lookupmask_ps + (long)((int)uVar82 >> 4) * 0x10);
                    local_4f0.valid = (int *)local_520;
                    local_4f0.geometryUserPtr = pGVar20->userPtr;
                    local_4f0.context = context->user;
                    local_4f0.hit = local_180;
                    local_4f0.N = 8;
                    local_4f0.ray = (RTCRayN *)ray;
                    if (pGVar20->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar20->intersectionFilterN)(&local_4f0);
                    }
                    auVar109 = vpcmpeqd_avx(local_520,ZEXT816(0) << 0x40);
                    auVar241 = vpcmpeqd_avx(local_510,ZEXT816(0) << 0x40);
                    auVar209._16_16_ = auVar241;
                    auVar209._0_16_ = auVar109;
                    auVar26 = auVar120 & ~auVar209;
                    if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar26 >> 0x7f,0) != '\0') ||
                          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar26 >> 0xbf,0) != '\0') ||
                        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar26[0x1f] < '\0') {
                      p_Var25 = context->args->filter;
                      if ((p_Var25 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar20->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var25)(&local_4f0);
                      }
                      auVar109 = vpcmpeqd_avx(local_520,ZEXT816(0) << 0x40);
                      auVar241 = vpcmpeqd_avx(local_510,ZEXT816(0) << 0x40);
                      auVar129._16_16_ = auVar241;
                      auVar129._0_16_ = auVar109;
                      auVar26 = auVar120 & ~auVar129;
                      if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar26 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar26 >> 0x7f,0) != '\0') ||
                            (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar26 >> 0xbf,0) != '\0') ||
                          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar26[0x1f] < '\0') {
                        auVar130._0_4_ = auVar109._0_4_ ^ auVar120._0_4_;
                        auVar130._4_4_ = auVar109._4_4_ ^ auVar120._4_4_;
                        auVar130._8_4_ = auVar109._8_4_ ^ auVar120._8_4_;
                        auVar130._12_4_ = auVar109._12_4_ ^ auVar120._12_4_;
                        auVar130._16_4_ = auVar241._0_4_ ^ auVar120._16_4_;
                        auVar130._20_4_ = auVar241._4_4_ ^ auVar120._20_4_;
                        auVar130._24_4_ = auVar241._8_4_ ^ auVar120._24_4_;
                        auVar130._28_4_ = auVar241._12_4_ ^ uVar88;
                        auVar120 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])local_4f0.hit);
                        *(undefined1 (*) [32])(local_4f0.ray + 0x180) = auVar120;
                        auVar120 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])
                                                            (local_4f0.hit + 0x20));
                        *(undefined1 (*) [32])(local_4f0.ray + 0x1a0) = auVar120;
                        auVar120 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])
                                                            (local_4f0.hit + 0x40));
                        *(undefined1 (*) [32])(local_4f0.ray + 0x1c0) = auVar120;
                        auVar120 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])
                                                            (local_4f0.hit + 0x60));
                        *(undefined1 (*) [32])(local_4f0.ray + 0x1e0) = auVar120;
                        auVar120 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])
                                                            (local_4f0.hit + 0x80));
                        *(undefined1 (*) [32])(local_4f0.ray + 0x200) = auVar120;
                        auVar120 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])
                                                            (local_4f0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_4f0.ray + 0x220) = auVar120;
                        auVar120 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])
                                                            (local_4f0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_4f0.ray + 0x240) = auVar120;
                        auVar120 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])
                                                            (local_4f0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_4f0.ray + 0x260) = auVar120;
                        auVar120 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])
                                                            (local_4f0.hit + 0x100));
                        *(undefined1 (*) [32])(local_4f0.ray + 0x280) = auVar120;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar210;
                    break;
                  }
                  lVar90 = lVar90 + -1;
                } while (lVar90 != 0);
              }
            }
          }
        }
        if (uVar87 == 0) break;
      } while( true );
    }
    uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar131._4_4_ = uVar4;
    auVar131._0_4_ = uVar4;
    auVar131._8_4_ = uVar4;
    auVar131._12_4_ = uVar4;
    auVar131._16_4_ = uVar4;
    auVar131._20_4_ = uVar4;
    auVar131._24_4_ = uVar4;
    auVar131._28_4_ = uVar4;
    auVar120 = vcmpps_avx(local_2c0,auVar131,2);
    uVar83 = vmovmskps_avx(auVar120);
    uVar81 = uVar81 & uVar81 + 0xff & uVar83;
    auVar109 = ZEXT816(0) << 0x40;
    if (uVar81 == 0) {
      return;
    }
  } while( true );
LAB_0116966d:
  auVar109 = vinsertps_avx(ZEXT416((uint)fVar211),ZEXT416((uint)fVar173),0x10);
  auVar411 = ZEXT1664(auVar109);
  goto LAB_01167e96;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }